

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  code *pcVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [28];
  undefined1 auVar104 [28];
  undefined1 auVar105 [28];
  undefined1 auVar106 [28];
  undefined1 auVar107 [28];
  undefined1 auVar108 [24];
  uint uVar109;
  int iVar110;
  RTCIntersectArguments *pRVar111;
  undefined1 auVar112 [8];
  long lVar113;
  ulong uVar114;
  bool bVar115;
  ulong uVar116;
  float fVar117;
  float fVar118;
  float fVar134;
  float fVar135;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar137;
  float fVar139;
  undefined1 auVar125 [28];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar150;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar151;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar161;
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar176;
  float fVar178;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar179;
  undefined1 auVar167 [16];
  float fVar164;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar171 [32];
  float fVar177;
  float fVar180;
  float fVar181;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar185;
  undefined1 auVar175 [64];
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar196;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  float fVar197;
  float fVar207;
  float fVar208;
  vint4 ai_2;
  undefined1 auVar198 [16];
  float fVar209;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar210;
  float fVar211;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar212;
  float fVar213;
  float fVar220;
  float fVar222;
  undefined1 auVar214 [16];
  float fVar224;
  float fVar227;
  float fVar229;
  float fVar231;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar221;
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar219 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar241;
  float fVar249;
  vint4 ai_1;
  undefined1 auVar242 [16];
  float fVar250;
  float fVar251;
  float fVar253;
  float fVar254;
  undefined1 auVar243 [32];
  float fVar255;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar252;
  undefined1 auVar247 [32];
  float fVar256;
  float fVar265;
  float fVar266;
  undefined1 auVar257 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar277;
  undefined1 auVar278 [16];
  float fVar284;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar288;
  float fVar289;
  undefined1 auVar285 [16];
  float fVar290;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar291;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar292 [32];
  float fVar296;
  float fVar300;
  float fVar301;
  undefined1 auVar297 [16];
  float fVar302;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_79c;
  Primitive *local_798;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  ulong local_6f0;
  Precalculations *local_6e8;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  undefined1 auStack_658 [24];
  undefined8 local_640;
  undefined4 local_638;
  float local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  uint local_624;
  uint local_620;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar126 [32];
  undefined1 auVar248 [64];
  undefined1 auVar264 [64];
  
  local_6e8 = pre;
  PVar9 = prim[1];
  uVar114 = (ulong)(byte)PVar9;
  fVar197 = *(float *)(prim + uVar114 * 0x19 + 0x12);
  auVar201 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar114 * 0x19 + 6));
  auVar235._0_4_ = fVar197 * (ray->dir).field_0.m128[0];
  auVar235._4_4_ = fVar197 * (ray->dir).field_0.m128[1];
  auVar235._8_4_ = fVar197 * (ray->dir).field_0.m128[2];
  auVar235._12_4_ = fVar197 * (ray->dir).field_0.m128[3];
  auVar152._0_4_ = fVar197 * auVar201._0_4_;
  auVar152._4_4_ = fVar197 * auVar201._4_4_;
  auVar152._8_4_ = fVar197 * auVar201._8_4_;
  auVar152._12_4_ = fVar197 * auVar201._12_4_;
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar114 * 4 + 6)));
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar114 * 5 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar114 * 6 + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar114 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar114 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar116 = (ulong)(uint)((int)(uVar114 * 9) * 2);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 + uVar114 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  uVar116 = (ulong)(uint)((int)(uVar114 * 5) << 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar119 = vshufps_avx(auVar235,auVar235,0);
  auVar143 = vshufps_avx(auVar235,auVar235,0x55);
  auVar153 = vshufps_avx(auVar235,auVar235,0xaa);
  fVar197 = auVar153._0_4_;
  fVar163 = auVar153._4_4_;
  fVar207 = auVar153._8_4_;
  fVar176 = auVar153._12_4_;
  fVar212 = auVar143._0_4_;
  fVar220 = auVar143._4_4_;
  fVar222 = auVar143._8_4_;
  fVar224 = auVar143._12_4_;
  fVar208 = auVar119._0_4_;
  fVar178 = auVar119._4_4_;
  fVar209 = auVar119._8_4_;
  fVar179 = auVar119._12_4_;
  auVar278._0_4_ = fVar208 * auVar201._0_4_ + fVar212 * auVar158._0_4_ + fVar197 * auVar169._0_4_;
  auVar278._4_4_ = fVar178 * auVar201._4_4_ + fVar220 * auVar158._4_4_ + fVar163 * auVar169._4_4_;
  auVar278._8_4_ = fVar209 * auVar201._8_4_ + fVar222 * auVar158._8_4_ + fVar207 * auVar169._8_4_;
  auVar278._12_4_ =
       fVar179 * auVar201._12_4_ + fVar224 * auVar158._12_4_ + fVar176 * auVar169._12_4_;
  auVar285._0_4_ = fVar208 * auVar17._0_4_ + fVar212 * auVar18._0_4_ + auVar19._0_4_ * fVar197;
  auVar285._4_4_ = fVar178 * auVar17._4_4_ + fVar220 * auVar18._4_4_ + auVar19._4_4_ * fVar163;
  auVar285._8_4_ = fVar209 * auVar17._8_4_ + fVar222 * auVar18._8_4_ + auVar19._8_4_ * fVar207;
  auVar285._12_4_ = fVar179 * auVar17._12_4_ + fVar224 * auVar18._12_4_ + auVar19._12_4_ * fVar176;
  auVar236._0_4_ = fVar208 * auVar120._0_4_ + fVar212 * auVar121._0_4_ + auVar144._0_4_ * fVar197;
  auVar236._4_4_ = fVar178 * auVar120._4_4_ + fVar220 * auVar121._4_4_ + auVar144._4_4_ * fVar163;
  auVar236._8_4_ = fVar209 * auVar120._8_4_ + fVar222 * auVar121._8_4_ + auVar144._8_4_ * fVar207;
  auVar236._12_4_ =
       fVar179 * auVar120._12_4_ + fVar224 * auVar121._12_4_ + auVar144._12_4_ * fVar176;
  auVar119 = vshufps_avx(auVar152,auVar152,0);
  auVar143 = vshufps_avx(auVar152,auVar152,0x55);
  auVar153 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar197 = auVar153._0_4_;
  fVar163 = auVar153._4_4_;
  fVar207 = auVar153._8_4_;
  fVar176 = auVar153._12_4_;
  fVar212 = auVar143._0_4_;
  fVar220 = auVar143._4_4_;
  fVar222 = auVar143._8_4_;
  fVar224 = auVar143._12_4_;
  fVar208 = auVar119._0_4_;
  fVar178 = auVar119._4_4_;
  fVar209 = auVar119._8_4_;
  fVar179 = auVar119._12_4_;
  auVar186._0_4_ = fVar208 * auVar201._0_4_ + fVar212 * auVar158._0_4_ + fVar197 * auVar169._0_4_;
  auVar186._4_4_ = fVar178 * auVar201._4_4_ + fVar220 * auVar158._4_4_ + fVar163 * auVar169._4_4_;
  auVar186._8_4_ = fVar209 * auVar201._8_4_ + fVar222 * auVar158._8_4_ + fVar207 * auVar169._8_4_;
  auVar186._12_4_ =
       fVar179 * auVar201._12_4_ + fVar224 * auVar158._12_4_ + fVar176 * auVar169._12_4_;
  auVar143._0_4_ = fVar208 * auVar17._0_4_ + auVar19._0_4_ * fVar197 + fVar212 * auVar18._0_4_;
  auVar143._4_4_ = fVar178 * auVar17._4_4_ + auVar19._4_4_ * fVar163 + fVar220 * auVar18._4_4_;
  auVar143._8_4_ = fVar209 * auVar17._8_4_ + auVar19._8_4_ * fVar207 + fVar222 * auVar18._8_4_;
  auVar143._12_4_ = fVar179 * auVar17._12_4_ + auVar19._12_4_ * fVar176 + fVar224 * auVar18._12_4_;
  auVar119._0_4_ = fVar208 * auVar120._0_4_ + fVar212 * auVar121._0_4_ + auVar144._0_4_ * fVar197;
  auVar119._4_4_ = fVar178 * auVar120._4_4_ + fVar220 * auVar121._4_4_ + auVar144._4_4_ * fVar163;
  auVar119._8_4_ = fVar209 * auVar120._8_4_ + fVar222 * auVar121._8_4_ + auVar144._8_4_ * fVar207;
  auVar119._12_4_ =
       fVar179 * auVar120._12_4_ + fVar224 * auVar121._12_4_ + auVar144._12_4_ * fVar176;
  auVar214._8_4_ = 0x7fffffff;
  auVar214._0_8_ = 0x7fffffff7fffffff;
  auVar214._12_4_ = 0x7fffffff;
  auVar201 = vandps_avx(auVar278,auVar214);
  auVar165._8_4_ = 0x219392ef;
  auVar165._0_8_ = 0x219392ef219392ef;
  auVar165._12_4_ = 0x219392ef;
  auVar201 = vcmpps_avx(auVar201,auVar165,1);
  auVar158 = vblendvps_avx(auVar278,auVar165,auVar201);
  auVar201 = vandps_avx(auVar285,auVar214);
  auVar201 = vcmpps_avx(auVar201,auVar165,1);
  auVar169 = vblendvps_avx(auVar285,auVar165,auVar201);
  auVar201 = vandps_avx(auVar236,auVar214);
  auVar201 = vcmpps_avx(auVar201,auVar165,1);
  auVar201 = vblendvps_avx(auVar236,auVar165,auVar201);
  auVar17 = vrcpps_avx(auVar158);
  fVar212 = auVar17._0_4_;
  auVar153._0_4_ = fVar212 * auVar158._0_4_;
  fVar220 = auVar17._4_4_;
  auVar153._4_4_ = fVar220 * auVar158._4_4_;
  fVar222 = auVar17._8_4_;
  auVar153._8_4_ = fVar222 * auVar158._8_4_;
  fVar224 = auVar17._12_4_;
  auVar153._12_4_ = fVar224 * auVar158._12_4_;
  auVar237._8_4_ = 0x3f800000;
  auVar237._0_8_ = 0x3f8000003f800000;
  auVar237._12_4_ = 0x3f800000;
  auVar158 = vsubps_avx(auVar237,auVar153);
  fVar212 = fVar212 + fVar212 * auVar158._0_4_;
  fVar220 = fVar220 + fVar220 * auVar158._4_4_;
  fVar222 = fVar222 + fVar222 * auVar158._8_4_;
  fVar224 = fVar224 + fVar224 * auVar158._12_4_;
  auVar158 = vrcpps_avx(auVar169);
  fVar197 = auVar158._0_4_;
  auVar198._0_4_ = fVar197 * auVar169._0_4_;
  fVar207 = auVar158._4_4_;
  auVar198._4_4_ = fVar207 * auVar169._4_4_;
  fVar208 = auVar158._8_4_;
  auVar198._8_4_ = fVar208 * auVar169._8_4_;
  fVar209 = auVar158._12_4_;
  auVar198._12_4_ = fVar209 * auVar169._12_4_;
  auVar158 = vsubps_avx(auVar237,auVar198);
  fVar197 = fVar197 + fVar197 * auVar158._0_4_;
  fVar207 = fVar207 + fVar207 * auVar158._4_4_;
  fVar208 = fVar208 + fVar208 * auVar158._8_4_;
  fVar209 = fVar209 + fVar209 * auVar158._12_4_;
  auVar158 = vrcpps_avx(auVar201);
  fVar163 = auVar158._0_4_;
  auVar166._0_4_ = fVar163 * auVar201._0_4_;
  fVar176 = auVar158._4_4_;
  auVar166._4_4_ = fVar176 * auVar201._4_4_;
  fVar178 = auVar158._8_4_;
  auVar166._8_4_ = fVar178 * auVar201._8_4_;
  fVar179 = auVar158._12_4_;
  auVar166._12_4_ = fVar179 * auVar201._12_4_;
  auVar201 = vsubps_avx(auVar237,auVar166);
  fVar163 = fVar163 + fVar163 * auVar201._0_4_;
  fVar176 = fVar176 + fVar176 * auVar201._4_4_;
  fVar178 = fVar178 + fVar178 * auVar201._8_4_;
  fVar179 = fVar179 + fVar179 * auVar201._12_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar114 * 7 + 6);
  auVar201 = vpmovsxwd_avx(auVar201);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar186);
  auVar154._0_4_ = fVar212 * auVar201._0_4_;
  auVar154._4_4_ = fVar220 * auVar201._4_4_;
  auVar154._8_4_ = fVar222 * auVar201._8_4_;
  auVar154._12_4_ = fVar224 * auVar201._12_4_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar114 * 9 + 6);
  auVar201 = vpmovsxwd_avx(auVar158);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar186);
  auVar187._0_4_ = fVar212 * auVar201._0_4_;
  auVar187._4_4_ = fVar220 * auVar201._4_4_;
  auVar187._8_4_ = fVar222 * auVar201._8_4_;
  auVar187._12_4_ = fVar224 * auVar201._12_4_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar158 = vpmovsxwd_avx(auVar169);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar114 * -2 + 6);
  auVar201 = vpmovsxwd_avx(auVar17);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar143);
  auVar242._0_4_ = auVar201._0_4_ * fVar197;
  auVar242._4_4_ = auVar201._4_4_ * fVar207;
  auVar242._8_4_ = auVar201._8_4_ * fVar208;
  auVar242._12_4_ = auVar201._12_4_ * fVar209;
  auVar248 = ZEXT1664(auVar242);
  auVar201 = vcvtdq2ps_avx(auVar158);
  auVar201 = vsubps_avx(auVar201,auVar143);
  auVar144._0_4_ = fVar197 * auVar201._0_4_;
  auVar144._4_4_ = fVar207 * auVar201._4_4_;
  auVar144._8_4_ = fVar208 * auVar201._8_4_;
  auVar144._12_4_ = fVar209 * auVar201._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar116 + uVar114 + 6);
  auVar201 = vpmovsxwd_avx(auVar18);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar119);
  auVar199._0_4_ = auVar201._0_4_ * fVar163;
  auVar199._4_4_ = auVar201._4_4_ * fVar176;
  auVar199._8_4_ = auVar201._8_4_ * fVar178;
  auVar199._12_4_ = auVar201._12_4_ * fVar179;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar114 * 0x17 + 6);
  auVar201 = vpmovsxwd_avx(auVar19);
  auVar201 = vcvtdq2ps_avx(auVar201);
  auVar201 = vsubps_avx(auVar201,auVar119);
  auVar120._0_4_ = auVar201._0_4_ * fVar163;
  auVar120._4_4_ = auVar201._4_4_ * fVar176;
  auVar120._8_4_ = auVar201._8_4_ * fVar178;
  auVar120._12_4_ = auVar201._12_4_ * fVar179;
  auVar201 = vpminsd_avx(auVar154,auVar187);
  auVar158 = vpminsd_avx(auVar242,auVar144);
  auVar201 = vmaxps_avx(auVar201,auVar158);
  auVar158 = vpminsd_avx(auVar199,auVar120);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar257._4_4_ = uVar7;
  auVar257._0_4_ = uVar7;
  auVar257._8_4_ = uVar7;
  auVar257._12_4_ = uVar7;
  auVar264 = ZEXT1664(auVar257);
  auVar158 = vmaxps_avx(auVar158,auVar257);
  auVar201 = vmaxps_avx(auVar201,auVar158);
  local_2d0._0_4_ = auVar201._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar201._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar201._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar201._12_4_ * 0.99999964;
  auVar201 = vpmaxsd_avx(auVar154,auVar187);
  auVar158 = vpmaxsd_avx(auVar242,auVar144);
  auVar201 = vminps_avx(auVar201,auVar158);
  auVar158 = vpmaxsd_avx(auVar199,auVar120);
  fVar197 = ray->tfar;
  auVar155._4_4_ = fVar197;
  auVar155._0_4_ = fVar197;
  auVar155._8_4_ = fVar197;
  auVar155._12_4_ = fVar197;
  auVar158 = vminps_avx(auVar158,auVar155);
  auVar201 = vminps_avx(auVar201,auVar158);
  auVar121._0_4_ = auVar201._0_4_ * 1.0000004;
  auVar121._4_4_ = auVar201._4_4_ * 1.0000004;
  auVar121._8_4_ = auVar201._8_4_ * 1.0000004;
  auVar121._12_4_ = auVar201._12_4_ * 1.0000004;
  auVar201 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar158 = vpcmpgtd_avx(auVar201,_DAT_01f7fcf0);
  auVar201 = vcmpps_avx(local_2d0,auVar121,2);
  auVar201 = vandps_avx(auVar201,auVar158);
  uVar109 = vmovmskps_avx(auVar201);
  if (uVar109 != 0) {
    uVar109 = uVar109 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_798 = prim;
    do {
      uVar116 = (ulong)uVar109;
      auVar258 = auVar264._0_32_;
      auVar243 = auVar248._0_32_;
      lVar13 = 0;
      if (uVar116 != 0) {
        for (; (uVar109 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar116 = uVar116 - 1 & uVar116;
      local_6f0 = (ulong)*(uint *)(local_798 + 2);
      pGVar10 = (context->scene->geometries).items[*(uint *)(local_798 + 2)].ptr;
      local_608 = (ulong)*(uint *)(local_798 + lVar13 * 4 + 6);
      uVar114 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                                pGVar10[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i *
                                (ulong)*(uint *)(local_798 + lVar13 * 4 + 6));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar13 = *(long *)&pGVar10[1].time_range.upper;
      _local_790 = *(undefined1 (*) [16])(lVar13 + (long)p_Var11 * uVar114);
      _local_700 = *(undefined1 (*) [16])(lVar13 + (uVar114 + 1) * (long)p_Var11);
      _local_5b0 = *(undefined1 (*) [16])(lVar13 + (uVar114 + 2) * (long)p_Var11);
      lVar113 = 0;
      if (uVar116 != 0) {
        for (; (uVar116 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
        }
      }
      _local_6a0 = *(undefined1 (*) [16])(lVar13 + (uVar114 + 3) * (long)p_Var11);
      if (((uVar116 != 0) && (uVar114 = uVar116 - 1 & uVar116, uVar114 != 0)) &&
         (lVar13 = 0, uVar114 != 0)) {
        for (; (uVar114 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar109 = (uint)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0.field_1;
      auVar169 = vsubps_avx(_local_790,(undefined1  [16])aVar8);
      auVar121 = _local_790;
      auVar201 = vshufps_avx(auVar169,auVar169,0);
      auVar158 = vshufps_avx(auVar169,auVar169,0x55);
      auVar169 = vshufps_avx(auVar169,auVar169,0xaa);
      fVar197 = (local_6e8->ray_space).vx.field_0.m128[0];
      fVar163 = (local_6e8->ray_space).vx.field_0.m128[1];
      fVar207 = (local_6e8->ray_space).vx.field_0.m128[2];
      fVar176 = (local_6e8->ray_space).vx.field_0.m128[3];
      fVar208 = (local_6e8->ray_space).vy.field_0.m128[0];
      fVar178 = (local_6e8->ray_space).vy.field_0.m128[1];
      fVar209 = (local_6e8->ray_space).vy.field_0.m128[2];
      fVar179 = (local_6e8->ray_space).vy.field_0.m128[3];
      fVar212 = (local_6e8->ray_space).vz.field_0.m128[0];
      fVar220 = (local_6e8->ray_space).vz.field_0.m128[1];
      fVar222 = (local_6e8->ray_space).vz.field_0.m128[2];
      fVar224 = (local_6e8->ray_space).vz.field_0.m128[3];
      auVar122._0_4_ =
           auVar201._0_4_ * fVar197 + auVar169._0_4_ * fVar212 + auVar158._0_4_ * fVar208;
      auVar122._4_4_ =
           auVar201._4_4_ * fVar163 + auVar169._4_4_ * fVar220 + auVar158._4_4_ * fVar178;
      auVar122._8_4_ =
           auVar201._8_4_ * fVar207 + auVar169._8_4_ * fVar222 + auVar158._8_4_ * fVar209;
      auVar122._12_4_ =
           auVar201._12_4_ * fVar176 + auVar169._12_4_ * fVar224 + auVar158._12_4_ * fVar179;
      auVar201 = vblendps_avx(auVar122,_local_790,8);
      auVar17 = vsubps_avx(_local_700,(undefined1  [16])aVar8);
      auVar158 = vshufps_avx(auVar17,auVar17,0);
      auVar169 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar297._0_4_ = auVar158._0_4_ * fVar197 + auVar17._0_4_ * fVar212 + auVar169._0_4_ * fVar208
      ;
      auVar297._4_4_ = auVar158._4_4_ * fVar163 + auVar17._4_4_ * fVar220 + auVar169._4_4_ * fVar178
      ;
      auVar297._8_4_ = auVar158._8_4_ * fVar207 + auVar17._8_4_ * fVar222 + auVar169._8_4_ * fVar209
      ;
      auVar297._12_4_ =
           auVar158._12_4_ * fVar176 + auVar17._12_4_ * fVar224 + auVar169._12_4_ * fVar179;
      auVar158 = vblendps_avx(auVar297,_local_700,8);
      auVar18 = vsubps_avx(_local_5b0,(undefined1  [16])aVar8);
      auVar169 = vshufps_avx(auVar18,auVar18,0);
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar200._0_4_ = auVar169._0_4_ * fVar197 + auVar17._0_4_ * fVar208 + auVar18._0_4_ * fVar212;
      auVar200._4_4_ = auVar169._4_4_ * fVar163 + auVar17._4_4_ * fVar178 + auVar18._4_4_ * fVar220;
      auVar200._8_4_ = auVar169._8_4_ * fVar207 + auVar17._8_4_ * fVar209 + auVar18._8_4_ * fVar222;
      auVar200._12_4_ =
           auVar169._12_4_ * fVar176 + auVar17._12_4_ * fVar179 + auVar18._12_4_ * fVar224;
      auVar19 = vshufps_avx(_local_5b0,_local_5b0,0xff);
      auVar119 = _local_5b0;
      auVar169 = vblendps_avx(auVar200,_local_5b0,8);
      local_5a0 = aVar8.x;
      fStack_59c = aVar8.y;
      fStack_598 = aVar8.z;
      aStack_594 = aVar8.field_3;
      auVar120 = vsubps_avx(_local_6a0,(undefined1  [16])aVar8);
      auVar17 = vshufps_avx(auVar120,auVar120,0);
      auVar18 = vshufps_avx(auVar120,auVar120,0x55);
      auVar120 = vshufps_avx(auVar120,auVar120,0xaa);
      auVar238._0_4_ = auVar17._0_4_ * fVar197 + auVar120._0_4_ * fVar212 + auVar18._0_4_ * fVar208;
      auVar238._4_4_ = auVar17._4_4_ * fVar163 + auVar120._4_4_ * fVar220 + auVar18._4_4_ * fVar178;
      auVar238._8_4_ = auVar17._8_4_ * fVar207 + auVar120._8_4_ * fVar222 + auVar18._8_4_ * fVar209;
      auVar238._12_4_ =
           auVar17._12_4_ * fVar176 + auVar120._12_4_ * fVar224 + auVar18._12_4_ * fVar179;
      auVar17 = vblendps_avx(auVar238,_local_6a0,8);
      auVar188._8_4_ = 0x7fffffff;
      auVar188._0_8_ = 0x7fffffff7fffffff;
      auVar188._12_4_ = 0x7fffffff;
      auVar201 = vandps_avx(auVar201,auVar188);
      auVar158 = vandps_avx(auVar158,auVar188);
      auVar18 = vmaxps_avx(auVar201,auVar158);
      auVar201 = vandps_avx(auVar169,auVar188);
      auVar158 = vandps_avx(auVar17,auVar188);
      auVar201 = vmaxps_avx(auVar201,auVar158);
      auVar201 = vmaxps_avx(auVar18,auVar201);
      auVar158 = vmovshdup_avx(auVar201);
      auVar158 = vmaxss_avx(auVar158,auVar201);
      auVar201 = vshufpd_avx(auVar201,auVar201,1);
      auVar201 = vmaxss_avx(auVar201,auVar158);
      lVar13 = (long)(int)uVar109 * 0x44;
      fVar163 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar13 + 0x908);
      fVar176 = *(float *)(bspline_basis0 + lVar13 + 0x90c);
      fVar178 = *(float *)(bspline_basis0 + lVar13 + 0x910);
      fVar179 = *(float *)(bspline_basis0 + lVar13 + 0x914);
      fVar212 = *(float *)(bspline_basis0 + lVar13 + 0x918);
      fVar220 = *(float *)(bspline_basis0 + lVar13 + 0x91c);
      fVar222 = *(float *)(bspline_basis0 + lVar13 + 0x920);
      auVar104 = *(undefined1 (*) [28])(bspline_basis0 + lVar13 + 0x908);
      auVar158 = vshufps_avx(auVar200,auVar200,0);
      register0x000012d0 = auVar158;
      _local_3a0 = auVar158;
      auVar169 = vshufps_avx(auVar200,auVar200,0x55);
      register0x00001350 = auVar169;
      _local_3c0 = auVar169;
      fVar224 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar13 + 0xd8c);
      fVar268 = *(float *)(bspline_basis0 + lVar13 + 0xd90);
      fVar270 = *(float *)(bspline_basis0 + lVar13 + 0xd94);
      fVar226 = *(float *)(bspline_basis0 + lVar13 + 0xd98);
      fVar210 = *(float *)(bspline_basis0 + lVar13 + 0xd9c);
      fVar228 = *(float *)(bspline_basis0 + lVar13 + 0xda0);
      fVar284 = *(float *)(bspline_basis0 + lVar13 + 0xda4);
      auVar103 = *(undefined1 (*) [28])(bspline_basis0 + lVar13 + 0xd8c);
      auVar17 = vshufps_avx(auVar238,auVar238,0);
      register0x00001490 = auVar17;
      _local_400 = auVar17;
      auVar18 = vshufps_avx(auVar238,auVar238,0x55);
      register0x00001290 = auVar18;
      _local_760 = auVar18;
      fVar225 = auVar17._0_4_;
      fVar227 = auVar17._4_4_;
      fVar229 = auVar17._8_4_;
      fVar231 = auVar17._12_4_;
      fVar197 = auVar18._0_4_;
      fVar207 = auVar18._4_4_;
      fVar208 = auVar18._8_4_;
      fVar209 = auVar18._12_4_;
      fVar117 = auVar158._0_4_;
      fVar134 = auVar158._4_4_;
      fVar135 = auVar158._8_4_;
      fVar118 = auVar158._12_4_;
      fVar177 = auVar169._0_4_;
      fVar180 = auVar169._4_4_;
      fVar233 = auVar169._8_4_;
      fVar138 = auVar169._12_4_;
      auVar144 = _local_6a0;
      auVar158 = vshufps_avx(_local_6a0,_local_6a0,0xff);
      register0x00001350 = auVar19;
      _local_100 = auVar19;
      register0x00001410 = auVar158;
      _local_120 = auVar158;
      fVar140 = auVar158._0_4_;
      fVar141 = auVar158._4_4_;
      fVar142 = auVar158._8_4_;
      fVar151 = auVar158._12_4_;
      fVar255 = auVar19._0_4_;
      fVar196 = auVar19._4_4_;
      fVar136 = auVar19._8_4_;
      auVar158 = vshufps_avx(auVar297,auVar297,0);
      register0x000015d0 = auVar158;
      _local_320 = auVar158;
      fVar230 = *(float *)(bspline_basis0 + lVar13 + 0x484);
      fVar211 = *(float *)(bspline_basis0 + lVar13 + 0x488);
      fVar232 = *(float *)(bspline_basis0 + lVar13 + 0x48c);
      fVar150 = *(float *)(bspline_basis0 + lVar13 + 0x490);
      fStack_490 = *(float *)(bspline_basis0 + lVar13 + 0x494);
      fStack_48c = *(float *)(bspline_basis0 + lVar13 + 0x498);
      fStack_488 = *(float *)(bspline_basis0 + lVar13 + 0x49c);
      fStack_484 = *(float *)(bspline_basis0 + lVar13 + 0x4a0);
      fVar296 = auVar158._0_4_;
      fVar300 = auVar158._4_4_;
      fVar301 = auVar158._8_4_;
      fVar302 = auVar158._12_4_;
      auVar169 = vshufps_avx(auVar297,auVar297,0x55);
      register0x00001550 = auVar169;
      _local_340 = auVar169;
      fVar267 = auVar169._0_4_;
      fVar269 = auVar169._4_4_;
      fVar271 = auVar169._8_4_;
      fVar273 = auVar169._12_4_;
      auVar120 = _local_700;
      auVar169 = vshufps_avx(_local_700,_local_700,0xff);
      register0x00001590 = auVar169;
      _local_80 = auVar169;
      fVar288 = auVar169._0_4_;
      fVar289 = auVar169._4_4_;
      fVar290 = auVar169._8_4_;
      fVar291 = auVar169._12_4_;
      auVar169 = vshufps_avx(auVar122,auVar122,0);
      local_3e0._16_16_ = auVar169;
      local_3e0._0_16_ = auVar169;
      fVar241 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar13);
      fVar181 = *(float *)(bspline_basis0 + lVar13 + 4);
      fVar251 = *(float *)(bspline_basis0 + lVar13 + 8);
      fVar272 = *(float *)(bspline_basis0 + lVar13 + 0xc);
      fVar249 = *(float *)(bspline_basis0 + lVar13 + 0x10);
      fVar182 = *(float *)(bspline_basis0 + lVar13 + 0x14);
      fVar253 = *(float *)(bspline_basis0 + lVar13 + 0x18);
      auVar105 = *(undefined1 (*) [28])(bspline_basis0 + lVar13);
      fVar137 = auVar169._0_4_;
      fVar139 = auVar169._4_4_;
      fVar277 = auVar169._8_4_;
      fVar164 = auVar169._12_4_;
      auVar279._0_4_ = fVar137 * fVar241 + fVar296 * fVar230 + fVar117 * fVar163 + fVar225 * fVar224
      ;
      auVar279._4_4_ = fVar139 * fVar181 + fVar300 * fVar211 + fVar134 * fVar176 + fVar227 * fVar268
      ;
      auVar279._8_4_ = fVar277 * fVar251 + fVar301 * fVar232 + fVar135 * fVar178 + fVar229 * fVar270
      ;
      auVar279._12_4_ =
           fVar164 * fVar272 + fVar302 * fVar150 + fVar118 * fVar179 + fVar231 * fVar226;
      auVar279._16_4_ =
           fVar137 * fVar249 + fVar296 * fStack_490 + fVar117 * fVar212 + fVar225 * fVar210;
      auVar279._20_4_ =
           fVar139 * fVar182 + fVar300 * fStack_48c + fVar134 * fVar220 + fVar227 * fVar228;
      auVar279._24_4_ =
           fVar277 * fVar253 + fVar301 * fStack_488 + fVar135 * fVar222 + fVar229 * fVar284;
      auVar279._28_4_ = fStack_484 + fVar118 + 0.0 + 0.0;
      auVar169 = vshufps_avx(auVar122,auVar122,0x55);
      register0x000014d0 = auVar169;
      _local_e0 = auVar169;
      fVar234 = auVar169._0_4_;
      fVar256 = auVar169._4_4_;
      fVar265 = auVar169._8_4_;
      fVar266 = auVar169._12_4_;
      auVar239._0_4_ = fVar267 * fVar230 + fVar177 * fVar163 + fVar224 * fVar197 + fVar234 * fVar241
      ;
      auVar239._4_4_ = fVar269 * fVar211 + fVar180 * fVar176 + fVar268 * fVar207 + fVar256 * fVar181
      ;
      auVar239._8_4_ = fVar271 * fVar232 + fVar233 * fVar178 + fVar270 * fVar208 + fVar265 * fVar251
      ;
      auVar239._12_4_ =
           fVar273 * fVar150 + fVar138 * fVar179 + fVar226 * fVar209 + fVar266 * fVar272;
      auVar239._16_4_ =
           fVar267 * fStack_490 + fVar177 * fVar212 + fVar210 * fVar197 + fVar234 * fVar249;
      auVar239._20_4_ =
           fVar269 * fStack_48c + fVar180 * fVar220 + fVar228 * fVar207 + fVar256 * fVar182;
      auVar239._24_4_ =
           fVar271 * fStack_488 + fVar233 * fVar222 + fVar284 * fVar208 + fVar265 * fVar253;
      auVar239._28_4_ = fVar118 + fVar209 + 0.0 + 0.0;
      auVar169 = vpermilps_avx(_local_790,0xff);
      register0x00001450 = auVar169;
      _local_140 = auVar169;
      fVar213 = auVar169._0_4_;
      fVar221 = auVar169._4_4_;
      fVar223 = auVar169._8_4_;
      auVar125._0_4_ = fVar213 * fVar241 + fVar288 * fVar230 + fVar255 * fVar163 + fVar140 * fVar224
      ;
      auVar125._4_4_ = fVar221 * fVar181 + fVar289 * fVar211 + fVar196 * fVar176 + fVar141 * fVar268
      ;
      auVar125._8_4_ = fVar223 * fVar251 + fVar290 * fVar232 + fVar136 * fVar178 + fVar142 * fVar270
      ;
      auVar125._12_4_ =
           auVar169._12_4_ * fVar272 +
           fVar291 * fVar150 + auVar19._12_4_ * fVar179 + fVar151 * fVar226;
      auVar125._16_4_ =
           fVar213 * fVar249 + fVar288 * fStack_490 + fVar255 * fVar212 + fVar140 * fVar210;
      auVar125._20_4_ =
           fVar221 * fVar182 + fVar289 * fStack_48c + fVar196 * fVar220 + fVar141 * fVar228;
      auVar125._24_4_ =
           fVar223 * fVar253 + fVar290 * fStack_488 + fVar136 * fVar222 + fVar142 * fVar284;
      auVar126._28_4_ = 0;
      auVar126._0_28_ = auVar125;
      fVar224 = *(float *)(bspline_basis1 + lVar13 + 0x908);
      fVar268 = *(float *)(bspline_basis1 + lVar13 + 0x90c);
      fVar270 = *(float *)(bspline_basis1 + lVar13 + 0x910);
      fVar226 = *(float *)(bspline_basis1 + lVar13 + 0x914);
      fVar210 = *(float *)(bspline_basis1 + lVar13 + 0x918);
      fVar228 = *(float *)(bspline_basis1 + lVar13 + 0x91c);
      fVar284 = *(float *)(bspline_basis1 + lVar13 + 0x920);
      fVar163 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar13 + 0xd8c);
      fVar176 = *(float *)(bspline_basis1 + lVar13 + 0xd90);
      fVar178 = *(float *)(bspline_basis1 + lVar13 + 0xd94);
      fVar179 = *(float *)(bspline_basis1 + lVar13 + 0xd98);
      fVar212 = *(float *)(bspline_basis1 + lVar13 + 0xd9c);
      fVar220 = *(float *)(bspline_basis1 + lVar13 + 0xda0);
      fVar222 = *(float *)(bspline_basis1 + lVar13 + 0xda4);
      auVar106 = *(undefined1 (*) [28])(bspline_basis1 + lVar13 + 0xd8c);
      fVar241 = *(float *)(bspline_basis1 + lVar13 + 0x484);
      fVar181 = *(float *)(bspline_basis1 + lVar13 + 0x488);
      fVar251 = *(float *)(bspline_basis1 + lVar13 + 0x48c);
      fVar272 = *(float *)(bspline_basis1 + lVar13 + 0x490);
      fVar249 = *(float *)(bspline_basis1 + lVar13 + 0x494);
      fVar182 = *(float *)(bspline_basis1 + lVar13 + 0x498);
      fVar253 = *(float *)(bspline_basis1 + lVar13 + 0x49c);
      fVar161 = fVar273 + *(float *)(bspline_basis0 + lVar13 + 0x1c) + 0.0;
      fVar250 = *(float *)(bspline_basis1 + lVar13);
      fVar252 = *(float *)(bspline_basis1 + lVar13 + 4);
      fVar183 = *(float *)(bspline_basis1 + lVar13 + 8);
      fVar254 = *(float *)(bspline_basis1 + lVar13 + 0xc);
      fVar162 = *(float *)(bspline_basis1 + lVar13 + 0x10);
      fVar185 = *(float *)(bspline_basis1 + lVar13 + 0x14);
      fVar184 = *(float *)(bspline_basis1 + lVar13 + 0x18);
      local_560._0_4_ =
           fVar250 * fVar137 + fVar296 * fVar241 + fVar224 * fVar117 + fVar225 * fVar163;
      local_560._4_4_ =
           fVar252 * fVar139 + fVar300 * fVar181 + fVar268 * fVar134 + fVar227 * fVar176;
      fStack_558 = fVar183 * fVar277 + fVar301 * fVar251 + fVar270 * fVar135 + fVar229 * fVar178;
      fStack_554 = fVar254 * fVar164 + fVar302 * fVar272 + fVar226 * fVar118 + fVar231 * fVar179;
      fStack_550 = fVar162 * fVar137 + fVar296 * fVar249 + fVar210 * fVar117 + fVar225 * fVar212;
      fStack_54c = fVar185 * fVar139 + fVar300 * fVar182 + fVar228 * fVar134 + fVar227 * fVar220;
      fStack_548 = fVar184 * fVar277 + fVar301 * fVar253 + fVar284 * fVar135 + fVar229 * fVar222;
      fStack_544 = fVar291 + fVar161;
      local_460._0_4_ =
           fVar234 * fVar250 + fVar267 * fVar241 + fVar224 * fVar177 + fVar163 * fVar197;
      local_460._4_4_ =
           fVar256 * fVar252 + fVar269 * fVar181 + fVar268 * fVar180 + fVar176 * fVar207;
      fStack_458 = fVar265 * fVar183 + fVar271 * fVar251 + fVar270 * fVar233 + fVar178 * fVar208;
      fStack_454 = fVar266 * fVar254 + fVar273 * fVar272 + fVar226 * fVar138 + fVar179 * fVar209;
      fStack_450 = fVar234 * fVar162 + fVar267 * fVar249 + fVar210 * fVar177 + fVar212 * fVar197;
      fStack_44c = fVar256 * fVar185 + fVar269 * fVar182 + fVar228 * fVar180 + fVar220 * fVar207;
      fStack_448 = fVar265 * fVar184 + fVar271 * fVar253 + fVar284 * fVar233 + fVar222 * fVar208;
      fStack_444 = fVar161 + fVar273 + fStack_484 + 0.0;
      auVar259._0_4_ = fVar288 * fVar241 + fVar255 * fVar224 + fVar140 * fVar163 + fVar213 * fVar250
      ;
      auVar259._4_4_ = fVar289 * fVar181 + fVar196 * fVar268 + fVar141 * fVar176 + fVar221 * fVar252
      ;
      auVar259._8_4_ = fVar290 * fVar251 + fVar136 * fVar270 + fVar142 * fVar178 + fVar223 * fVar183
      ;
      auVar259._12_4_ =
           fVar291 * fVar272 + auVar19._12_4_ * fVar226 + fVar151 * fVar179 +
           auVar169._12_4_ * fVar254;
      auVar259._16_4_ =
           fVar288 * fVar249 + fVar255 * fVar210 + fVar140 * fVar212 + fVar213 * fVar162;
      auVar259._20_4_ =
           fVar289 * fVar182 + fVar196 * fVar228 + fVar141 * fVar220 + fVar221 * fVar185;
      auVar259._24_4_ =
           fVar290 * fVar253 + fVar136 * fVar284 + fVar142 * fVar222 + fVar223 * fVar184;
      auVar259._28_4_ = fVar273 + fVar151 + fStack_484 + fVar161;
      auVar20 = vsubps_avx(_local_560,auVar279);
      auVar21 = vsubps_avx(_local_460,auVar239);
      fVar255 = auVar20._0_4_;
      fVar196 = auVar20._4_4_;
      auVar16._4_4_ = fVar196 * auVar239._4_4_;
      auVar16._0_4_ = fVar255 * auVar239._0_4_;
      fVar136 = auVar20._8_4_;
      auVar16._8_4_ = fVar136 * auVar239._8_4_;
      fVar140 = auVar20._12_4_;
      auVar16._12_4_ = fVar140 * auVar239._12_4_;
      fVar141 = auVar20._16_4_;
      auVar16._16_4_ = fVar141 * auVar239._16_4_;
      fVar142 = auVar20._20_4_;
      auVar16._20_4_ = fVar142 * auVar239._20_4_;
      fVar151 = auVar20._24_4_;
      auVar16._24_4_ = fVar151 * auVar239._24_4_;
      auVar16._28_4_ = fVar161;
      fVar163 = auVar21._0_4_;
      fVar176 = auVar21._4_4_;
      auVar22._4_4_ = auVar279._4_4_ * fVar176;
      auVar22._0_4_ = auVar279._0_4_ * fVar163;
      fVar178 = auVar21._8_4_;
      auVar22._8_4_ = auVar279._8_4_ * fVar178;
      fVar179 = auVar21._12_4_;
      auVar22._12_4_ = auVar279._12_4_ * fVar179;
      fVar212 = auVar21._16_4_;
      auVar22._16_4_ = auVar279._16_4_ * fVar212;
      fVar220 = auVar21._20_4_;
      auVar22._20_4_ = auVar279._20_4_ * fVar220;
      fVar222 = auVar21._24_4_;
      auVar22._24_4_ = auVar279._24_4_ * fVar222;
      auVar22._28_4_ = fStack_444;
      auVar22 = vsubps_avx(auVar16,auVar22);
      auVar16 = vmaxps_avx(auVar126,auVar259);
      auVar27._4_4_ = auVar16._4_4_ * auVar16._4_4_ * (fVar196 * fVar196 + fVar176 * fVar176);
      auVar27._0_4_ = auVar16._0_4_ * auVar16._0_4_ * (fVar255 * fVar255 + fVar163 * fVar163);
      auVar27._8_4_ = auVar16._8_4_ * auVar16._8_4_ * (fVar136 * fVar136 + fVar178 * fVar178);
      auVar27._12_4_ = auVar16._12_4_ * auVar16._12_4_ * (fVar140 * fVar140 + fVar179 * fVar179);
      auVar27._16_4_ = auVar16._16_4_ * auVar16._16_4_ * (fVar141 * fVar141 + fVar212 * fVar212);
      auVar27._20_4_ = auVar16._20_4_ * auVar16._20_4_ * (fVar142 * fVar142 + fVar220 * fVar220);
      auVar27._24_4_ = auVar16._24_4_ * auVar16._24_4_ * (fVar151 * fVar151 + fVar222 * fVar222);
      auVar27._28_4_ = auVar21._28_4_ + fStack_444;
      auVar15._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar15._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar15._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar15._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar15._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar15._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar15._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar15._28_4_ = auVar22._28_4_;
      auVar16 = vcmpps_avx(auVar15,auVar27,2);
      auVar167._0_4_ = (float)(int)uVar109;
      auVar167._4_12_ = auVar158._4_12_;
      _local_420 = auVar167;
      auVar158 = vshufps_avx(auVar167,auVar167,0);
      auVar171._16_16_ = auVar158;
      auVar171._0_16_ = auVar158;
      auVar22 = vcmpps_avx(_DAT_01faff40,auVar171,1);
      auVar175 = ZEXT3264(auVar22);
      auVar158 = vpermilps_avx(auVar122,0xaa);
      register0x00001450 = auVar158;
      _local_4e0 = auVar158;
      auVar169 = vpermilps_avx(auVar297,0xaa);
      register0x00001550 = auVar169;
      _local_300 = auVar169;
      auVar17 = vpermilps_avx(auVar200,0xaa);
      register0x00001590 = auVar17;
      _local_a0 = auVar17;
      auVar18 = vpermilps_avx(auVar238,0xaa);
      auVar195 = ZEXT1664(auVar18);
      register0x00001510 = auVar18;
      _local_600 = auVar18;
      auVar27 = auVar22 & auVar16;
      auVar201 = ZEXT416((uint)(auVar201._0_4_ * 4.7683716e-07));
      local_6c0._0_16_ = auVar201;
      fVar163 = fVar197;
      fVar176 = fVar207;
      fVar178 = fVar208;
      fVar179 = fVar209;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar248 = ZEXT3264(auVar243);
        auVar264 = ZEXT3264(auVar258);
LAB_00ed177e:
        bVar115 = false;
        _local_5b0 = auVar119;
      }
      else {
        auVar16 = vandps_avx(auVar16,auVar22);
        fVar196 = auVar158._0_4_;
        fVar136 = auVar158._4_4_;
        fVar140 = auVar158._8_4_;
        fVar141 = auVar158._12_4_;
        fVar223 = auVar169._0_4_;
        fVar288 = auVar169._4_4_;
        fVar289 = auVar169._8_4_;
        fVar290 = auVar169._12_4_;
        fVar291 = auVar17._0_4_;
        fVar293 = auVar17._4_4_;
        fVar294 = auVar17._8_4_;
        fVar295 = auVar17._12_4_;
        local_4c0._0_4_ = auVar106._0_4_;
        local_4c0._4_4_ = auVar106._4_4_;
        fStack_4b8 = auVar106._8_4_;
        fStack_4b4 = auVar106._12_4_;
        fStack_4b0 = auVar106._16_4_;
        fStack_4ac = auVar106._20_4_;
        fStack_4a8 = auVar106._24_4_;
        fVar142 = auVar18._0_4_;
        fVar151 = auVar18._4_4_;
        fVar213 = auVar18._8_4_;
        fVar221 = auVar18._12_4_;
        local_4c0._0_4_ =
             fVar196 * fVar250 +
             fVar223 * fVar241 + fVar291 * fVar224 + fVar142 * (float)local_4c0._0_4_;
        local_4c0._4_4_ =
             fVar136 * fVar252 +
             fVar288 * fVar181 + fVar293 * fVar268 + fVar151 * (float)local_4c0._4_4_;
        fStack_4b8 = fVar140 * fVar183 +
                     fVar289 * fVar251 + fVar294 * fVar270 + fVar213 * fStack_4b8;
        fStack_4b4 = fVar141 * fVar254 +
                     fVar290 * fVar272 + fVar295 * fVar226 + fVar221 * fStack_4b4;
        fStack_4b0 = fVar196 * fVar162 +
                     fVar223 * fVar249 + fVar291 * fVar210 + fVar142 * fStack_4b0;
        fStack_4ac = fVar136 * fVar185 +
                     fVar288 * fVar182 + fVar293 * fVar228 + fVar151 * fStack_4ac;
        fStack_4a8 = fVar140 * fVar184 +
                     fVar289 * fVar253 + fVar294 * fVar284 + fVar213 * fStack_4a8;
        fStack_4a4 = auVar16._28_4_ +
                     auVar22._28_4_ + *(float *)(bspline_basis1 + lVar13 + 0x924) + 0.0;
        local_500._0_4_ = auVar105._0_4_;
        local_500._4_4_ = auVar105._4_4_;
        fStack_4f8 = auVar105._8_4_;
        fStack_4f4 = auVar105._12_4_;
        fStack_4f0 = auVar105._16_4_;
        fStack_4ec = auVar105._20_4_;
        fStack_4e8 = auVar105._24_4_;
        local_580._0_4_ = auVar104._0_4_;
        local_580._4_4_ = auVar104._4_4_;
        fStack_578 = auVar104._8_4_;
        fStack_574 = auVar104._12_4_;
        fStack_570 = auVar104._16_4_;
        fStack_56c = auVar104._20_4_;
        fStack_568 = auVar104._24_4_;
        local_5e0._0_4_ = auVar103._0_4_;
        local_5e0._4_4_ = auVar103._4_4_;
        fStack_5d8 = auVar103._8_4_;
        fStack_5d4 = auVar103._12_4_;
        fStack_5d0 = auVar103._16_4_;
        fStack_5cc = auVar103._20_4_;
        fStack_5c8 = auVar103._24_4_;
        local_580._0_4_ =
             fVar196 * (float)local_500._0_4_ +
             fVar223 * fVar230 + fVar291 * (float)local_580._0_4_ + fVar142 * (float)local_5e0._0_4_
        ;
        local_580._4_4_ =
             fVar136 * (float)local_500._4_4_ +
             fVar288 * fVar211 + fVar293 * (float)local_580._4_4_ + fVar151 * (float)local_5e0._4_4_
        ;
        fStack_578 = fVar140 * fStack_4f8 +
                     fVar289 * fVar232 + fVar294 * fStack_578 + fVar213 * fStack_5d8;
        fStack_574 = fVar141 * fStack_4f4 +
                     fVar290 * fVar150 + fVar295 * fStack_574 + fVar221 * fStack_5d4;
        fStack_570 = fVar196 * fStack_4f0 +
                     fVar223 * fStack_490 + fVar291 * fStack_570 + fVar142 * fStack_5d0;
        fStack_56c = fVar136 * fStack_4ec +
                     fVar288 * fStack_48c + fVar293 * fStack_56c + fVar151 * fStack_5cc;
        fStack_568 = fVar140 * fStack_4e8 +
                     fVar289 * fStack_488 + fVar294 * fStack_568 + fVar213 * fStack_5c8;
        fStack_564 = fVar266 + fStack_4a4 + auVar16._28_4_ + auVar22._28_4_;
        fVar212 = *(float *)(bspline_basis0 + lVar13 + 0x1210);
        fVar220 = *(float *)(bspline_basis0 + lVar13 + 0x1214);
        fVar222 = *(float *)(bspline_basis0 + lVar13 + 0x1218);
        fVar224 = *(float *)(bspline_basis0 + lVar13 + 0x121c);
        fVar268 = *(float *)(bspline_basis0 + lVar13 + 0x1220);
        fVar270 = *(float *)(bspline_basis0 + lVar13 + 0x1224);
        fVar226 = *(float *)(bspline_basis0 + lVar13 + 0x1228);
        fVar210 = *(float *)(bspline_basis0 + lVar13 + 0x1694);
        fVar228 = *(float *)(bspline_basis0 + lVar13 + 0x1698);
        fVar284 = *(float *)(bspline_basis0 + lVar13 + 0x169c);
        fVar230 = *(float *)(bspline_basis0 + lVar13 + 0x16a0);
        fVar211 = *(float *)(bspline_basis0 + lVar13 + 0x16a4);
        fVar232 = *(float *)(bspline_basis0 + lVar13 + 0x16a8);
        fVar150 = *(float *)(bspline_basis0 + lVar13 + 0x16ac);
        fVar241 = *(float *)(bspline_basis0 + lVar13 + 0x1b18);
        fVar181 = *(float *)(bspline_basis0 + lVar13 + 0x1b1c);
        fVar251 = *(float *)(bspline_basis0 + lVar13 + 0x1b20);
        fVar272 = *(float *)(bspline_basis0 + lVar13 + 0x1b24);
        fVar249 = *(float *)(bspline_basis0 + lVar13 + 0x1b28);
        fVar182 = *(float *)(bspline_basis0 + lVar13 + 0x1b2c);
        fVar253 = *(float *)(bspline_basis0 + lVar13 + 0x1b30);
        fVar250 = *(float *)(bspline_basis0 + lVar13 + 0x1f9c);
        fVar252 = *(float *)(bspline_basis0 + lVar13 + 0x1fa0);
        fVar183 = *(float *)(bspline_basis0 + lVar13 + 0x1fa4);
        fVar254 = *(float *)(bspline_basis0 + lVar13 + 0x1fa8);
        fVar162 = *(float *)(bspline_basis0 + lVar13 + 0x1fac);
        fVar185 = *(float *)(bspline_basis0 + lVar13 + 0x1fb0);
        fVar184 = *(float *)(bspline_basis0 + lVar13 + 0x1fb4);
        fVar161 = *(float *)(bspline_basis0 + lVar13 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar13 + 0x1fb8);
        fVar255 = *(float *)(bspline_basis0 + lVar13 + 0x16b0) + fVar161;
        local_4a0 = fVar137 * fVar212 + fVar296 * fVar210 + fVar117 * fVar241 + fVar225 * fVar250;
        fStack_49c = fVar139 * fVar220 + fVar300 * fVar228 + fVar134 * fVar181 + fVar227 * fVar252;
        fStack_498 = fVar277 * fVar222 + fVar301 * fVar284 + fVar135 * fVar251 + fVar229 * fVar183;
        fStack_494 = fVar164 * fVar224 + fVar302 * fVar230 + fVar118 * fVar272 + fVar231 * fVar254;
        fStack_490 = fVar137 * fVar268 + fVar296 * fVar211 + fVar117 * fVar249 + fVar225 * fVar162;
        fStack_48c = fVar139 * fVar270 + fVar300 * fVar232 + fVar134 * fVar182 + fVar227 * fVar185;
        fStack_488 = fVar277 * fVar226 + fVar301 * fVar150 + fVar135 * fVar253 + fVar229 * fVar184;
        fStack_484 = *(float *)(bspline_basis0 + lVar13 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar13 + 0x1fb8) +
                     fVar141 + *(float *)(bspline_basis1 + lVar13 + 0x4a0);
        auVar215._0_4_ =
             fVar234 * fVar212 + fVar177 * fVar241 + fVar197 * fVar250 + fVar267 * fVar210;
        auVar215._4_4_ =
             fVar256 * fVar220 + fVar180 * fVar181 + fVar207 * fVar252 + fVar269 * fVar228;
        auVar215._8_4_ =
             fVar265 * fVar222 + fVar233 * fVar251 + fVar208 * fVar183 + fVar271 * fVar284;
        auVar215._12_4_ =
             fVar266 * fVar224 + fVar138 * fVar272 + fVar209 * fVar254 + fVar273 * fVar230;
        auVar215._16_4_ =
             fVar234 * fVar268 + fVar177 * fVar249 + fVar197 * fVar162 + fVar267 * fVar211;
        auVar215._20_4_ =
             fVar256 * fVar270 + fVar180 * fVar182 + fVar207 * fVar185 + fVar269 * fVar232;
        auVar215._24_4_ =
             fVar265 * fVar226 + fVar233 * fVar253 + fVar208 * fVar184 + fVar271 * fVar150;
        auVar215._28_4_ =
             fVar161 + fVar141 + *(float *)(bspline_basis1 + lVar13 + 0x1c) +
                       fVar141 + *(float *)(bspline_basis1 + lVar13 + 0x4a0);
        local_500._4_4_ =
             fVar288 * fVar228 + fVar293 * fVar181 + fVar151 * fVar252 + fVar136 * fVar220;
        local_500._0_4_ =
             fVar223 * fVar210 + fVar291 * fVar241 + fVar142 * fVar250 + fVar196 * fVar212;
        fStack_4f8 = fVar289 * fVar284 + fVar294 * fVar251 + fVar213 * fVar183 + fVar140 * fVar222;
        fStack_4f4 = fVar290 * fVar230 + fVar295 * fVar272 + fVar221 * fVar254 + fVar141 * fVar224;
        fStack_4f0 = fVar223 * fVar211 + fVar291 * fVar249 + fVar142 * fVar162 + fVar196 * fVar268;
        fStack_4ec = fVar288 * fVar232 + fVar293 * fVar182 + fVar151 * fVar185 + fVar136 * fVar270;
        fStack_4e8 = fVar289 * fVar150 + fVar294 * fVar253 + fVar213 * fVar184 + fVar140 * fVar226;
        fStack_4e4 = fVar255 + *(float *)(bspline_basis0 + lVar13 + 0x122c);
        fVar212 = *(float *)(bspline_basis1 + lVar13 + 0x1b18);
        fVar220 = *(float *)(bspline_basis1 + lVar13 + 0x1b1c);
        fVar222 = *(float *)(bspline_basis1 + lVar13 + 0x1b20);
        fVar224 = *(float *)(bspline_basis1 + lVar13 + 0x1b24);
        fVar268 = *(float *)(bspline_basis1 + lVar13 + 0x1b28);
        fVar270 = *(float *)(bspline_basis1 + lVar13 + 0x1b2c);
        fVar226 = *(float *)(bspline_basis1 + lVar13 + 0x1b30);
        fVar210 = *(float *)(bspline_basis1 + lVar13 + 0x1f9c);
        fVar228 = *(float *)(bspline_basis1 + lVar13 + 0x1fa0);
        fVar284 = *(float *)(bspline_basis1 + lVar13 + 0x1fa4);
        fVar230 = *(float *)(bspline_basis1 + lVar13 + 0x1fa8);
        fVar211 = *(float *)(bspline_basis1 + lVar13 + 0x1fac);
        fVar232 = *(float *)(bspline_basis1 + lVar13 + 0x1fb0);
        fVar150 = *(float *)(bspline_basis1 + lVar13 + 0x1fb4);
        fVar241 = *(float *)(bspline_basis1 + lVar13 + 0x1694);
        fVar181 = *(float *)(bspline_basis1 + lVar13 + 0x1698);
        fVar251 = *(float *)(bspline_basis1 + lVar13 + 0x169c);
        fVar272 = *(float *)(bspline_basis1 + lVar13 + 0x16a0);
        fVar249 = *(float *)(bspline_basis1 + lVar13 + 0x16a4);
        fVar182 = *(float *)(bspline_basis1 + lVar13 + 0x16a8);
        fVar253 = *(float *)(bspline_basis1 + lVar13 + 0x16ac);
        fVar250 = *(float *)(bspline_basis1 + lVar13 + 0x1210);
        fVar252 = *(float *)(bspline_basis1 + lVar13 + 0x1214);
        fVar183 = *(float *)(bspline_basis1 + lVar13 + 0x1218);
        fVar254 = *(float *)(bspline_basis1 + lVar13 + 0x121c);
        fVar162 = *(float *)(bspline_basis1 + lVar13 + 0x1220);
        fVar185 = *(float *)(bspline_basis1 + lVar13 + 0x1224);
        fVar184 = *(float *)(bspline_basis1 + lVar13 + 0x1228);
        auVar244._0_4_ =
             fVar137 * fVar250 + fVar296 * fVar241 + fVar117 * fVar212 + fVar225 * fVar210;
        auVar244._4_4_ =
             fVar139 * fVar252 + fVar300 * fVar181 + fVar134 * fVar220 + fVar227 * fVar228;
        auVar244._8_4_ =
             fVar277 * fVar183 + fVar301 * fVar251 + fVar135 * fVar222 + fVar229 * fVar284;
        auVar244._12_4_ =
             fVar164 * fVar254 + fVar302 * fVar272 + fVar118 * fVar224 + fVar231 * fVar230;
        auVar244._16_4_ =
             fVar137 * fVar162 + fVar296 * fVar249 + fVar117 * fVar268 + fVar225 * fVar211;
        auVar244._20_4_ =
             fVar139 * fVar185 + fVar300 * fVar182 + fVar134 * fVar270 + fVar227 * fVar232;
        auVar244._24_4_ =
             fVar277 * fVar184 + fVar301 * fVar253 + fVar135 * fVar226 + fVar229 * fVar150;
        auVar244._28_4_ = fVar118 + fVar118 + fVar141 + fVar255;
        auVar260._0_4_ =
             fVar234 * fVar250 + fVar267 * fVar241 + fVar177 * fVar212 + fVar197 * fVar210;
        auVar260._4_4_ =
             fVar256 * fVar252 + fVar269 * fVar181 + fVar180 * fVar220 + fVar207 * fVar228;
        auVar260._8_4_ =
             fVar265 * fVar183 + fVar271 * fVar251 + fVar233 * fVar222 + fVar208 * fVar284;
        auVar260._12_4_ =
             fVar266 * fVar254 + fVar273 * fVar272 + fVar138 * fVar224 + fVar209 * fVar230;
        auVar260._16_4_ =
             fVar234 * fVar162 + fVar267 * fVar249 + fVar177 * fVar268 + fVar197 * fVar211;
        auVar260._20_4_ =
             fVar256 * fVar185 + fVar269 * fVar182 + fVar180 * fVar270 + fVar207 * fVar232;
        auVar260._24_4_ =
             fVar265 * fVar184 + fVar271 * fVar253 + fVar233 * fVar226 + fVar208 * fVar150;
        auVar260._28_4_ = fVar118 + fVar118 + fVar118 + fVar141;
        auVar160._0_4_ =
             fVar196 * fVar250 + fVar223 * fVar241 + fVar291 * fVar212 + fVar210 * fVar142;
        auVar160._4_4_ =
             fVar136 * fVar252 + fVar288 * fVar181 + fVar293 * fVar220 + fVar228 * fVar151;
        auVar160._8_4_ =
             fVar140 * fVar183 + fVar289 * fVar251 + fVar294 * fVar222 + fVar284 * fVar213;
        auVar160._12_4_ =
             fVar141 * fVar254 + fVar290 * fVar272 + fVar295 * fVar224 + fVar230 * fVar221;
        auVar160._16_4_ =
             fVar196 * fVar162 + fVar223 * fVar249 + fVar291 * fVar268 + fVar211 * fVar142;
        auVar160._20_4_ =
             fVar136 * fVar185 + fVar288 * fVar182 + fVar293 * fVar270 + fVar232 * fVar151;
        auVar160._24_4_ =
             fVar140 * fVar184 + fVar289 * fVar253 + fVar294 * fVar226 + fVar150 * fVar213;
        auVar160._28_4_ =
             *(float *)(bspline_basis1 + lVar13 + 0x122c) +
             *(float *)(bspline_basis1 + lVar13 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar13 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar13 + 0x1fb8);
        auVar191._8_4_ = 0x7fffffff;
        auVar191._0_8_ = 0x7fffffff7fffffff;
        auVar191._12_4_ = 0x7fffffff;
        auVar191._16_4_ = 0x7fffffff;
        auVar191._20_4_ = 0x7fffffff;
        auVar191._24_4_ = 0x7fffffff;
        auVar191._28_4_ = 0x7fffffff;
        auVar102._4_4_ = fStack_49c;
        auVar102._0_4_ = local_4a0;
        auVar102._8_4_ = fStack_498;
        auVar102._12_4_ = fStack_494;
        auVar102._16_4_ = fStack_490;
        auVar102._20_4_ = fStack_48c;
        auVar102._24_4_ = fStack_488;
        auVar102._28_4_ = fStack_484;
        auVar22 = vandps_avx(auVar102,auVar191);
        auVar27 = vandps_avx(auVar215,auVar191);
        auVar27 = vmaxps_avx(auVar22,auVar27);
        auVar22 = vandps_avx(auVar191,_local_500);
        auVar22 = vmaxps_avx(auVar27,auVar22);
        auVar201 = vpermilps_avx(auVar201,0);
        auVar216._16_16_ = auVar201;
        auVar216._0_16_ = auVar201;
        auVar22 = vcmpps_avx(auVar22,auVar216,1);
        auVar15 = vblendvps_avx(auVar102,auVar20,auVar22);
        auVar171 = vblendvps_avx(auVar215,auVar21,auVar22);
        auVar22 = vandps_avx(auVar244,auVar191);
        auVar27 = vandps_avx(auVar260,auVar191);
        auVar24 = vmaxps_avx(auVar22,auVar27);
        auVar22 = vandps_avx(auVar160,auVar191);
        auVar22 = vmaxps_avx(auVar24,auVar22);
        auVar24 = vcmpps_avx(auVar22,auVar216,1);
        auVar22 = vblendvps_avx(auVar244,auVar20,auVar24);
        auVar20 = vblendvps_avx(auVar260,auVar21,auVar24);
        fVar117 = auVar15._0_4_;
        fVar134 = auVar15._4_4_;
        fVar135 = auVar15._8_4_;
        fVar118 = auVar15._12_4_;
        fVar137 = auVar15._16_4_;
        fVar139 = auVar15._20_4_;
        fVar277 = auVar15._24_4_;
        fVar164 = auVar22._0_4_;
        fVar177 = auVar22._4_4_;
        fVar255 = auVar22._8_4_;
        fVar180 = auVar22._12_4_;
        fVar196 = auVar22._16_4_;
        fVar233 = auVar22._20_4_;
        fVar136 = auVar22._24_4_;
        fVar138 = -auVar22._28_4_;
        fVar212 = auVar171._0_4_;
        fVar268 = auVar171._4_4_;
        fVar228 = auVar171._8_4_;
        fVar232 = auVar171._12_4_;
        fVar251 = auVar171._16_4_;
        fVar253 = auVar171._20_4_;
        fVar254 = auVar171._24_4_;
        auVar127._0_4_ = fVar212 * fVar212 + fVar117 * fVar117;
        auVar127._4_4_ = fVar268 * fVar268 + fVar134 * fVar134;
        auVar127._8_4_ = fVar228 * fVar228 + fVar135 * fVar135;
        auVar127._12_4_ = fVar232 * fVar232 + fVar118 * fVar118;
        auVar127._16_4_ = fVar251 * fVar251 + fVar137 * fVar137;
        auVar127._20_4_ = fVar253 * fVar253 + fVar139 * fVar139;
        auVar127._24_4_ = fVar254 * fVar254 + fVar277 * fVar277;
        auVar127._28_4_ = auVar260._28_4_ + auVar15._28_4_;
        auVar21 = vrsqrtps_avx(auVar127);
        fVar220 = auVar21._0_4_;
        fVar222 = auVar21._4_4_;
        auVar24._4_4_ = fVar222 * 1.5;
        auVar24._0_4_ = fVar220 * 1.5;
        fVar224 = auVar21._8_4_;
        auVar24._8_4_ = fVar224 * 1.5;
        fVar270 = auVar21._12_4_;
        auVar24._12_4_ = fVar270 * 1.5;
        fVar226 = auVar21._16_4_;
        auVar24._16_4_ = fVar226 * 1.5;
        fVar210 = auVar21._20_4_;
        auVar24._20_4_ = fVar210 * 1.5;
        fVar284 = auVar21._24_4_;
        fVar161 = auVar27._28_4_;
        auVar24._24_4_ = fVar284 * 1.5;
        auVar24._28_4_ = fVar161;
        auVar21._4_4_ = fVar222 * fVar222 * fVar222 * auVar127._4_4_ * 0.5;
        auVar21._0_4_ = fVar220 * fVar220 * fVar220 * auVar127._0_4_ * 0.5;
        auVar21._8_4_ = fVar224 * fVar224 * fVar224 * auVar127._8_4_ * 0.5;
        auVar21._12_4_ = fVar270 * fVar270 * fVar270 * auVar127._12_4_ * 0.5;
        auVar21._16_4_ = fVar226 * fVar226 * fVar226 * auVar127._16_4_ * 0.5;
        auVar21._20_4_ = fVar210 * fVar210 * fVar210 * auVar127._20_4_ * 0.5;
        auVar21._24_4_ = fVar284 * fVar284 * fVar284 * auVar127._24_4_ * 0.5;
        auVar21._28_4_ = auVar127._28_4_;
        auVar21 = vsubps_avx(auVar24,auVar21);
        fVar220 = auVar21._0_4_;
        fVar270 = auVar21._4_4_;
        fVar284 = auVar21._8_4_;
        fVar150 = auVar21._12_4_;
        fVar272 = auVar21._16_4_;
        fVar250 = auVar21._20_4_;
        fVar162 = auVar21._24_4_;
        fVar222 = auVar20._0_4_;
        fVar226 = auVar20._4_4_;
        fVar230 = auVar20._8_4_;
        fVar241 = auVar20._12_4_;
        fVar249 = auVar20._16_4_;
        fVar252 = auVar20._20_4_;
        fVar185 = auVar20._24_4_;
        auVar128._0_4_ = fVar222 * fVar222 + fVar164 * fVar164;
        auVar128._4_4_ = fVar226 * fVar226 + fVar177 * fVar177;
        auVar128._8_4_ = fVar230 * fVar230 + fVar255 * fVar255;
        auVar128._12_4_ = fVar241 * fVar241 + fVar180 * fVar180;
        auVar128._16_4_ = fVar249 * fVar249 + fVar196 * fVar196;
        auVar128._20_4_ = fVar252 * fVar252 + fVar233 * fVar233;
        auVar128._24_4_ = fVar185 * fVar185 + fVar136 * fVar136;
        auVar128._28_4_ = auVar22._28_4_ + auVar21._28_4_;
        auVar22 = vrsqrtps_avx(auVar128);
        fVar224 = auVar22._0_4_;
        fVar210 = auVar22._4_4_;
        auVar25._4_4_ = fVar210 * 1.5;
        auVar25._0_4_ = fVar224 * 1.5;
        fVar211 = auVar22._8_4_;
        auVar25._8_4_ = fVar211 * 1.5;
        fVar181 = auVar22._12_4_;
        auVar25._12_4_ = fVar181 * 1.5;
        fVar182 = auVar22._16_4_;
        auVar25._16_4_ = fVar182 * 1.5;
        fVar183 = auVar22._20_4_;
        auVar25._20_4_ = fVar183 * 1.5;
        fVar184 = auVar22._24_4_;
        auVar25._24_4_ = fVar184 * 1.5;
        auVar25._28_4_ = fVar161;
        auVar26._4_4_ = fVar210 * fVar210 * fVar210 * auVar128._4_4_ * 0.5;
        auVar26._0_4_ = fVar224 * fVar224 * fVar224 * auVar128._0_4_ * 0.5;
        auVar26._8_4_ = fVar211 * fVar211 * fVar211 * auVar128._8_4_ * 0.5;
        auVar26._12_4_ = fVar181 * fVar181 * fVar181 * auVar128._12_4_ * 0.5;
        auVar26._16_4_ = fVar182 * fVar182 * fVar182 * auVar128._16_4_ * 0.5;
        auVar26._20_4_ = fVar183 * fVar183 * fVar183 * auVar128._20_4_ * 0.5;
        auVar26._24_4_ = fVar184 * fVar184 * fVar184 * auVar128._24_4_ * 0.5;
        auVar26._28_4_ = auVar128._28_4_;
        auVar22 = vsubps_avx(auVar25,auVar26);
        fVar224 = auVar22._0_4_;
        fVar210 = auVar22._4_4_;
        fVar211 = auVar22._8_4_;
        fVar181 = auVar22._12_4_;
        fVar182 = auVar22._16_4_;
        fVar183 = auVar22._20_4_;
        fVar184 = auVar22._24_4_;
        fVar212 = auVar125._0_4_ * fVar212 * fVar220;
        fVar268 = auVar125._4_4_ * fVar268 * fVar270;
        auVar23._4_4_ = fVar268;
        auVar23._0_4_ = fVar212;
        fVar228 = auVar125._8_4_ * fVar228 * fVar284;
        auVar23._8_4_ = fVar228;
        fVar232 = auVar125._12_4_ * fVar232 * fVar150;
        auVar23._12_4_ = fVar232;
        fVar251 = auVar125._16_4_ * fVar251 * fVar272;
        auVar23._16_4_ = fVar251;
        fVar253 = auVar125._20_4_ * fVar253 * fVar250;
        auVar23._20_4_ = fVar253;
        fVar254 = auVar125._24_4_ * fVar254 * fVar162;
        auVar23._24_4_ = fVar254;
        auVar23._28_4_ = fVar138;
        local_5e0._4_4_ = fVar268 + auVar279._4_4_;
        local_5e0._0_4_ = fVar212 + auVar279._0_4_;
        fStack_5d8 = fVar228 + auVar279._8_4_;
        fStack_5d4 = fVar232 + auVar279._12_4_;
        fStack_5d0 = fVar251 + auVar279._16_4_;
        fStack_5cc = fVar253 + auVar279._20_4_;
        fStack_5c8 = fVar254 + auVar279._24_4_;
        fStack_5c4 = fVar138 + auVar279._28_4_;
        fVar212 = auVar125._0_4_ * fVar220 * -fVar117;
        fVar268 = auVar125._4_4_ * fVar270 * -fVar134;
        auVar28._4_4_ = fVar268;
        auVar28._0_4_ = fVar212;
        fVar228 = auVar125._8_4_ * fVar284 * -fVar135;
        auVar28._8_4_ = fVar228;
        fVar232 = auVar125._12_4_ * fVar150 * -fVar118;
        auVar28._12_4_ = fVar232;
        fVar251 = auVar125._16_4_ * fVar272 * -fVar137;
        auVar28._16_4_ = fVar251;
        fVar253 = auVar125._20_4_ * fVar250 * -fVar139;
        auVar28._20_4_ = fVar253;
        fVar254 = auVar125._24_4_ * fVar162 * -fVar277;
        auVar28._24_4_ = fVar254;
        auVar28._28_4_ = fVar161;
        local_480._4_4_ = fVar268 + auVar239._4_4_;
        local_480._0_4_ = fVar212 + auVar239._0_4_;
        fStack_478 = fVar228 + auVar239._8_4_;
        fStack_474 = fVar232 + auVar239._12_4_;
        fStack_470 = fVar251 + auVar239._16_4_;
        fStack_46c = fVar253 + auVar239._20_4_;
        fStack_468 = fVar254 + auVar239._24_4_;
        fStack_464 = fVar161 + auVar239._28_4_;
        fVar212 = fVar220 * 0.0 * auVar125._0_4_;
        fVar220 = fVar270 * 0.0 * auVar125._4_4_;
        auVar29._4_4_ = fVar220;
        auVar29._0_4_ = fVar212;
        fVar268 = fVar284 * 0.0 * auVar125._8_4_;
        auVar29._8_4_ = fVar268;
        fVar270 = fVar150 * 0.0 * auVar125._12_4_;
        auVar29._12_4_ = fVar270;
        fVar228 = fVar272 * 0.0 * auVar125._16_4_;
        auVar29._16_4_ = fVar228;
        fVar284 = fVar250 * 0.0 * auVar125._20_4_;
        auVar29._20_4_ = fVar284;
        fVar232 = fVar162 * 0.0 * auVar125._24_4_;
        auVar29._24_4_ = fVar232;
        auVar29._28_4_ = fVar273;
        auVar217._0_4_ = fVar212 + (float)local_580._0_4_;
        auVar217._4_4_ = fVar220 + (float)local_580._4_4_;
        auVar217._8_4_ = fVar268 + fStack_578;
        auVar217._12_4_ = fVar270 + fStack_574;
        auVar217._16_4_ = fVar228 + fStack_570;
        auVar217._20_4_ = fVar284 + fStack_56c;
        auVar217._24_4_ = fVar232 + fStack_568;
        auVar217._28_4_ = fVar273 + fStack_564;
        fVar212 = auVar259._0_4_ * fVar222 * fVar224;
        fVar220 = auVar259._4_4_ * fVar226 * fVar210;
        auVar30._4_4_ = fVar220;
        auVar30._0_4_ = fVar212;
        fVar222 = auVar259._8_4_ * fVar230 * fVar211;
        auVar30._8_4_ = fVar222;
        fVar268 = auVar259._12_4_ * fVar241 * fVar181;
        auVar30._12_4_ = fVar268;
        fVar270 = auVar259._16_4_ * fVar249 * fVar182;
        auVar30._16_4_ = fVar270;
        fVar226 = auVar259._20_4_ * fVar252 * fVar183;
        auVar30._20_4_ = fVar226;
        fVar228 = auVar259._24_4_ * fVar185 * fVar184;
        auVar30._24_4_ = fVar228;
        auVar30._28_4_ = auVar20._28_4_;
        auVar15 = vsubps_avx(auVar279,auVar23);
        auVar261._0_4_ = (float)local_560._0_4_ + fVar212;
        auVar261._4_4_ = (float)local_560._4_4_ + fVar220;
        auVar261._8_4_ = fStack_558 + fVar222;
        auVar261._12_4_ = fStack_554 + fVar268;
        auVar261._16_4_ = fStack_550 + fVar270;
        auVar261._20_4_ = fStack_54c + fVar226;
        auVar261._24_4_ = fStack_548 + fVar228;
        auVar261._28_4_ = fStack_544 + auVar20._28_4_;
        fVar212 = auVar259._0_4_ * -fVar164 * fVar224;
        fVar220 = auVar259._4_4_ * -fVar177 * fVar210;
        auVar20._4_4_ = fVar220;
        auVar20._0_4_ = fVar212;
        fVar222 = auVar259._8_4_ * -fVar255 * fVar211;
        auVar20._8_4_ = fVar222;
        fVar268 = auVar259._12_4_ * -fVar180 * fVar181;
        auVar20._12_4_ = fVar268;
        fVar270 = auVar259._16_4_ * -fVar196 * fVar182;
        auVar20._16_4_ = fVar270;
        fVar226 = auVar259._20_4_ * -fVar233 * fVar183;
        auVar20._20_4_ = fVar226;
        fVar228 = auVar259._24_4_ * -fVar136 * fVar184;
        auVar20._24_4_ = fVar228;
        auVar20._28_4_ = fVar290;
        auVar171 = vsubps_avx(auVar239,auVar28);
        auVar274._0_4_ = fVar212 + (float)local_460._0_4_;
        auVar274._4_4_ = fVar220 + (float)local_460._4_4_;
        auVar274._8_4_ = fVar222 + fStack_458;
        auVar274._12_4_ = fVar268 + fStack_454;
        auVar274._16_4_ = fVar270 + fStack_450;
        auVar274._20_4_ = fVar226 + fStack_44c;
        auVar274._24_4_ = fVar228 + fStack_448;
        auVar274._28_4_ = fVar290 + fStack_444;
        fVar212 = fVar224 * 0.0 * auVar259._0_4_;
        fVar220 = fVar210 * 0.0 * auVar259._4_4_;
        auVar31._4_4_ = fVar220;
        auVar31._0_4_ = fVar212;
        fVar222 = fVar211 * 0.0 * auVar259._8_4_;
        auVar31._8_4_ = fVar222;
        fVar224 = fVar181 * 0.0 * auVar259._12_4_;
        auVar31._12_4_ = fVar224;
        fVar268 = fVar182 * 0.0 * auVar259._16_4_;
        auVar31._16_4_ = fVar268;
        fVar270 = fVar183 * 0.0 * auVar259._20_4_;
        auVar31._20_4_ = fVar270;
        fVar226 = fVar184 * 0.0 * auVar259._24_4_;
        auVar31._24_4_ = fVar226;
        auVar31._28_4_ = 0x3f000000;
        auVar279 = vsubps_avx(_local_580,auVar29);
        auVar292._0_4_ = fVar212 + (float)local_4c0._0_4_;
        auVar292._4_4_ = fVar220 + (float)local_4c0._4_4_;
        auVar292._8_4_ = fVar222 + fStack_4b8;
        auVar292._12_4_ = fVar224 + fStack_4b4;
        auVar292._16_4_ = fVar268 + fStack_4b0;
        auVar292._20_4_ = fVar270 + fStack_4ac;
        auVar292._24_4_ = fVar226 + fStack_4a8;
        auVar292._28_4_ = fStack_4a4 + 0.5;
        auVar22 = vsubps_avx(_local_560,auVar30);
        auVar20 = vsubps_avx(_local_460,auVar20);
        auVar24 = vsubps_avx(_local_4c0,auVar31);
        auVar21 = vsubps_avx(auVar274,auVar171);
        auVar27 = vsubps_avx(auVar292,auVar279);
        auVar32._4_4_ = auVar279._4_4_ * auVar21._4_4_;
        auVar32._0_4_ = auVar279._0_4_ * auVar21._0_4_;
        auVar32._8_4_ = auVar279._8_4_ * auVar21._8_4_;
        auVar32._12_4_ = auVar279._12_4_ * auVar21._12_4_;
        auVar32._16_4_ = auVar279._16_4_ * auVar21._16_4_;
        auVar32._20_4_ = auVar279._20_4_ * auVar21._20_4_;
        auVar32._24_4_ = auVar279._24_4_ * auVar21._24_4_;
        auVar32._28_4_ = fVar302;
        auVar33._4_4_ = auVar171._4_4_ * auVar27._4_4_;
        auVar33._0_4_ = auVar171._0_4_ * auVar27._0_4_;
        auVar33._8_4_ = auVar171._8_4_ * auVar27._8_4_;
        auVar33._12_4_ = auVar171._12_4_ * auVar27._12_4_;
        auVar33._16_4_ = auVar171._16_4_ * auVar27._16_4_;
        auVar33._20_4_ = auVar171._20_4_ * auVar27._20_4_;
        auVar33._24_4_ = auVar171._24_4_ * auVar27._24_4_;
        auVar33._28_4_ = fStack_444;
        auVar239 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = auVar15._4_4_ * auVar27._4_4_;
        auVar34._0_4_ = auVar15._0_4_ * auVar27._0_4_;
        auVar34._8_4_ = auVar15._8_4_ * auVar27._8_4_;
        auVar34._12_4_ = auVar15._12_4_ * auVar27._12_4_;
        auVar34._16_4_ = auVar15._16_4_ * auVar27._16_4_;
        auVar34._20_4_ = auVar15._20_4_ * auVar27._20_4_;
        auVar34._24_4_ = auVar15._24_4_ * auVar27._24_4_;
        auVar34._28_4_ = auVar27._28_4_;
        auVar25 = vsubps_avx(auVar261,auVar15);
        auVar35._4_4_ = auVar25._4_4_ * auVar279._4_4_;
        auVar35._0_4_ = auVar25._0_4_ * auVar279._0_4_;
        auVar35._8_4_ = auVar25._8_4_ * auVar279._8_4_;
        auVar35._12_4_ = auVar25._12_4_ * auVar279._12_4_;
        auVar35._16_4_ = auVar25._16_4_ * auVar279._16_4_;
        auVar35._20_4_ = auVar25._20_4_ * auVar279._20_4_;
        auVar35._24_4_ = auVar25._24_4_ * auVar279._24_4_;
        auVar35._28_4_ = fStack_544;
        auVar26 = vsubps_avx(auVar35,auVar34);
        auVar36._4_4_ = auVar25._4_4_ * auVar171._4_4_;
        auVar36._0_4_ = auVar25._0_4_ * auVar171._0_4_;
        auVar36._8_4_ = auVar25._8_4_ * auVar171._8_4_;
        auVar36._12_4_ = auVar25._12_4_ * auVar171._12_4_;
        auVar36._16_4_ = auVar25._16_4_ * auVar171._16_4_;
        auVar36._20_4_ = auVar25._20_4_ * auVar171._20_4_;
        auVar36._24_4_ = auVar25._24_4_ * auVar171._24_4_;
        auVar36._28_4_ = auVar27._28_4_;
        auVar37._4_4_ = auVar15._4_4_ * auVar21._4_4_;
        auVar37._0_4_ = auVar15._0_4_ * auVar21._0_4_;
        auVar37._8_4_ = auVar15._8_4_ * auVar21._8_4_;
        auVar37._12_4_ = auVar15._12_4_ * auVar21._12_4_;
        auVar37._16_4_ = auVar15._16_4_ * auVar21._16_4_;
        auVar37._20_4_ = auVar15._20_4_ * auVar21._20_4_;
        auVar37._24_4_ = auVar15._24_4_ * auVar21._24_4_;
        auVar37._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar37,auVar36);
        auVar129._0_4_ = auVar239._0_4_ * 0.0 + auVar21._0_4_ + auVar26._0_4_ * 0.0;
        auVar129._4_4_ = auVar239._4_4_ * 0.0 + auVar21._4_4_ + auVar26._4_4_ * 0.0;
        auVar129._8_4_ = auVar239._8_4_ * 0.0 + auVar21._8_4_ + auVar26._8_4_ * 0.0;
        auVar129._12_4_ = auVar239._12_4_ * 0.0 + auVar21._12_4_ + auVar26._12_4_ * 0.0;
        auVar129._16_4_ = auVar239._16_4_ * 0.0 + auVar21._16_4_ + auVar26._16_4_ * 0.0;
        auVar129._20_4_ = auVar239._20_4_ * 0.0 + auVar21._20_4_ + auVar26._20_4_ * 0.0;
        auVar129._24_4_ = auVar239._24_4_ * 0.0 + auVar21._24_4_ + auVar26._24_4_ * 0.0;
        auVar129._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar26._28_4_;
        auVar239 = vcmpps_avx(auVar129,ZEXT432(0) << 0x20,2);
        local_440 = vblendvps_avx(auVar22,_local_5e0,auVar239);
        _local_540 = vblendvps_avx(auVar20,_local_480,auVar239);
        auVar22 = vblendvps_avx(auVar24,auVar217,auVar239);
        auVar20 = vblendvps_avx(auVar15,auVar261,auVar239);
        auVar21 = vblendvps_avx(auVar171,auVar274,auVar239);
        auVar27 = vblendvps_avx(auVar279,auVar292,auVar239);
        auVar15 = vblendvps_avx(auVar261,auVar15,auVar239);
        auVar171 = vblendvps_avx(auVar274,auVar171,auVar239);
        local_6e0 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
        auStack_6d0 = auVar16._16_16_;
        auVar16 = vblendvps_avx(auVar292,auVar279,auVar239);
        auVar15 = vsubps_avx(auVar15,local_440);
        auVar279 = vsubps_avx(auVar171,_local_540);
        auVar25 = vsubps_avx(auVar16,auVar22);
        auVar16 = vsubps_avx(_local_540,auVar21);
        fVar212 = auVar279._0_4_;
        fVar277 = auVar22._0_4_;
        fVar270 = auVar279._4_4_;
        fVar164 = auVar22._4_4_;
        auVar38._4_4_ = fVar164 * fVar270;
        auVar38._0_4_ = fVar277 * fVar212;
        fVar230 = auVar279._8_4_;
        fVar177 = auVar22._8_4_;
        auVar38._8_4_ = fVar177 * fVar230;
        fVar181 = auVar279._12_4_;
        fVar255 = auVar22._12_4_;
        auVar38._12_4_ = fVar255 * fVar181;
        fVar253 = auVar279._16_4_;
        fVar180 = auVar22._16_4_;
        auVar38._16_4_ = fVar180 * fVar253;
        fVar162 = auVar279._20_4_;
        fVar196 = auVar22._20_4_;
        auVar38._20_4_ = fVar196 * fVar162;
        fVar134 = auVar279._24_4_;
        fVar233 = auVar22._24_4_;
        auVar38._24_4_ = fVar233 * fVar134;
        auVar38._28_4_ = auVar171._28_4_;
        fVar220 = local_540._0_4_;
        fVar221 = auVar25._0_4_;
        fVar226 = local_540._4_4_;
        fVar223 = auVar25._4_4_;
        auVar39._4_4_ = fVar223 * fVar226;
        auVar39._0_4_ = fVar221 * fVar220;
        fVar211 = local_540._8_4_;
        fVar225 = auVar25._8_4_;
        auVar39._8_4_ = fVar225 * fVar211;
        fVar251 = local_540._12_4_;
        fVar227 = auVar25._12_4_;
        auVar39._12_4_ = fVar227 * fVar251;
        fVar250 = local_540._16_4_;
        fVar229 = auVar25._16_4_;
        auVar39._16_4_ = fVar229 * fVar250;
        fVar185 = local_540._20_4_;
        fVar231 = auVar25._20_4_;
        auVar39._20_4_ = fVar231 * fVar185;
        fVar135 = local_540._24_4_;
        fVar234 = auVar25._24_4_;
        uVar7 = auVar24._28_4_;
        auVar39._24_4_ = fVar234 * fVar135;
        auVar39._28_4_ = uVar7;
        auVar171 = vsubps_avx(auVar39,auVar38);
        fVar222 = local_440._0_4_;
        fVar210 = local_440._4_4_;
        auVar40._4_4_ = fVar223 * fVar210;
        auVar40._0_4_ = fVar221 * fVar222;
        fVar232 = local_440._8_4_;
        auVar40._8_4_ = fVar225 * fVar232;
        fVar272 = local_440._12_4_;
        auVar40._12_4_ = fVar227 * fVar272;
        fVar252 = local_440._16_4_;
        auVar40._16_4_ = fVar229 * fVar252;
        fVar184 = local_440._20_4_;
        auVar40._20_4_ = fVar231 * fVar184;
        fVar118 = local_440._24_4_;
        auVar40._24_4_ = fVar234 * fVar118;
        auVar40._28_4_ = uVar7;
        fVar224 = auVar15._0_4_;
        fVar228 = auVar15._4_4_;
        auVar41._4_4_ = fVar164 * fVar228;
        auVar41._0_4_ = fVar277 * fVar224;
        fVar150 = auVar15._8_4_;
        auVar41._8_4_ = fVar177 * fVar150;
        fVar249 = auVar15._12_4_;
        auVar41._12_4_ = fVar255 * fVar249;
        fVar183 = auVar15._16_4_;
        auVar41._16_4_ = fVar180 * fVar183;
        fVar161 = auVar15._20_4_;
        auVar41._20_4_ = fVar196 * fVar161;
        fVar137 = auVar15._24_4_;
        auVar41._24_4_ = fVar233 * fVar137;
        auVar41._28_4_ = auVar292._28_4_;
        auVar24 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = fVar226 * fVar228;
        auVar42._0_4_ = fVar220 * fVar224;
        auVar42._8_4_ = fVar211 * fVar150;
        auVar42._12_4_ = fVar251 * fVar249;
        auVar42._16_4_ = fVar250 * fVar183;
        auVar42._20_4_ = fVar185 * fVar161;
        auVar42._24_4_ = fVar135 * fVar137;
        auVar42._28_4_ = uVar7;
        auVar298._0_4_ = fVar222 * fVar212;
        auVar298._4_4_ = fVar210 * fVar270;
        auVar298._8_4_ = fVar232 * fVar230;
        auVar298._12_4_ = fVar272 * fVar181;
        auVar298._16_4_ = fVar252 * fVar253;
        auVar298._20_4_ = fVar184 * fVar162;
        auVar298._24_4_ = fVar118 * fVar134;
        auVar298._28_4_ = 0;
        auVar26 = vsubps_avx(auVar298,auVar42);
        auVar23 = vsubps_avx(auVar22,auVar27);
        fVar268 = auVar26._28_4_ + auVar24._28_4_;
        auVar145._0_4_ = auVar26._0_4_ + auVar24._0_4_ * 0.0 + auVar171._0_4_ * 0.0;
        auVar145._4_4_ = auVar26._4_4_ + auVar24._4_4_ * 0.0 + auVar171._4_4_ * 0.0;
        auVar145._8_4_ = auVar26._8_4_ + auVar24._8_4_ * 0.0 + auVar171._8_4_ * 0.0;
        auVar145._12_4_ = auVar26._12_4_ + auVar24._12_4_ * 0.0 + auVar171._12_4_ * 0.0;
        auVar145._16_4_ = auVar26._16_4_ + auVar24._16_4_ * 0.0 + auVar171._16_4_ * 0.0;
        auVar145._20_4_ = auVar26._20_4_ + auVar24._20_4_ * 0.0 + auVar171._20_4_ * 0.0;
        auVar145._24_4_ = auVar26._24_4_ + auVar24._24_4_ * 0.0 + auVar171._24_4_ * 0.0;
        auVar145._28_4_ = fVar268 + auVar171._28_4_;
        fVar136 = auVar16._0_4_;
        fVar138 = auVar16._4_4_;
        auVar43._4_4_ = fVar138 * auVar27._4_4_;
        auVar43._0_4_ = fVar136 * auVar27._0_4_;
        fVar140 = auVar16._8_4_;
        auVar43._8_4_ = fVar140 * auVar27._8_4_;
        fVar141 = auVar16._12_4_;
        auVar43._12_4_ = fVar141 * auVar27._12_4_;
        fVar142 = auVar16._16_4_;
        auVar43._16_4_ = fVar142 * auVar27._16_4_;
        fVar151 = auVar16._20_4_;
        auVar43._20_4_ = fVar151 * auVar27._20_4_;
        fVar213 = auVar16._24_4_;
        auVar43._24_4_ = fVar213 * auVar27._24_4_;
        auVar43._28_4_ = fVar268;
        fVar268 = auVar23._0_4_;
        fVar284 = auVar23._4_4_;
        auVar44._4_4_ = auVar21._4_4_ * fVar284;
        auVar44._0_4_ = auVar21._0_4_ * fVar268;
        fVar241 = auVar23._8_4_;
        auVar44._8_4_ = auVar21._8_4_ * fVar241;
        fVar182 = auVar23._12_4_;
        auVar44._12_4_ = auVar21._12_4_ * fVar182;
        fVar254 = auVar23._16_4_;
        auVar44._16_4_ = auVar21._16_4_ * fVar254;
        fVar117 = auVar23._20_4_;
        auVar44._20_4_ = auVar21._20_4_ * fVar117;
        fVar139 = auVar23._24_4_;
        auVar44._24_4_ = auVar21._24_4_ * fVar139;
        auVar44._28_4_ = auVar26._28_4_;
        auVar16 = vsubps_avx(auVar44,auVar43);
        auVar24 = vsubps_avx(local_440,auVar20);
        fVar256 = auVar24._0_4_;
        fVar265 = auVar24._4_4_;
        auVar45._4_4_ = fVar265 * auVar27._4_4_;
        auVar45._0_4_ = fVar256 * auVar27._0_4_;
        fVar266 = auVar24._8_4_;
        auVar45._8_4_ = fVar266 * auVar27._8_4_;
        fVar267 = auVar24._12_4_;
        auVar45._12_4_ = fVar267 * auVar27._12_4_;
        fVar269 = auVar24._16_4_;
        auVar45._16_4_ = fVar269 * auVar27._16_4_;
        fVar271 = auVar24._20_4_;
        auVar45._20_4_ = fVar271 * auVar27._20_4_;
        fVar273 = auVar24._24_4_;
        auVar45._24_4_ = fVar273 * auVar27._24_4_;
        auVar45._28_4_ = auVar27._28_4_;
        auVar46._4_4_ = auVar20._4_4_ * fVar284;
        auVar46._0_4_ = auVar20._0_4_ * fVar268;
        auVar46._8_4_ = auVar20._8_4_ * fVar241;
        auVar46._12_4_ = auVar20._12_4_ * fVar182;
        auVar46._16_4_ = auVar20._16_4_ * fVar254;
        auVar46._20_4_ = auVar20._20_4_ * fVar117;
        auVar46._24_4_ = auVar20._24_4_ * fVar139;
        auVar46._28_4_ = auVar171._28_4_;
        auVar171 = vsubps_avx(auVar45,auVar46);
        auVar47._4_4_ = auVar21._4_4_ * fVar265;
        auVar47._0_4_ = auVar21._0_4_ * fVar256;
        auVar47._8_4_ = auVar21._8_4_ * fVar266;
        auVar47._12_4_ = auVar21._12_4_ * fVar267;
        auVar47._16_4_ = auVar21._16_4_ * fVar269;
        auVar47._20_4_ = auVar21._20_4_ * fVar271;
        auVar47._24_4_ = auVar21._24_4_ * fVar273;
        auVar47._28_4_ = auVar27._28_4_;
        auVar48._4_4_ = auVar20._4_4_ * fVar138;
        auVar48._0_4_ = auVar20._0_4_ * fVar136;
        auVar48._8_4_ = auVar20._8_4_ * fVar140;
        auVar48._12_4_ = auVar20._12_4_ * fVar141;
        auVar48._16_4_ = auVar20._16_4_ * fVar142;
        auVar48._20_4_ = auVar20._20_4_ * fVar151;
        auVar48._24_4_ = auVar20._24_4_ * fVar213;
        auVar48._28_4_ = auVar20._28_4_;
        auVar20 = vsubps_avx(auVar48,auVar47);
        auVar192._0_4_ = auVar16._0_4_ * 0.0 + auVar20._0_4_ + auVar171._0_4_ * 0.0;
        auVar192._4_4_ = auVar16._4_4_ * 0.0 + auVar20._4_4_ + auVar171._4_4_ * 0.0;
        auVar192._8_4_ = auVar16._8_4_ * 0.0 + auVar20._8_4_ + auVar171._8_4_ * 0.0;
        auVar192._12_4_ = auVar16._12_4_ * 0.0 + auVar20._12_4_ + auVar171._12_4_ * 0.0;
        auVar192._16_4_ = auVar16._16_4_ * 0.0 + auVar20._16_4_ + auVar171._16_4_ * 0.0;
        auVar192._20_4_ = auVar16._20_4_ * 0.0 + auVar20._20_4_ + auVar171._20_4_ * 0.0;
        auVar192._24_4_ = auVar16._24_4_ * 0.0 + auVar20._24_4_ + auVar171._24_4_ * 0.0;
        auVar192._28_4_ = auVar20._28_4_ + auVar20._28_4_ + auVar171._28_4_;
        auVar195 = ZEXT3264(auVar192);
        auVar16 = vmaxps_avx(auVar145,auVar192);
        auVar16 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,2);
        auVar201 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
        auVar201 = vpand_avx(auVar201,local_6e0);
        auVar158 = vpmovsxwd_avx(auVar201);
        auVar169 = vpunpckhwd_avx(auVar201,auVar201);
        auVar172._16_16_ = auVar169;
        auVar172._0_16_ = auVar158;
        if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar172 >> 0x7f,0) == '\0') &&
              (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar169 >> 0x3f,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar169[0xf]) {
LAB_00ed30a3:
          auVar204._8_8_ = uStack_518;
          auVar204._0_8_ = local_520;
          auVar204._16_8_ = uStack_510;
          auVar204._24_8_ = uStack_508;
          auVar264 = ZEXT3264(auVar258);
          auVar248 = ZEXT3264(auVar243);
          auVar175 = ZEXT3264(auVar172);
        }
        else {
          auVar49._4_4_ = fVar284 * fVar270;
          auVar49._0_4_ = fVar268 * fVar212;
          auVar49._8_4_ = fVar241 * fVar230;
          auVar49._12_4_ = fVar182 * fVar181;
          auVar49._16_4_ = fVar254 * fVar253;
          auVar49._20_4_ = fVar117 * fVar162;
          auVar49._24_4_ = fVar139 * fVar134;
          auVar49._28_4_ = auVar169._12_4_;
          auVar280._0_4_ = fVar136 * fVar221;
          auVar280._4_4_ = fVar138 * fVar223;
          auVar280._8_4_ = fVar140 * fVar225;
          auVar280._12_4_ = fVar141 * fVar227;
          auVar280._16_4_ = fVar142 * fVar229;
          auVar280._20_4_ = fVar151 * fVar231;
          auVar280._24_4_ = fVar213 * fVar234;
          auVar280._28_4_ = 0;
          auVar16 = vsubps_avx(auVar280,auVar49);
          auVar50._4_4_ = fVar265 * fVar223;
          auVar50._0_4_ = fVar256 * fVar221;
          auVar50._8_4_ = fVar266 * fVar225;
          auVar50._12_4_ = fVar267 * fVar227;
          auVar50._16_4_ = fVar269 * fVar229;
          auVar50._20_4_ = fVar271 * fVar231;
          auVar50._24_4_ = fVar273 * fVar234;
          auVar50._28_4_ = auVar25._28_4_;
          auVar51._4_4_ = fVar284 * fVar228;
          auVar51._0_4_ = fVar268 * fVar224;
          auVar51._8_4_ = fVar241 * fVar150;
          auVar51._12_4_ = fVar182 * fVar249;
          auVar51._16_4_ = fVar254 * fVar183;
          auVar51._20_4_ = fVar117 * fVar161;
          auVar51._24_4_ = fVar139 * fVar137;
          auVar51._28_4_ = auVar23._28_4_;
          auVar21 = vsubps_avx(auVar51,auVar50);
          auVar52._4_4_ = fVar138 * fVar228;
          auVar52._0_4_ = fVar136 * fVar224;
          auVar52._8_4_ = fVar140 * fVar150;
          auVar52._12_4_ = fVar141 * fVar249;
          auVar52._16_4_ = fVar142 * fVar183;
          auVar52._20_4_ = fVar151 * fVar161;
          auVar52._24_4_ = fVar213 * fVar137;
          auVar52._28_4_ = auVar145._28_4_;
          auVar53._4_4_ = fVar265 * fVar270;
          auVar53._0_4_ = fVar256 * fVar212;
          auVar53._8_4_ = fVar266 * fVar230;
          auVar53._12_4_ = fVar267 * fVar181;
          auVar53._16_4_ = fVar269 * fVar253;
          auVar53._20_4_ = fVar271 * fVar162;
          auVar53._24_4_ = fVar273 * fVar134;
          auVar53._28_4_ = auVar279._28_4_;
          auVar27 = vsubps_avx(auVar53,auVar52);
          auVar240._0_4_ = auVar16._0_4_ * 0.0 + auVar27._0_4_ + auVar21._0_4_ * 0.0;
          auVar240._4_4_ = auVar16._4_4_ * 0.0 + auVar27._4_4_ + auVar21._4_4_ * 0.0;
          auVar240._8_4_ = auVar16._8_4_ * 0.0 + auVar27._8_4_ + auVar21._8_4_ * 0.0;
          auVar240._12_4_ = auVar16._12_4_ * 0.0 + auVar27._12_4_ + auVar21._12_4_ * 0.0;
          auVar240._16_4_ = auVar16._16_4_ * 0.0 + auVar27._16_4_ + auVar21._16_4_ * 0.0;
          auVar240._20_4_ = auVar16._20_4_ * 0.0 + auVar27._20_4_ + auVar21._20_4_ * 0.0;
          auVar240._24_4_ = auVar16._24_4_ * 0.0 + auVar27._24_4_ + auVar21._24_4_ * 0.0;
          auVar240._28_4_ = auVar279._28_4_ + auVar27._28_4_ + auVar145._28_4_;
          auVar20 = vrcpps_avx(auVar240);
          fVar224 = auVar20._0_4_;
          fVar268 = auVar20._4_4_;
          auVar54._4_4_ = auVar240._4_4_ * fVar268;
          auVar54._0_4_ = auVar240._0_4_ * fVar224;
          fVar270 = auVar20._8_4_;
          auVar54._8_4_ = auVar240._8_4_ * fVar270;
          fVar228 = auVar20._12_4_;
          auVar54._12_4_ = auVar240._12_4_ * fVar228;
          fVar284 = auVar20._16_4_;
          auVar54._16_4_ = auVar240._16_4_ * fVar284;
          fVar230 = auVar20._20_4_;
          auVar54._20_4_ = auVar240._20_4_ * fVar230;
          fVar150 = auVar20._24_4_;
          auVar54._24_4_ = auVar240._24_4_ * fVar150;
          auVar54._28_4_ = auVar23._28_4_;
          auVar281._8_4_ = 0x3f800000;
          auVar281._0_8_ = 0x3f8000003f800000;
          auVar281._12_4_ = 0x3f800000;
          auVar281._16_4_ = 0x3f800000;
          auVar281._20_4_ = 0x3f800000;
          auVar281._24_4_ = 0x3f800000;
          auVar281._28_4_ = 0x3f800000;
          auVar171 = vsubps_avx(auVar281,auVar54);
          fVar224 = auVar171._0_4_ * fVar224 + fVar224;
          fVar268 = auVar171._4_4_ * fVar268 + fVar268;
          fVar270 = auVar171._8_4_ * fVar270 + fVar270;
          fVar228 = auVar171._12_4_ * fVar228 + fVar228;
          fVar284 = auVar171._16_4_ * fVar284 + fVar284;
          fVar230 = auVar171._20_4_ * fVar230 + fVar230;
          fVar150 = auVar171._24_4_ * fVar150 + fVar150;
          auVar55._4_4_ =
               (auVar16._4_4_ * fVar210 + auVar21._4_4_ * fVar226 + auVar27._4_4_ * fVar164) *
               fVar268;
          auVar55._0_4_ =
               (auVar16._0_4_ * fVar222 + auVar21._0_4_ * fVar220 + auVar27._0_4_ * fVar277) *
               fVar224;
          auVar55._8_4_ =
               (auVar16._8_4_ * fVar232 + auVar21._8_4_ * fVar211 + auVar27._8_4_ * fVar177) *
               fVar270;
          auVar55._12_4_ =
               (auVar16._12_4_ * fVar272 + auVar21._12_4_ * fVar251 + auVar27._12_4_ * fVar255) *
               fVar228;
          auVar55._16_4_ =
               (auVar16._16_4_ * fVar252 + auVar21._16_4_ * fVar250 + auVar27._16_4_ * fVar180) *
               fVar284;
          auVar55._20_4_ =
               (auVar16._20_4_ * fVar184 + auVar21._20_4_ * fVar185 + auVar27._20_4_ * fVar196) *
               fVar230;
          auVar55._24_4_ =
               (auVar16._24_4_ * fVar118 + auVar21._24_4_ * fVar135 + auVar27._24_4_ * fVar233) *
               fVar150;
          auVar55._28_4_ = local_440._28_4_ + auVar15._28_4_ + auVar22._28_4_;
          auVar158 = vpermilps_avx((undefined1  [16])aVar8,0xff);
          auVar173._16_16_ = auVar158;
          auVar173._0_16_ = auVar158;
          auVar16 = vcmpps_avx(auVar173,auVar55,2);
          fVar212 = ray->tfar;
          auVar202._4_4_ = fVar212;
          auVar202._0_4_ = fVar212;
          auVar202._8_4_ = fVar212;
          auVar202._12_4_ = fVar212;
          auVar202._16_4_ = fVar212;
          auVar202._20_4_ = fVar212;
          auVar202._24_4_ = fVar212;
          auVar202._28_4_ = fVar212;
          auVar22 = vcmpps_avx(auVar55,auVar202,2);
          auVar16 = vandps_avx(auVar22,auVar16);
          auVar158 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
          auVar201 = vpand_avx(auVar201,auVar158);
          auVar158 = vpmovsxwd_avx(auVar201);
          auVar169 = vpshufd_avx(auVar201,0xee);
          auVar169 = vpmovsxwd_avx(auVar169);
          auVar172._16_16_ = auVar169;
          auVar172._0_16_ = auVar158;
          if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar172 >> 0x7f,0) == '\0') &&
                (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar169 >> 0x3f,0) == '\0') &&
              (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar169[0xf]) goto LAB_00ed30a3;
          auVar16 = vcmpps_avx(ZEXT832(0) << 0x20,auVar240,4);
          auVar158 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
          auVar201 = vpand_avx(auVar201,auVar158);
          auVar158 = vpmovsxwd_avx(auVar201);
          auVar201 = vpunpckhwd_avx(auVar201,auVar201);
          auVar175 = ZEXT1664(auVar201);
          auVar218._16_16_ = auVar201;
          auVar218._0_16_ = auVar158;
          auVar204._8_8_ = uStack_518;
          auVar204._0_8_ = local_520;
          auVar204._16_8_ = uStack_510;
          auVar204._24_8_ = uStack_508;
          auVar248 = ZEXT3264(auVar243);
          auVar264 = ZEXT3264(auVar258);
          if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar218 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar218 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar218 >> 0x7f,0) != '\0') ||
                (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar201 >> 0x3f,0) != '\0') ||
              (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar201[0xf] < '\0') {
            auVar174._0_4_ = auVar145._0_4_ * fVar224;
            auVar174._4_4_ = auVar145._4_4_ * fVar268;
            auVar174._8_4_ = auVar145._8_4_ * fVar270;
            auVar174._12_4_ = auVar145._12_4_ * fVar228;
            auVar174._16_4_ = auVar145._16_4_ * fVar284;
            auVar174._20_4_ = auVar145._20_4_ * fVar230;
            auVar174._24_4_ = auVar145._24_4_ * fVar150;
            auVar174._28_4_ = 0;
            auVar258._4_4_ = auVar192._4_4_ * fVar268;
            auVar258._0_4_ = auVar192._0_4_ * fVar224;
            auVar258._8_4_ = auVar192._8_4_ * fVar270;
            auVar258._12_4_ = auVar192._12_4_ * fVar228;
            auVar258._16_4_ = auVar192._16_4_ * fVar284;
            auVar258._20_4_ = auVar192._20_4_ * fVar230;
            auVar258._24_4_ = auVar192._24_4_ * fVar150;
            auVar258._28_4_ = auVar171._28_4_ + auVar20._28_4_;
            auVar203._8_4_ = 0x3f800000;
            auVar203._0_8_ = 0x3f8000003f800000;
            auVar203._12_4_ = 0x3f800000;
            auVar203._16_4_ = 0x3f800000;
            auVar203._20_4_ = 0x3f800000;
            auVar203._24_4_ = 0x3f800000;
            auVar203._28_4_ = 0x3f800000;
            auVar243 = vsubps_avx(auVar203,auVar174);
            auVar195 = ZEXT3264(auVar243);
            auVar243 = vblendvps_avx(auVar243,auVar174,auVar239);
            auVar248 = ZEXT3264(auVar243);
            auVar243 = vsubps_avx(auVar203,auVar258);
            auVar175 = ZEXT3264(auVar243);
            _local_360 = vblendvps_avx(auVar243,auVar258,auVar239);
            auVar264 = ZEXT3264(auVar55);
            auVar204 = auVar218;
          }
        }
        if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar204 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar204 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar204 >> 0x7f,0) != '\0') ||
              (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar204 >> 0xbf,0) != '\0') ||
            (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar204[0x1f] < '\0') {
          auVar243 = vsubps_avx(auVar259,auVar126);
          fVar220 = auVar125._0_4_ + auVar248._0_4_ * auVar243._0_4_;
          fVar222 = auVar125._4_4_ + auVar248._4_4_ * auVar243._4_4_;
          fVar224 = auVar125._8_4_ + auVar248._8_4_ * auVar243._8_4_;
          fVar268 = auVar125._12_4_ + auVar248._12_4_ * auVar243._12_4_;
          fVar270 = auVar125._16_4_ + auVar248._16_4_ * auVar243._16_4_;
          fVar226 = auVar125._20_4_ + auVar248._20_4_ * auVar243._20_4_;
          fVar210 = auVar125._24_4_ + auVar248._24_4_ * auVar243._24_4_;
          fVar228 = auVar243._28_4_ + 0.0;
          fVar212 = local_6e8->depth_scale;
          auVar243._4_4_ = (fVar222 + fVar222) * fVar212;
          auVar243._0_4_ = (fVar220 + fVar220) * fVar212;
          auVar243._8_4_ = (fVar224 + fVar224) * fVar212;
          auVar243._12_4_ = (fVar268 + fVar268) * fVar212;
          auVar243._16_4_ = (fVar270 + fVar270) * fVar212;
          auVar243._20_4_ = (fVar226 + fVar226) * fVar212;
          auVar243._24_4_ = (fVar210 + fVar210) * fVar212;
          auVar243._28_4_ = fVar228 + fVar228;
          local_280 = auVar264._0_32_;
          auVar243 = vcmpps_avx(local_280,auVar243,6);
          auVar258 = auVar204 & auVar243;
          if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar258 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar258 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar258 >> 0x7f,0) != '\0') ||
                (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar258 >> 0xbf,0) != '\0') ||
              (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar258[0x1f] < '\0') {
            local_200 = vandps_avx(auVar243,auVar204);
            local_360._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_360._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            uStack_358._0_4_ = (float)uStack_358 + (float)uStack_358 + -1.0;
            uStack_358._4_4_ = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            uStack_350._0_4_ = (float)uStack_350 + (float)uStack_350 + -1.0;
            uStack_350._4_4_ = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            uStack_348._0_4_ = (float)uStack_348 + (float)uStack_348 + -1.0;
            uStack_348._4_4_ = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_2c0 = auVar248._0_32_;
            auVar108 = _local_360;
            auVar243 = _local_360;
            local_2a0 = (float)local_360._0_4_;
            fStack_29c = (float)local_360._4_4_;
            fStack_298 = (float)uStack_358;
            fStack_294 = uStack_358._4_4_;
            fStack_290 = (float)uStack_350;
            fStack_28c = uStack_350._4_4_;
            fStack_288 = (float)uStack_348;
            fStack_284 = uStack_348._4_4_;
            local_260 = 0;
            local_25c = uVar109;
            local_250 = local_790;
            uStack_248 = local_790._8_8_;
            local_240 = local_700;
            uStack_238 = local_700._8_8_;
            local_230 = local_5b0;
            uStack_228 = uStack_5a8;
            local_220 = local_6a0;
            uStack_218 = local_6a0._8_8_;
            if ((pGVar10->mask & ray->mask) != 0) {
              _local_360 = auVar243;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar115 = true, _local_5b0 = auVar119,
                 pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar156._0_4_ = 1.0 / auVar167._0_4_;
                auVar156._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar201 = vshufps_avx(auVar156,auVar156,0);
                local_1e0[0] = auVar201._0_4_ * (auVar248._0_4_ + 0.0);
                local_1e0[1] = auVar201._4_4_ * (auVar248._4_4_ + 1.0);
                local_1e0[2] = auVar201._8_4_ * (auVar248._8_4_ + 2.0);
                local_1e0[3] = auVar201._12_4_ * (auVar248._12_4_ + 3.0);
                fStack_1d0 = auVar201._0_4_ * (auVar248._16_4_ + 4.0);
                fStack_1cc = auVar201._4_4_ * (auVar248._20_4_ + 5.0);
                fStack_1c8 = auVar201._8_4_ * (auVar248._24_4_ + 6.0);
                fStack_1c4 = auVar248._28_4_ + 7.0;
                uStack_350 = auVar108._16_8_;
                uStack_348 = auVar243._24_8_;
                local_1c0 = local_360;
                uStack_1b8 = uStack_358;
                uStack_1b0 = uStack_350;
                uStack_1a8 = uStack_348;
                local_1a0 = local_280;
                iVar110 = vmovmskps_avx(local_200);
                local_780 = (undefined1  [8])CONCAT44((int)((ulong)context->args >> 0x20),iVar110);
                lVar113 = 0;
                if (local_780 != (undefined1  [8])0x0) {
                  for (; ((ulong)local_780 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
                  }
                }
                if (iVar110 == 0) {
                  bVar115 = false;
                  _local_5b0 = auVar119;
                }
                else {
                  _fStack_778 = auVar125._8_20_;
                  fStack_764 = 0.0;
                  stack0xfffffffffffff9a4 = auVar259._4_28_;
                  local_660._0_4_ = ray->tfar;
                  local_720 = auVar248._0_32_;
                  local_740 = local_280;
                  fVar212 = (float)local_790._0_4_;
                  fVar220 = (float)local_790._4_4_;
                  fVar222 = (float)uStack_788;
                  fVar224 = uStack_788._4_4_;
                  fVar268 = (float)local_700._0_4_;
                  fVar270 = (float)local_700._4_4_;
                  fVar226 = (float)uStack_6f8;
                  fVar210 = uStack_6f8._4_4_;
                  fVar228 = (float)local_6a0._0_4_;
                  fVar284 = (float)local_6a0._4_4_;
                  fVar230 = (float)uStack_698;
                  fVar211 = uStack_698._4_4_;
                  _local_790 = auVar121;
                  _local_700 = auVar120;
                  _local_6a0 = auVar144;
                  _local_5b0 = auVar119;
                  do {
                    local_634 = local_1e0[lVar113];
                    local_630 = *(undefined4 *)((long)&local_1c0 + lVar113 * 4);
                    local_6e0._0_8_ = lVar113;
                    ray->tfar = *(float *)(local_1a0 + lVar113 * 4);
                    local_690.context = context->user;
                    fVar163 = 1.0 - local_634;
                    fVar197 = local_634 * fVar163 * 4.0;
                    auVar201 = ZEXT416((uint)(local_634 * local_634 * 0.5));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar158 = ZEXT416((uint)((fVar163 * fVar163 + fVar197) * 0.5));
                    auVar158 = vshufps_avx(auVar158,auVar158,0);
                    auVar169 = ZEXT416((uint)((-local_634 * local_634 - fVar197) * 0.5));
                    auVar169 = vshufps_avx(auVar169,auVar169,0);
                    auVar189._0_4_ = fVar268 * auVar169._0_4_;
                    auVar189._4_4_ = fVar270 * auVar169._4_4_;
                    auVar189._8_4_ = fVar226 * auVar169._8_4_;
                    auVar189._12_4_ = fVar210 * auVar169._12_4_;
                    auVar195 = ZEXT1664(auVar189);
                    auVar169 = ZEXT416((uint)(fVar163 * -fVar163 * 0.5));
                    auVar169 = vshufps_avx(auVar169,auVar169,0);
                    auVar168._0_4_ = fVar212 * auVar169._0_4_;
                    auVar168._4_4_ = fVar220 * auVar169._4_4_;
                    auVar168._8_4_ = fVar222 * auVar169._8_4_;
                    auVar168._12_4_ = fVar224 * auVar169._12_4_;
                    auVar175 = ZEXT1664(auVar168);
                    auVar157._0_4_ =
                         auVar168._0_4_ +
                         auVar189._0_4_ +
                         fVar228 * auVar201._0_4_ + auVar158._0_4_ * (float)local_5b0._0_4_;
                    auVar157._4_4_ =
                         auVar168._4_4_ +
                         auVar189._4_4_ +
                         fVar284 * auVar201._4_4_ + auVar158._4_4_ * (float)local_5b0._4_4_;
                    auVar157._8_4_ =
                         auVar168._8_4_ +
                         auVar189._8_4_ +
                         fVar230 * auVar201._8_4_ + auVar158._8_4_ * (float)uStack_5a8;
                    auVar157._12_4_ =
                         auVar168._12_4_ +
                         auVar189._12_4_ +
                         fVar211 * auVar201._12_4_ + auVar158._12_4_ * uStack_5a8._4_4_;
                    local_640 = vmovlps_avx(auVar157);
                    local_638 = vextractps_avx(auVar157,2);
                    local_62c = (int)local_608;
                    local_628 = (int)local_6f0;
                    local_624 = (local_690.context)->instID[0];
                    local_620 = (local_690.context)->instPrimID[0];
                    local_79c = -1;
                    local_690.valid = &local_79c;
                    local_690.geometryUserPtr = pGVar10->userPtr;
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_640;
                    local_690.N = 1;
                    if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ed2194:
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar175 = ZEXT1664(auVar175._0_16_);
                        auVar195 = ZEXT1664(auVar195._0_16_);
                        (*p_Var11)(&local_690);
                        if (*local_690.valid == 0) goto LAB_00ed21d8;
                      }
                      bVar115 = true;
                      auVar248 = ZEXT3264(local_720);
                      auVar264 = ZEXT3264(local_740);
                      goto LAB_00ed1e27;
                    }
                    auVar175 = ZEXT1664(auVar168);
                    auVar195 = ZEXT1664(auVar189);
                    (*pGVar10->occlusionFilterN)(&local_690);
                    if (*local_690.valid != 0) goto LAB_00ed2194;
LAB_00ed21d8:
                    ray->tfar = (float)local_660._0_4_;
                    uVar114 = (ulong)local_780 ^ 1L << (local_6e0._0_8_ & 0x3f);
                    lVar113 = 0;
                    if (uVar114 != 0) {
                      for (; (uVar114 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
                      }
                    }
                    bVar115 = false;
                    local_780 = (undefined1  [8])uVar114;
                    auVar248 = ZEXT3264(local_720);
                    auVar264 = ZEXT3264(local_740);
                    fVar197 = (float)local_760._0_4_;
                    fVar207 = (float)local_760._4_4_;
                    fVar208 = fStack_758;
                    fVar209 = fStack_754;
                    fVar163 = fStack_750;
                    fVar176 = fStack_74c;
                    fVar178 = fStack_748;
                    fVar179 = fStack_744;
                    fVar212 = (float)local_790._0_4_;
                    fVar220 = (float)local_790._4_4_;
                    fVar222 = (float)uStack_788;
                    fVar224 = uStack_788._4_4_;
                    fVar268 = (float)local_700._0_4_;
                    fVar270 = (float)local_700._4_4_;
                    fVar226 = (float)uStack_6f8;
                    fVar210 = uStack_6f8._4_4_;
                    fVar228 = (float)local_6a0._0_4_;
                    fVar284 = (float)local_6a0._4_4_;
                    fVar230 = (float)uStack_698;
                    fVar211 = uStack_698._4_4_;
                    auVar121 = _local_790;
                    auVar120 = _local_700;
                    auVar144 = _local_6a0;
                  } while (uVar114 != 0);
                }
              }
              goto LAB_00ed1e36;
            }
          }
          goto LAB_00ed177e;
        }
        bVar115 = false;
        _local_790 = auVar121;
        _local_700 = auVar120;
        _local_6a0 = auVar144;
LAB_00ed1e27:
        fVar197 = (float)local_760._0_4_;
        fVar207 = (float)local_760._4_4_;
        fVar208 = fStack_758;
        fVar209 = fStack_754;
        fVar163 = fStack_750;
        fVar176 = fStack_74c;
        fVar178 = fStack_748;
        fVar179 = fStack_744;
        auVar121 = _local_790;
        auVar120 = _local_700;
        auVar144 = _local_6a0;
      }
LAB_00ed1e36:
      _local_6a0 = auVar144;
      _local_700 = auVar120;
      _local_790 = auVar121;
      if (8 < (int)uVar109) {
        auVar201 = vpshufd_avx(ZEXT416(uVar109),0);
        local_4a0 = auVar201._0_4_;
        fStack_49c = auVar201._4_4_;
        fStack_498 = auVar201._8_4_;
        fStack_494 = auVar201._12_4_;
        auVar201 = vshufps_avx(local_6c0._0_16_,local_6c0._0_16_,0);
        register0x00001210 = auVar201;
        _local_4c0 = auVar201;
        auVar99._4_4_ = fStack_59c;
        auVar99._0_4_ = local_5a0;
        auVar99._8_4_ = fStack_598;
        auVar99._12_4_ = aStack_594.a;
        auVar201 = vpermilps_avx(auVar99,0xff);
        local_c0._16_16_ = auVar201;
        local_c0._0_16_ = auVar201;
        auVar124._0_4_ = 1.0 / (float)local_420._0_4_;
        auVar124._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar201 = vshufps_avx(auVar124,auVar124,0);
        _fStack_410 = auVar201;
        _local_420 = auVar201;
        auVar133 = ZEXT3264(_local_420);
        lVar113 = 8;
        local_720 = auVar248._0_32_;
        local_740 = auVar264._0_32_;
        do {
          pfVar1 = (float *)(bspline_basis0 + lVar113 * 4 + lVar13);
          fVar226 = *pfVar1;
          fVar210 = pfVar1[1];
          fVar228 = pfVar1[2];
          fVar284 = pfVar1[3];
          fStack_590 = pfVar1[4];
          fStack_58c = pfVar1[5];
          fStack_588 = pfVar1[6];
          pauVar2 = (undefined1 (*) [28])(lVar13 + 0x21aefac + lVar113 * 4);
          fVar212 = *(float *)*pauVar2;
          fVar220 = *(float *)(*pauVar2 + 4);
          fVar222 = *(float *)(*pauVar2 + 8);
          fVar224 = *(float *)(*pauVar2 + 0xc);
          fVar268 = *(float *)(*pauVar2 + 0x10);
          fVar270 = *(float *)(*pauVar2 + 0x14);
          fVar230 = *(float *)(*pauVar2 + 0x18);
          auVar105 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar13 + 0x21af430 + lVar113 * 4);
          fVar211 = *(float *)*pauVar2;
          fVar232 = *(float *)(*pauVar2 + 4);
          fVar150 = *(float *)(*pauVar2 + 8);
          fVar241 = *(float *)(*pauVar2 + 0xc);
          fVar181 = *(float *)(*pauVar2 + 0x10);
          fVar251 = *(float *)(*pauVar2 + 0x14);
          fVar272 = *(float *)(*pauVar2 + 0x18);
          auVar104 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar13 + 0x21af8b4 + lVar113 * 4);
          fVar249 = *(float *)*pauVar2;
          fVar182 = *(float *)(*pauVar2 + 4);
          fVar253 = *(float *)(*pauVar2 + 8);
          fVar250 = *(float *)(*pauVar2 + 0xc);
          fVar252 = *(float *)(*pauVar2 + 0x10);
          fVar183 = *(float *)(*pauVar2 + 0x14);
          fVar254 = *(float *)(*pauVar2 + 0x18);
          auVar103 = *pauVar2;
          fVar185 = auVar175._28_4_;
          fVar162 = fVar185 + *(float *)pauVar2[1];
          fStack_764 = fVar185 + fVar185 + auVar133._28_4_;
          fVar196 = fVar185 + fVar162;
          auVar175 = ZEXT3264(local_3e0);
          fVar137 = local_3e0._0_4_;
          fVar139 = local_3e0._4_4_;
          fVar277 = local_3e0._8_4_;
          fVar164 = local_3e0._12_4_;
          fVar177 = local_3e0._16_4_;
          fVar255 = local_3e0._20_4_;
          fVar180 = local_3e0._24_4_;
          auVar245._0_4_ =
               fVar137 * fVar226 +
               (float)local_320._0_4_ * fVar212 +
               (float)local_3a0._0_4_ * fVar211 + (float)local_400._0_4_ * fVar249;
          auVar245._4_4_ =
               fVar139 * fVar210 +
               (float)local_320._4_4_ * fVar220 +
               (float)local_3a0._4_4_ * fVar232 + (float)local_400._4_4_ * fVar182;
          auVar245._8_4_ =
               fVar277 * fVar228 +
               fStack_318 * fVar222 + fStack_398 * fVar150 + fStack_3f8 * fVar253;
          auVar245._12_4_ =
               fVar164 * fVar284 +
               fStack_314 * fVar224 + fStack_394 * fVar241 + fStack_3f4 * fVar250;
          auVar245._16_4_ =
               fVar177 * fStack_590 +
               fStack_310 * fVar268 + fStack_390 * fVar181 + fStack_3f0 * fVar252;
          auVar245._20_4_ =
               fVar255 * fStack_58c +
               fStack_30c * fVar270 + fStack_38c * fVar251 + fStack_3ec * fVar183;
          auVar245._24_4_ =
               fVar180 * fStack_588 +
               fStack_308 * fVar230 + fStack_388 * fVar272 + fStack_3e8 * fVar254;
          auVar245._28_4_ = fVar162 + fStack_764;
          local_6c0._0_4_ =
               (float)local_e0._0_4_ * fVar226 +
               (float)local_340._0_4_ * fVar212 +
               (float)local_3c0._0_4_ * fVar211 + fVar197 * fVar249;
          local_6c0._4_4_ =
               (float)local_e0._4_4_ * fVar210 +
               (float)local_340._4_4_ * fVar220 +
               (float)local_3c0._4_4_ * fVar232 + fVar207 * fVar182;
          local_6c0._8_4_ =
               fStack_d8 * fVar228 + fStack_338 * fVar222 + fStack_3b8 * fVar150 + fVar208 * fVar253
          ;
          local_6c0._12_4_ =
               fStack_d4 * fVar284 + fStack_334 * fVar224 + fStack_3b4 * fVar241 + fVar209 * fVar250
          ;
          local_6c0._16_4_ =
               fStack_d0 * fStack_590 +
               fStack_330 * fVar268 + fStack_3b0 * fVar181 + fVar163 * fVar252;
          local_6c0._20_4_ =
               fStack_cc * fStack_58c +
               fStack_32c * fVar270 + fStack_3ac * fVar251 + fVar176 * fVar183;
          local_6c0._24_4_ =
               fStack_c8 * fStack_588 +
               fStack_328 * fVar230 + fStack_3a8 * fVar272 + fVar178 * fVar254;
          local_6c0._28_4_ = fStack_764 + fVar185 + fVar185 + auVar195._28_4_;
          fStack_584 = pfVar1[7];
          local_780._0_4_ =
               fVar226 * (float)local_140._0_4_ +
               (float)local_80._0_4_ * fVar212 +
               fVar211 * (float)local_100._0_4_ + fVar249 * (float)local_120._0_4_;
          local_780._4_4_ =
               fVar210 * (float)local_140._4_4_ +
               (float)local_80._4_4_ * fVar220 +
               fVar232 * (float)local_100._4_4_ + fVar182 * (float)local_120._4_4_;
          fStack_778 = fVar228 * fStack_138 +
                       fStack_78 * fVar222 + fVar150 * fStack_f8 + fVar253 * fStack_118;
          fStack_774 = fVar284 * fStack_134 +
                       fStack_74 * fVar224 + fVar241 * fStack_f4 + fVar250 * fStack_114;
          fStack_770 = fStack_590 * fStack_130 +
                       fStack_70 * fVar268 + fVar181 * fStack_f0 + fVar252 * fStack_110;
          fStack_76c = fStack_58c * fStack_12c +
                       fStack_6c * fVar270 + fVar251 * fStack_ec + fVar183 * fStack_10c;
          fStack_768 = fStack_588 * fStack_128 +
                       fStack_68 * fVar230 + fVar272 * fStack_e8 + fVar254 * fStack_108;
          fStack_764 = fStack_764 + fVar196;
          pfVar1 = (float *)(bspline_basis1 + lVar113 * 4 + lVar13);
          fVar230 = *pfVar1;
          fVar211 = pfVar1[1];
          fVar232 = pfVar1[2];
          fVar150 = pfVar1[3];
          fVar241 = pfVar1[4];
          fVar181 = pfVar1[5];
          fVar251 = pfVar1[6];
          pauVar2 = (undefined1 (*) [28])(lVar13 + 0x21b13cc + lVar113 * 4);
          fVar212 = *(float *)*pauVar2;
          fVar220 = *(float *)(*pauVar2 + 4);
          fVar222 = *(float *)(*pauVar2 + 8);
          fVar224 = *(float *)(*pauVar2 + 0xc);
          fVar268 = *(float *)(*pauVar2 + 0x10);
          fVar270 = *(float *)(*pauVar2 + 0x14);
          fVar272 = *(float *)(*pauVar2 + 0x18);
          auVar107 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar13 + 0x21b1850 + lVar113 * 4);
          fVar249 = *(float *)*pauVar2;
          fVar182 = *(float *)(*pauVar2 + 4);
          fVar253 = *(float *)(*pauVar2 + 8);
          fVar250 = *(float *)(*pauVar2 + 0xc);
          fVar252 = *(float *)(*pauVar2 + 0x10);
          fVar183 = *(float *)(*pauVar2 + 0x14);
          fVar254 = *(float *)(*pauVar2 + 0x18);
          auVar125 = *pauVar2;
          pauVar3 = (undefined1 (*) [32])(lVar13 + 0x21b1cd4 + lVar113 * 4);
          fVar162 = *(float *)*pauVar3;
          fVar185 = *(float *)(*pauVar3 + 4);
          fVar184 = *(float *)(*pauVar3 + 8);
          fVar161 = *(float *)(*pauVar3 + 0xc);
          fVar117 = *(float *)(*pauVar3 + 0x10);
          fVar134 = *(float *)(*pauVar3 + 0x14);
          fVar135 = *(float *)(*pauVar3 + 0x18);
          auVar106 = *(undefined1 (*) [28])*pauVar3;
          fVar118 = *(float *)(*pauVar3 + 0x1c);
          _local_480 = *pauVar3;
          auVar20 = _local_480;
          fVar233 = fVar118 + fStack_3e4;
          fVar196 = fVar118 + fVar118 + fVar196;
          local_440._0_4_ =
               fVar230 * fVar137 +
               (float)local_320._0_4_ * fVar212 +
               (float)local_3a0._0_4_ * fVar249 + (float)local_400._0_4_ * fVar162;
          local_440._4_4_ =
               fVar211 * fVar139 +
               (float)local_320._4_4_ * fVar220 +
               (float)local_3a0._4_4_ * fVar182 + (float)local_400._4_4_ * fVar185;
          local_440._8_4_ =
               fVar232 * fVar277 +
               fStack_318 * fVar222 + fStack_398 * fVar253 + fStack_3f8 * fVar184;
          local_440._12_4_ =
               fVar150 * fVar164 +
               fStack_314 * fVar224 + fStack_394 * fVar250 + fStack_3f4 * fVar161;
          local_440._16_4_ =
               fVar241 * fVar177 +
               fStack_310 * fVar268 + fStack_390 * fVar252 + fStack_3f0 * fVar117;
          local_440._20_4_ =
               fVar181 * fVar255 +
               fStack_30c * fVar270 + fStack_38c * fVar183 + fStack_3ec * fVar134;
          local_440._24_4_ =
               fVar251 * fVar180 +
               fStack_308 * fVar272 + fStack_388 * fVar254 + fStack_3e8 * fVar135;
          local_440._28_4_ = fVar233 + fVar196;
          auVar205._0_4_ =
               (float)local_e0._0_4_ * fVar230 +
               (float)local_340._0_4_ * fVar212 +
               (float)local_3c0._0_4_ * fVar249 + fVar197 * fVar162;
          auVar205._4_4_ =
               (float)local_e0._4_4_ * fVar211 +
               (float)local_340._4_4_ * fVar220 +
               (float)local_3c0._4_4_ * fVar182 + fVar207 * fVar185;
          auVar205._8_4_ =
               fStack_d8 * fVar232 + fStack_338 * fVar222 + fStack_3b8 * fVar253 + fVar208 * fVar184
          ;
          auVar205._12_4_ =
               fStack_d4 * fVar150 + fStack_334 * fVar224 + fStack_3b4 * fVar250 + fVar209 * fVar161
          ;
          auVar205._16_4_ =
               fStack_d0 * fVar241 + fStack_330 * fVar268 + fStack_3b0 * fVar252 + fVar163 * fVar117
          ;
          auVar205._20_4_ =
               fStack_cc * fVar181 + fStack_32c * fVar270 + fStack_3ac * fVar183 + fVar176 * fVar134
          ;
          auVar205._24_4_ =
               fStack_c8 * fVar251 + fStack_328 * fVar272 + fStack_3a8 * fVar254 + fVar178 * fVar135
          ;
          auVar205._28_4_ = fVar196 + fVar118 + fVar118 + fVar179;
          local_500._0_4_ =
               (float)local_80._0_4_ * fVar212 +
               fVar249 * (float)local_100._0_4_ + fVar162 * (float)local_120._0_4_ +
               fVar230 * (float)local_140._0_4_;
          local_500._4_4_ =
               (float)local_80._4_4_ * fVar220 +
               fVar182 * (float)local_100._4_4_ + fVar185 * (float)local_120._4_4_ +
               fVar211 * (float)local_140._4_4_;
          fStack_4f8 = fStack_78 * fVar222 + fVar253 * fStack_f8 + fVar184 * fStack_118 +
                       fVar232 * fStack_138;
          fStack_4f4 = fStack_74 * fVar224 + fVar250 * fStack_f4 + fVar161 * fStack_114 +
                       fVar150 * fStack_134;
          fStack_4f0 = fStack_70 * fVar268 + fVar252 * fStack_f0 + fVar117 * fStack_110 +
                       fVar241 * fStack_130;
          fStack_4ec = fStack_6c * fVar270 + fVar183 * fStack_ec + fVar134 * fStack_10c +
                       fVar181 * fStack_12c;
          fStack_4e8 = fStack_68 * fVar272 + fVar254 * fStack_e8 + fVar135 * fStack_108 +
                       fVar251 * fStack_128;
          fStack_4e4 = fVar118 + fVar233 + fVar196;
          auVar258 = vsubps_avx(local_440,auVar245);
          auVar16 = vsubps_avx(auVar205,local_6c0);
          fVar197 = auVar258._0_4_;
          fVar207 = auVar258._4_4_;
          auVar56._4_4_ = local_6c0._4_4_ * fVar207;
          auVar56._0_4_ = local_6c0._0_4_ * fVar197;
          fVar208 = auVar258._8_4_;
          auVar56._8_4_ = local_6c0._8_4_ * fVar208;
          fVar209 = auVar258._12_4_;
          auVar56._12_4_ = local_6c0._12_4_ * fVar209;
          fVar212 = auVar258._16_4_;
          auVar56._16_4_ = local_6c0._16_4_ * fVar212;
          fVar222 = auVar258._20_4_;
          auVar56._20_4_ = local_6c0._20_4_ * fVar222;
          fVar268 = auVar258._24_4_;
          auVar56._24_4_ = local_6c0._24_4_ * fVar268;
          auVar56._28_4_ = fVar196;
          fVar163 = auVar16._0_4_;
          fVar176 = auVar16._4_4_;
          auVar57._4_4_ = auVar245._4_4_ * fVar176;
          auVar57._0_4_ = auVar245._0_4_ * fVar163;
          fVar178 = auVar16._8_4_;
          auVar57._8_4_ = auVar245._8_4_ * fVar178;
          fVar179 = auVar16._12_4_;
          auVar57._12_4_ = auVar245._12_4_ * fVar179;
          fVar220 = auVar16._16_4_;
          auVar57._16_4_ = auVar245._16_4_ * fVar220;
          fVar224 = auVar16._20_4_;
          auVar57._20_4_ = auVar245._20_4_ * fVar224;
          fVar270 = auVar16._24_4_;
          auVar57._24_4_ = auVar245._24_4_ * fVar270;
          auVar57._28_4_ = auVar205._28_4_;
          auVar22 = vsubps_avx(auVar56,auVar57);
          auVar133 = ZEXT3264(_local_780);
          auVar243 = vmaxps_avx(_local_780,_local_500);
          auVar58._4_4_ = auVar243._4_4_ * auVar243._4_4_ * (fVar207 * fVar207 + fVar176 * fVar176);
          auVar58._0_4_ = auVar243._0_4_ * auVar243._0_4_ * (fVar197 * fVar197 + fVar163 * fVar163);
          auVar58._8_4_ = auVar243._8_4_ * auVar243._8_4_ * (fVar208 * fVar208 + fVar178 * fVar178);
          auVar58._12_4_ =
               auVar243._12_4_ * auVar243._12_4_ * (fVar209 * fVar209 + fVar179 * fVar179);
          auVar58._16_4_ =
               auVar243._16_4_ * auVar243._16_4_ * (fVar212 * fVar212 + fVar220 * fVar220);
          auVar58._20_4_ =
               auVar243._20_4_ * auVar243._20_4_ * (fVar222 * fVar222 + fVar224 * fVar224);
          auVar58._24_4_ =
               auVar243._24_4_ * auVar243._24_4_ * (fVar268 * fVar268 + fVar270 * fVar270);
          auVar58._28_4_ = fVar233 + auVar205._28_4_;
          auVar59._4_4_ = auVar22._4_4_ * auVar22._4_4_;
          auVar59._0_4_ = auVar22._0_4_ * auVar22._0_4_;
          auVar59._8_4_ = auVar22._8_4_ * auVar22._8_4_;
          auVar59._12_4_ = auVar22._12_4_ * auVar22._12_4_;
          auVar59._16_4_ = auVar22._16_4_ * auVar22._16_4_;
          auVar59._20_4_ = auVar22._20_4_ * auVar22._20_4_;
          auVar59._24_4_ = auVar22._24_4_ * auVar22._24_4_;
          auVar59._28_4_ = auVar22._28_4_;
          auVar195 = ZEXT3264(auVar59);
          auVar243 = vcmpps_avx(auVar59,auVar58,2);
          local_260 = (uint)lVar113;
          auVar158 = vpshufd_avx(ZEXT416(local_260),0);
          auVar201 = vpor_avx(auVar158,_DAT_01f7fcf0);
          auVar158 = vpor_avx(auVar158,_DAT_01fafea0);
          auVar101._4_4_ = fStack_49c;
          auVar101._0_4_ = local_4a0;
          auVar101._8_4_ = fStack_498;
          auVar101._12_4_ = fStack_494;
          auVar201 = vpcmpgtd_avx(auVar101,auVar201);
          auVar158 = vpcmpgtd_avx(auVar101,auVar158);
          auVar146._16_16_ = auVar158;
          auVar146._0_16_ = auVar201;
          auVar22 = auVar146 & auVar243;
          fVar197 = (float)local_760._0_4_;
          fVar207 = (float)local_760._4_4_;
          fVar208 = fStack_758;
          fVar209 = fStack_754;
          fVar163 = fStack_750;
          fVar176 = fStack_74c;
          fVar178 = fStack_748;
          fVar179 = fStack_744;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
LAB_00ed2b9a:
            auVar264 = ZEXT3264(local_740);
            auVar248 = ZEXT3264(local_720);
          }
          else {
            local_580._0_4_ = auVar107._0_4_;
            local_580._4_4_ = auVar107._4_4_;
            fStack_578 = auVar107._8_4_;
            fStack_574 = auVar107._12_4_;
            fStack_570 = auVar107._16_4_;
            fStack_56c = auVar107._20_4_;
            fStack_568 = auVar107._24_4_;
            fVar212 = (float)local_300._0_4_ * (float)local_580._0_4_;
            fVar220 = (float)local_300._4_4_ * (float)local_580._4_4_;
            fVar222 = fStack_2f8 * fStack_578;
            fVar224 = fStack_2f4 * fStack_574;
            fVar268 = fStack_2f0 * fStack_570;
            fVar270 = fStack_2ec * fStack_56c;
            fVar272 = fStack_2e8 * fStack_568;
            local_5e0._0_4_ = auVar125._0_4_;
            local_5e0._4_4_ = auVar125._4_4_;
            fStack_5d8 = auVar125._8_4_;
            fStack_5d4 = auVar125._12_4_;
            fStack_5d0 = auVar125._16_4_;
            fStack_5cc = auVar125._20_4_;
            fStack_5c8 = auVar125._24_4_;
            _local_580 = auVar146;
            local_480._0_4_ = auVar106._0_4_;
            local_480._4_4_ = auVar106._4_4_;
            fStack_478 = auVar106._8_4_;
            fStack_474 = auVar106._12_4_;
            fStack_470 = auVar106._16_4_;
            fStack_46c = auVar106._20_4_;
            fStack_468 = auVar106._24_4_;
            local_5e0._0_4_ =
                 fVar230 * (float)local_4e0._0_4_ +
                 fVar212 + (float)local_a0._0_4_ * (float)local_5e0._0_4_ +
                           (float)local_600._0_4_ * (float)local_480._0_4_;
            local_5e0._4_4_ =
                 fVar211 * (float)local_4e0._4_4_ +
                 fVar220 + (float)local_a0._4_4_ * (float)local_5e0._4_4_ +
                           (float)local_600._4_4_ * (float)local_480._4_4_;
            fStack_5d8 = fVar232 * fStack_4d8 +
                         fVar222 + fStack_98 * fStack_5d8 + fStack_5f8 * fStack_478;
            fStack_5d4 = fVar150 * fStack_4d4 +
                         fVar224 + fStack_94 * fStack_5d4 + fStack_5f4 * fStack_474;
            fStack_5d0 = fVar241 * fStack_4d0 +
                         fVar268 + fStack_90 * fStack_5d0 + fStack_5f0 * fStack_470;
            fStack_5cc = fVar181 * fStack_4cc +
                         fVar270 + fStack_8c * fStack_5cc + fStack_5ec * fStack_46c;
            fStack_5c8 = fVar251 * fStack_4c8 +
                         fVar272 + fStack_88 * fStack_5c8 + fStack_5e8 * fStack_468;
            fStack_5c4 = fStack_4e4 + fStack_764 + auVar158._12_4_ + 0.0;
            local_540._0_4_ = auVar105._0_4_;
            local_540._4_4_ = auVar105._4_4_;
            fStack_538 = auVar105._8_4_;
            fStack_534 = auVar105._12_4_;
            fStack_530 = auVar105._16_4_;
            fStack_52c = auVar105._20_4_;
            fStack_528 = auVar105._24_4_;
            fVar118 = (float)local_300._0_4_ * (float)local_540._0_4_;
            fVar196 = (float)local_300._4_4_ * (float)local_540._4_4_;
            fVar233 = fStack_2f8 * fStack_538;
            fVar136 = fStack_2f4 * fStack_534;
            fVar138 = fStack_2f0 * fStack_530;
            fVar140 = fStack_2ec * fStack_52c;
            fVar141 = fStack_2e8 * fStack_528;
            local_560._0_4_ = auVar104._0_4_;
            local_560._4_4_ = auVar104._4_4_;
            fStack_558 = auVar104._8_4_;
            fStack_554 = auVar104._12_4_;
            fStack_550 = auVar104._16_4_;
            fStack_54c = auVar104._20_4_;
            fStack_548 = auVar104._24_4_;
            local_460._0_4_ = auVar103._0_4_;
            local_460._4_4_ = auVar103._4_4_;
            fStack_458 = auVar103._8_4_;
            fStack_454 = auVar103._12_4_;
            fStack_450 = auVar103._16_4_;
            fStack_44c = auVar103._20_4_;
            fStack_448 = auVar103._24_4_;
            fVar213 = (float)local_600._0_4_ * (float)local_460._0_4_;
            fVar221 = (float)local_600._4_4_ * (float)local_460._4_4_;
            fVar223 = fStack_5f8 * fStack_458;
            fVar225 = fStack_5f4 * fStack_454;
            fVar227 = fStack_5f0 * fStack_450;
            fVar229 = fStack_5ec * fStack_44c;
            fVar231 = fStack_5e8 * fStack_448;
            pfVar4 = (float *)(lVar13 + 0x21b0640 + lVar113 * 4);
            fVar212 = *pfVar4;
            fVar220 = pfVar4[1];
            fVar222 = pfVar4[2];
            fVar224 = pfVar4[3];
            fVar268 = pfVar4[4];
            fVar270 = pfVar4[5];
            fVar230 = pfVar4[6];
            pfVar5 = (float *)(lVar13 + 0x21b0ac4 + lVar113 * 4);
            fVar211 = *pfVar5;
            fVar232 = pfVar5[1];
            fVar150 = pfVar5[2];
            fVar241 = pfVar5[3];
            fVar181 = pfVar5[4];
            fVar251 = pfVar5[5];
            fVar272 = pfVar5[6];
            pfVar6 = (float *)(lVar13 + 0x21b01bc + lVar113 * 4);
            fVar249 = *pfVar6;
            fVar182 = pfVar6[1];
            fVar253 = pfVar6[2];
            fVar250 = pfVar6[3];
            fVar252 = pfVar6[4];
            fVar183 = pfVar6[5];
            fVar254 = pfVar6[6];
            fVar142 = pfVar4[7] + pfVar5[7];
            fVar151 = pfVar5[7] + fStack_c4 + 0.0;
            fVar234 = fStack_c4 + pfVar1[7] + fStack_c4 + 0.0;
            pfVar1 = (float *)(lVar13 + 0x21afd38 + lVar113 * 4);
            fVar162 = *pfVar1;
            fVar185 = pfVar1[1];
            fVar184 = pfVar1[2];
            fVar161 = pfVar1[3];
            fVar117 = pfVar1[4];
            fVar134 = pfVar1[5];
            fVar135 = pfVar1[6];
            fStack_444 = fVar142 + fVar151;
            local_460._4_4_ =
                 fVar185 * fVar139 +
                 fVar182 * (float)local_320._4_4_ +
                 (float)local_3a0._4_4_ * fVar220 + (float)local_400._4_4_ * fVar232;
            local_460._0_4_ =
                 fVar162 * fVar137 +
                 fVar249 * (float)local_320._0_4_ +
                 (float)local_3a0._0_4_ * fVar212 + (float)local_400._0_4_ * fVar211;
            fStack_458 = fVar184 * fVar277 +
                         fVar253 * fStack_318 + fStack_398 * fVar222 + fStack_3f8 * fVar150;
            fStack_454 = fVar161 * fVar164 +
                         fVar250 * fStack_314 + fStack_394 * fVar224 + fStack_3f4 * fVar241;
            fStack_450 = fVar117 * fVar177 +
                         fVar252 * fStack_310 + fStack_390 * fVar268 + fStack_3f0 * fVar181;
            fStack_44c = fVar134 * fVar255 +
                         fVar183 * fStack_30c + fStack_38c * fVar270 + fStack_3ec * fVar251;
            fStack_448 = fVar135 * fVar180 +
                         fVar254 * fStack_308 + fStack_388 * fVar230 + fStack_3e8 * fVar272;
            auVar246._0_4_ =
                 fVar162 * (float)local_e0._0_4_ +
                 (float)local_3c0._0_4_ * fVar212 + (float)local_760._0_4_ * fVar211 +
                 fVar249 * (float)local_340._0_4_;
            auVar246._4_4_ =
                 fVar185 * (float)local_e0._4_4_ +
                 (float)local_3c0._4_4_ * fVar220 + (float)local_760._4_4_ * fVar232 +
                 fVar182 * (float)local_340._4_4_;
            auVar246._8_4_ =
                 fVar184 * fStack_d8 +
                 fStack_3b8 * fVar222 + fStack_758 * fVar150 + fVar253 * fStack_338;
            auVar246._12_4_ =
                 fVar161 * fStack_d4 +
                 fStack_3b4 * fVar224 + fStack_754 * fVar241 + fVar250 * fStack_334;
            auVar246._16_4_ =
                 fVar117 * fStack_d0 +
                 fStack_3b0 * fVar268 + fStack_750 * fVar181 + fVar252 * fStack_330;
            auVar246._20_4_ =
                 fVar134 * fStack_cc +
                 fStack_3ac * fVar270 + fStack_74c * fVar251 + fVar183 * fStack_32c;
            auVar246._24_4_ =
                 fVar135 * fStack_c8 +
                 fStack_3a8 * fVar230 + fStack_748 * fVar272 + fVar254 * fStack_328;
            auVar246._28_4_ = fVar151 + fVar234;
            auVar286._0_4_ =
                 fVar249 * (float)local_300._0_4_ +
                 (float)local_a0._0_4_ * fVar212 + (float)local_600._0_4_ * fVar211 +
                 fVar162 * (float)local_4e0._0_4_;
            auVar286._4_4_ =
                 fVar182 * (float)local_300._4_4_ +
                 (float)local_a0._4_4_ * fVar220 + (float)local_600._4_4_ * fVar232 +
                 fVar185 * (float)local_4e0._4_4_;
            auVar286._8_4_ =
                 fVar253 * fStack_2f8 + fStack_98 * fVar222 + fStack_5f8 * fVar150 +
                 fVar184 * fStack_4d8;
            auVar286._12_4_ =
                 fVar250 * fStack_2f4 + fStack_94 * fVar224 + fStack_5f4 * fVar241 +
                 fVar161 * fStack_4d4;
            auVar286._16_4_ =
                 fVar252 * fStack_2f0 + fStack_90 * fVar268 + fStack_5f0 * fVar181 +
                 fVar117 * fStack_4d0;
            auVar286._20_4_ =
                 fVar183 * fStack_2ec + fStack_8c * fVar270 + fStack_5ec * fVar251 +
                 fVar134 * fStack_4cc;
            auVar286._24_4_ =
                 fVar254 * fStack_2e8 + fStack_88 * fVar230 + fStack_5e8 * fVar272 +
                 fVar135 * fStack_4c8;
            auVar286._28_4_ = pfVar6[7] + fVar142 + fVar234;
            pfVar1 = (float *)(lVar13 + 0x21b2a60 + lVar113 * 4);
            fVar212 = *pfVar1;
            fVar220 = pfVar1[1];
            fVar222 = pfVar1[2];
            fVar224 = pfVar1[3];
            fVar268 = pfVar1[4];
            fVar270 = pfVar1[5];
            fVar230 = pfVar1[6];
            pfVar4 = (float *)(lVar13 + 0x21b2ee4 + lVar113 * 4);
            fVar211 = *pfVar4;
            fVar232 = pfVar4[1];
            fVar150 = pfVar4[2];
            fVar241 = pfVar4[3];
            fVar181 = pfVar4[4];
            fVar251 = pfVar4[5];
            fVar272 = pfVar4[6];
            _local_540 = auVar243;
            pfVar5 = (float *)(lVar13 + 0x21b25dc + lVar113 * 4);
            fVar249 = *pfVar5;
            fVar182 = pfVar5[1];
            fVar253 = pfVar5[2];
            fVar250 = pfVar5[3];
            fVar252 = pfVar5[4];
            fVar183 = pfVar5[5];
            fVar254 = pfVar5[6];
            pfVar6 = (float *)(lVar13 + 0x21b2158 + lVar113 * 4);
            fVar162 = *pfVar6;
            fVar185 = pfVar6[1];
            fVar184 = pfVar6[2];
            fVar161 = pfVar6[3];
            fVar117 = pfVar6[4];
            fVar134 = pfVar6[5];
            fVar135 = pfVar6[6];
            auVar262._0_4_ =
                 fVar162 * fVar137 +
                 fVar249 * (float)local_320._0_4_ +
                 (float)local_3a0._0_4_ * fVar212 + (float)local_400._0_4_ * fVar211;
            auVar262._4_4_ =
                 fVar185 * fVar139 +
                 fVar182 * (float)local_320._4_4_ +
                 (float)local_3a0._4_4_ * fVar220 + (float)local_400._4_4_ * fVar232;
            auVar262._8_4_ =
                 fVar184 * fVar277 +
                 fVar253 * fStack_318 + fStack_398 * fVar222 + fStack_3f8 * fVar150;
            auVar262._12_4_ =
                 fVar161 * fVar164 +
                 fVar250 * fStack_314 + fStack_394 * fVar224 + fStack_3f4 * fVar241;
            auVar262._16_4_ =
                 fVar117 * fVar177 +
                 fVar252 * fStack_310 + fStack_390 * fVar268 + fStack_3f0 * fVar181;
            auVar262._20_4_ =
                 fVar134 * fVar255 +
                 fVar183 * fStack_30c + fStack_38c * fVar270 + fStack_3ec * fVar251;
            auVar262._24_4_ =
                 fVar135 * fVar180 +
                 fVar254 * fStack_308 + fStack_388 * fVar230 + fStack_3e8 * fVar272;
            auVar262._28_4_ = fStack_744 + fStack_744 + fStack_3e4 + fStack_444;
            auVar282._0_4_ =
                 fVar162 * (float)local_e0._0_4_ +
                 fVar249 * (float)local_340._0_4_ +
                 (float)local_3c0._0_4_ * fVar212 + (float)local_760._0_4_ * fVar211;
            auVar282._4_4_ =
                 fVar185 * (float)local_e0._4_4_ +
                 fVar182 * (float)local_340._4_4_ +
                 (float)local_3c0._4_4_ * fVar220 + (float)local_760._4_4_ * fVar232;
            auVar282._8_4_ =
                 fVar184 * fStack_d8 +
                 fVar253 * fStack_338 + fStack_3b8 * fVar222 + fStack_758 * fVar150;
            auVar282._12_4_ =
                 fVar161 * fStack_d4 +
                 fVar250 * fStack_334 + fStack_3b4 * fVar224 + fStack_754 * fVar241;
            auVar282._16_4_ =
                 fVar117 * fStack_d0 +
                 fVar252 * fStack_330 + fStack_3b0 * fVar268 + fStack_750 * fVar181;
            auVar282._20_4_ =
                 fVar134 * fStack_cc +
                 fVar183 * fStack_32c + fStack_3ac * fVar270 + fStack_74c * fVar251;
            auVar282._24_4_ =
                 fVar135 * fStack_c8 +
                 fVar254 * fStack_328 + fStack_3a8 * fVar230 + fStack_748 * fVar272;
            auVar282._28_4_ = fStack_744 + fStack_744 + fStack_384 + fStack_744;
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar206._16_4_ = 0x7fffffff;
            auVar206._20_4_ = 0x7fffffff;
            auVar206._24_4_ = 0x7fffffff;
            auVar206._28_4_ = 0x7fffffff;
            auVar22 = vandps_avx(_local_460,auVar206);
            auVar21 = vandps_avx(auVar246,auVar206);
            auVar21 = vmaxps_avx(auVar22,auVar21);
            auVar22 = vandps_avx(auVar286,auVar206);
            auVar21 = vmaxps_avx(auVar21,auVar22);
            auVar21 = vcmpps_avx(auVar21,_local_4c0,1);
            auVar27 = vblendvps_avx(_local_460,auVar258,auVar21);
            auVar130._0_4_ =
                 fVar162 * (float)local_4e0._0_4_ +
                 fVar249 * (float)local_300._0_4_ +
                 fVar211 * (float)local_600._0_4_ + (float)local_a0._0_4_ * fVar212;
            auVar130._4_4_ =
                 fVar185 * (float)local_4e0._4_4_ +
                 fVar182 * (float)local_300._4_4_ +
                 fVar232 * (float)local_600._4_4_ + (float)local_a0._4_4_ * fVar220;
            auVar130._8_4_ =
                 fVar184 * fStack_4d8 +
                 fVar253 * fStack_2f8 + fVar150 * fStack_5f8 + fStack_98 * fVar222;
            auVar130._12_4_ =
                 fVar161 * fStack_4d4 +
                 fVar250 * fStack_2f4 + fVar241 * fStack_5f4 + fStack_94 * fVar224;
            auVar130._16_4_ =
                 fVar117 * fStack_4d0 +
                 fVar252 * fStack_2f0 + fVar181 * fStack_5f0 + fStack_90 * fVar268;
            auVar130._20_4_ =
                 fVar134 * fStack_4cc +
                 fVar183 * fStack_2ec + fVar251 * fStack_5ec + fStack_8c * fVar270;
            auVar130._24_4_ =
                 fVar135 * fStack_4c8 +
                 fVar254 * fStack_2e8 + fVar272 * fStack_5e8 + fStack_88 * fVar230;
            auVar130._28_4_ = auVar22._28_4_ + pfVar5[7] + pfVar4[7] + pfVar1[7];
            auVar15 = vblendvps_avx(auVar246,auVar16,auVar21);
            auVar22 = vandps_avx(auVar262,auVar206);
            auVar21 = vandps_avx(auVar282,auVar206);
            auVar21 = vmaxps_avx(auVar22,auVar21);
            auVar22 = vandps_avx(auVar130,auVar206);
            auVar22 = vmaxps_avx(auVar21,auVar22);
            auVar22 = vcmpps_avx(auVar22,_local_4c0,1);
            auVar258 = vblendvps_avx(auVar262,auVar258,auVar22);
            auVar131._0_4_ =
                 (float)local_4e0._0_4_ * fVar226 +
                 fVar118 + (float)local_a0._0_4_ * (float)local_560._0_4_ + fVar213;
            auVar131._4_4_ =
                 (float)local_4e0._4_4_ * fVar210 +
                 fVar196 + (float)local_a0._4_4_ * (float)local_560._4_4_ + fVar221;
            auVar131._8_4_ = fStack_4d8 * fVar228 + fVar233 + fStack_98 * fStack_558 + fVar223;
            auVar131._12_4_ = fStack_4d4 * fVar284 + fVar136 + fStack_94 * fStack_554 + fVar225;
            auVar131._16_4_ = fStack_4d0 * fStack_590 + fVar138 + fStack_90 * fStack_550 + fVar227;
            auVar131._20_4_ = fStack_4cc * fStack_58c + fVar140 + fStack_8c * fStack_54c + fVar229;
            auVar131._24_4_ = fStack_4c8 * fStack_588 + fVar141 + fStack_88 * fStack_548 + fVar231;
            auVar131._28_4_ = auVar21._28_4_ + fStack_5c4 + auVar158._12_4_ + 0.0;
            auVar22 = vblendvps_avx(auVar282,auVar16,auVar22);
            fVar164 = auVar27._0_4_;
            fVar177 = auVar27._4_4_;
            fVar255 = auVar27._8_4_;
            fVar180 = auVar27._12_4_;
            fVar196 = auVar27._16_4_;
            fVar233 = auVar27._20_4_;
            fVar136 = auVar27._24_4_;
            fVar138 = auVar27._28_4_;
            fVar241 = auVar258._0_4_;
            fVar251 = auVar258._4_4_;
            fVar249 = auVar258._8_4_;
            fVar253 = auVar258._12_4_;
            fVar252 = auVar258._16_4_;
            fVar254 = auVar258._20_4_;
            fVar185 = auVar258._24_4_;
            fVar212 = auVar15._0_4_;
            fVar222 = auVar15._4_4_;
            fVar268 = auVar15._8_4_;
            fVar226 = auVar15._12_4_;
            fVar228 = auVar15._16_4_;
            fVar230 = auVar15._20_4_;
            fVar232 = auVar15._24_4_;
            auVar275._0_4_ = fVar212 * fVar212 + fVar164 * fVar164;
            auVar275._4_4_ = fVar222 * fVar222 + fVar177 * fVar177;
            auVar275._8_4_ = fVar268 * fVar268 + fVar255 * fVar255;
            auVar275._12_4_ = fVar226 * fVar226 + fVar180 * fVar180;
            auVar275._16_4_ = fVar228 * fVar228 + fVar196 * fVar196;
            auVar275._20_4_ = fVar230 * fVar230 + fVar233 * fVar233;
            auVar275._24_4_ = fVar232 * fVar232 + fVar136 * fVar136;
            auVar275._28_4_ = fStack_3a4 + auVar16._28_4_;
            auVar16 = vrsqrtps_avx(auVar275);
            fVar220 = auVar16._0_4_;
            fVar224 = auVar16._4_4_;
            auVar60._4_4_ = fVar224 * 1.5;
            auVar60._0_4_ = fVar220 * 1.5;
            fVar270 = auVar16._8_4_;
            auVar60._8_4_ = fVar270 * 1.5;
            fVar210 = auVar16._12_4_;
            auVar60._12_4_ = fVar210 * 1.5;
            fVar284 = auVar16._16_4_;
            auVar60._16_4_ = fVar284 * 1.5;
            fVar211 = auVar16._20_4_;
            auVar60._20_4_ = fVar211 * 1.5;
            fVar150 = auVar16._24_4_;
            auVar60._24_4_ = fVar150 * 1.5;
            auVar60._28_4_ = auVar282._28_4_;
            auVar61._4_4_ = fVar224 * fVar224 * fVar224 * auVar275._4_4_ * 0.5;
            auVar61._0_4_ = fVar220 * fVar220 * fVar220 * auVar275._0_4_ * 0.5;
            auVar61._8_4_ = fVar270 * fVar270 * fVar270 * auVar275._8_4_ * 0.5;
            auVar61._12_4_ = fVar210 * fVar210 * fVar210 * auVar275._12_4_ * 0.5;
            auVar61._16_4_ = fVar284 * fVar284 * fVar284 * auVar275._16_4_ * 0.5;
            auVar61._20_4_ = fVar211 * fVar211 * fVar211 * auVar275._20_4_ * 0.5;
            auVar61._24_4_ = fVar150 * fVar150 * fVar150 * auVar275._24_4_ * 0.5;
            auVar61._28_4_ = auVar275._28_4_;
            auVar21 = vsubps_avx(auVar60,auVar61);
            fVar161 = auVar21._0_4_;
            fVar117 = auVar21._4_4_;
            fVar134 = auVar21._8_4_;
            fVar135 = auVar21._12_4_;
            fVar118 = auVar21._16_4_;
            fVar137 = auVar21._20_4_;
            fVar139 = auVar21._24_4_;
            fVar220 = auVar22._0_4_;
            fVar224 = auVar22._4_4_;
            fVar270 = auVar22._8_4_;
            fVar210 = auVar22._12_4_;
            fVar284 = auVar22._16_4_;
            fVar211 = auVar22._20_4_;
            fVar150 = auVar22._24_4_;
            auVar247._0_4_ = fVar220 * fVar220 + fVar241 * fVar241;
            auVar247._4_4_ = fVar224 * fVar224 + fVar251 * fVar251;
            auVar247._8_4_ = fVar270 * fVar270 + fVar249 * fVar249;
            auVar247._12_4_ = fVar210 * fVar210 + fVar253 * fVar253;
            auVar247._16_4_ = fVar284 * fVar284 + fVar252 * fVar252;
            auVar247._20_4_ = fVar211 * fVar211 + fVar254 * fVar254;
            auVar247._24_4_ = fVar150 * fVar150 + fVar185 * fVar185;
            auVar247._28_4_ = auVar16._28_4_ + auVar258._28_4_;
            auVar258 = vrsqrtps_avx(auVar247);
            fVar181 = auVar258._0_4_;
            fVar272 = auVar258._4_4_;
            auVar62._4_4_ = fVar272 * 1.5;
            auVar62._0_4_ = fVar181 * 1.5;
            fVar182 = auVar258._8_4_;
            auVar62._8_4_ = fVar182 * 1.5;
            fVar250 = auVar258._12_4_;
            auVar62._12_4_ = fVar250 * 1.5;
            fVar183 = auVar258._16_4_;
            auVar62._16_4_ = fVar183 * 1.5;
            fVar162 = auVar258._20_4_;
            auVar62._20_4_ = fVar162 * 1.5;
            fVar184 = auVar258._24_4_;
            auVar62._24_4_ = fVar184 * 1.5;
            auVar62._28_4_ = auVar282._28_4_;
            auVar63._4_4_ = fVar272 * fVar272 * fVar272 * auVar247._4_4_ * 0.5;
            auVar63._0_4_ = fVar181 * fVar181 * fVar181 * auVar247._0_4_ * 0.5;
            auVar63._8_4_ = fVar182 * fVar182 * fVar182 * auVar247._8_4_ * 0.5;
            auVar63._12_4_ = fVar250 * fVar250 * fVar250 * auVar247._12_4_ * 0.5;
            auVar63._16_4_ = fVar183 * fVar183 * fVar183 * auVar247._16_4_ * 0.5;
            auVar63._20_4_ = fVar162 * fVar162 * fVar162 * auVar247._20_4_ * 0.5;
            auVar63._24_4_ = fVar184 * fVar184 * fVar184 * auVar247._24_4_ * 0.5;
            auVar63._28_4_ = auVar247._28_4_;
            auVar16 = vsubps_avx(auVar62,auVar63);
            fVar181 = auVar16._0_4_;
            fVar272 = auVar16._4_4_;
            fVar182 = auVar16._8_4_;
            fVar250 = auVar16._12_4_;
            fVar183 = auVar16._16_4_;
            fVar162 = auVar16._20_4_;
            fVar184 = auVar16._24_4_;
            fVar277 = (float)local_780._0_4_ * fVar161 * fVar212;
            fStack_59c = (float)local_780._4_4_ * fVar117 * fVar222;
            auVar64._4_4_ = fStack_59c;
            auVar64._0_4_ = fVar277;
            fStack_598 = fStack_778 * fVar134 * fVar268;
            auVar64._8_4_ = fStack_598;
            fVar212 = fStack_774 * fVar135 * fVar226;
            auVar64._12_4_ = fVar212;
            fStack_590 = fStack_770 * fVar118 * fVar228;
            auVar64._16_4_ = fStack_590;
            fStack_58c = fStack_76c * fVar137 * fVar230;
            auVar64._20_4_ = fStack_58c;
            fStack_588 = fStack_768 * fVar139 * fVar232;
            auVar64._24_4_ = fStack_588;
            auVar64._28_4_ = auVar258._28_4_;
            fStack_59c = fStack_59c + auVar245._4_4_;
            fStack_598 = fStack_598 + auVar245._8_4_;
            aStack_594.w = fVar212 + auVar245._12_4_;
            fStack_590 = fStack_590 + auVar245._16_4_;
            fStack_58c = fStack_58c + auVar245._20_4_;
            fStack_588 = fStack_588 + auVar245._24_4_;
            fStack_584 = auVar258._28_4_ + auVar245._28_4_;
            fVar212 = (float)local_780._0_4_ * fVar161 * -fVar164;
            fVar222 = (float)local_780._4_4_ * fVar117 * -fVar177;
            auVar65._4_4_ = fVar222;
            auVar65._0_4_ = fVar212;
            fVar268 = fStack_778 * fVar134 * -fVar255;
            auVar65._8_4_ = fVar268;
            fVar226 = fStack_774 * fVar135 * -fVar180;
            auVar65._12_4_ = fVar226;
            fVar228 = fStack_770 * fVar118 * -fVar196;
            auVar65._16_4_ = fVar228;
            fVar230 = fStack_76c * fVar137 * -fVar233;
            auVar65._20_4_ = fVar230;
            fVar232 = fStack_768 * fVar139 * -fVar136;
            auVar65._24_4_ = fVar232;
            auVar65._28_4_ = -fVar138;
            local_560._4_4_ = local_6c0._4_4_ + fVar222;
            local_560._0_4_ = local_6c0._0_4_ + fVar212;
            fStack_558 = local_6c0._8_4_ + fVar268;
            fStack_554 = local_6c0._12_4_ + fVar226;
            fStack_550 = local_6c0._16_4_ + fVar228;
            fStack_54c = local_6c0._20_4_ + fVar230;
            fStack_548 = local_6c0._24_4_ + fVar232;
            fStack_544 = local_6c0._28_4_ + -fVar138;
            fVar212 = fVar161 * 0.0 * (float)local_780._0_4_;
            fVar222 = fVar117 * 0.0 * (float)local_780._4_4_;
            auVar66._4_4_ = fVar222;
            auVar66._0_4_ = fVar212;
            fVar268 = fVar134 * 0.0 * fStack_778;
            auVar66._8_4_ = fVar268;
            fVar226 = fVar135 * 0.0 * fStack_774;
            auVar66._12_4_ = fVar226;
            fVar228 = fVar118 * 0.0 * fStack_770;
            auVar66._16_4_ = fVar228;
            fVar230 = fVar137 * 0.0 * fStack_76c;
            auVar66._20_4_ = fVar230;
            fVar232 = fVar139 * 0.0 * fStack_768;
            auVar66._24_4_ = fVar232;
            auVar66._28_4_ = fVar138;
            auVar126 = vsubps_avx(auVar245,auVar64);
            auVar299._0_4_ = fVar212 + auVar131._0_4_;
            auVar299._4_4_ = fVar222 + auVar131._4_4_;
            auVar299._8_4_ = fVar268 + auVar131._8_4_;
            auVar299._12_4_ = fVar226 + auVar131._12_4_;
            auVar299._16_4_ = fVar228 + auVar131._16_4_;
            auVar299._20_4_ = fVar230 + auVar131._20_4_;
            auVar299._24_4_ = fVar232 + auVar131._24_4_;
            auVar299._28_4_ = fVar138 + auVar131._28_4_;
            fVar212 = (float)local_500._0_4_ * fVar181 * fVar220;
            fVar220 = (float)local_500._4_4_ * fVar272 * fVar224;
            auVar67._4_4_ = fVar220;
            auVar67._0_4_ = fVar212;
            fVar222 = fStack_4f8 * fVar182 * fVar270;
            auVar67._8_4_ = fVar222;
            fVar224 = fStack_4f4 * fVar250 * fVar210;
            auVar67._12_4_ = fVar224;
            fVar268 = fStack_4f0 * fVar183 * fVar284;
            auVar67._16_4_ = fVar268;
            fVar270 = fStack_4ec * fVar162 * fVar211;
            auVar67._20_4_ = fVar270;
            fVar226 = fStack_4e8 * fVar184 * fVar150;
            auVar67._24_4_ = fVar226;
            auVar67._28_4_ = fStack_764;
            auVar279 = vsubps_avx(local_6c0,auVar65);
            auVar287._0_4_ = local_440._0_4_ + fVar212;
            auVar287._4_4_ = local_440._4_4_ + fVar220;
            auVar287._8_4_ = local_440._8_4_ + fVar222;
            auVar287._12_4_ = local_440._12_4_ + fVar224;
            auVar287._16_4_ = local_440._16_4_ + fVar268;
            auVar287._20_4_ = local_440._20_4_ + fVar270;
            auVar287._24_4_ = local_440._24_4_ + fVar226;
            auVar287._28_4_ = local_440._28_4_ + fStack_764;
            fVar212 = fVar181 * -fVar241 * (float)local_500._0_4_;
            fVar220 = fVar272 * -fVar251 * (float)local_500._4_4_;
            auVar68._4_4_ = fVar220;
            auVar68._0_4_ = fVar212;
            fVar222 = fVar182 * -fVar249 * fStack_4f8;
            auVar68._8_4_ = fVar222;
            fVar224 = fVar250 * -fVar253 * fStack_4f4;
            auVar68._12_4_ = fVar224;
            fVar268 = fVar183 * -fVar252 * fStack_4f0;
            auVar68._16_4_ = fVar268;
            fVar270 = fVar162 * -fVar254 * fStack_4ec;
            auVar68._20_4_ = fVar270;
            fVar226 = fVar184 * -fVar185 * fStack_4e8;
            auVar68._24_4_ = fVar226;
            auVar68._28_4_ = auVar245._28_4_;
            auVar24 = vsubps_avx(auVar131,auVar66);
            auVar193._0_4_ = auVar205._0_4_ + fVar212;
            auVar193._4_4_ = auVar205._4_4_ + fVar220;
            auVar193._8_4_ = auVar205._8_4_ + fVar222;
            auVar193._12_4_ = auVar205._12_4_ + fVar224;
            auVar193._16_4_ = auVar205._16_4_ + fVar268;
            auVar193._20_4_ = auVar205._20_4_ + fVar270;
            auVar193._24_4_ = auVar205._24_4_ + fVar226;
            auVar193._28_4_ = auVar205._28_4_ + auVar245._28_4_;
            fVar212 = fVar181 * 0.0 * (float)local_500._0_4_;
            fVar220 = fVar272 * 0.0 * (float)local_500._4_4_;
            auVar69._4_4_ = fVar220;
            auVar69._0_4_ = fVar212;
            fVar222 = fVar182 * 0.0 * fStack_4f8;
            auVar69._8_4_ = fVar222;
            fVar224 = fVar250 * 0.0 * fStack_4f4;
            auVar69._12_4_ = fVar224;
            fVar268 = fVar183 * 0.0 * fStack_4f0;
            auVar69._16_4_ = fVar268;
            fVar270 = fVar162 * 0.0 * fStack_4ec;
            auVar69._20_4_ = fVar270;
            fVar226 = fVar184 * 0.0 * fStack_4e8;
            auVar69._24_4_ = fVar226;
            auVar69._28_4_ = auVar131._28_4_;
            auVar258 = vsubps_avx(local_440,auVar67);
            auVar263._0_4_ = (float)local_5e0._0_4_ + fVar212;
            auVar263._4_4_ = (float)local_5e0._4_4_ + fVar220;
            auVar263._8_4_ = fStack_5d8 + fVar222;
            auVar263._12_4_ = fStack_5d4 + fVar224;
            auVar263._16_4_ = fStack_5d0 + fVar268;
            auVar263._20_4_ = fStack_5cc + fVar270;
            auVar263._24_4_ = fStack_5c8 + fVar226;
            auVar263._28_4_ = fStack_5c4 + auVar131._28_4_;
            auVar22 = vsubps_avx(auVar205,auVar68);
            auVar21 = vsubps_avx(_local_5e0,auVar69);
            auVar27 = vsubps_avx(auVar193,auVar279);
            auVar15 = vsubps_avx(auVar263,auVar24);
            auVar70._4_4_ = auVar24._4_4_ * auVar27._4_4_;
            auVar70._0_4_ = auVar24._0_4_ * auVar27._0_4_;
            auVar70._8_4_ = auVar24._8_4_ * auVar27._8_4_;
            auVar70._12_4_ = auVar24._12_4_ * auVar27._12_4_;
            auVar70._16_4_ = auVar24._16_4_ * auVar27._16_4_;
            auVar70._20_4_ = auVar24._20_4_ * auVar27._20_4_;
            auVar70._24_4_ = auVar24._24_4_ * auVar27._24_4_;
            auVar70._28_4_ = auVar282._28_4_;
            auVar71._4_4_ = auVar279._4_4_ * auVar15._4_4_;
            auVar71._0_4_ = auVar279._0_4_ * auVar15._0_4_;
            auVar71._8_4_ = auVar279._8_4_ * auVar15._8_4_;
            auVar71._12_4_ = auVar279._12_4_ * auVar15._12_4_;
            auVar71._16_4_ = auVar279._16_4_ * auVar15._16_4_;
            auVar71._20_4_ = auVar279._20_4_ * auVar15._20_4_;
            auVar71._24_4_ = auVar279._24_4_ * auVar15._24_4_;
            auVar71._28_4_ = auVar205._28_4_;
            auVar171 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar126._4_4_ * auVar15._4_4_;
            auVar72._0_4_ = auVar126._0_4_ * auVar15._0_4_;
            auVar72._8_4_ = auVar126._8_4_ * auVar15._8_4_;
            auVar72._12_4_ = auVar126._12_4_ * auVar15._12_4_;
            auVar72._16_4_ = auVar126._16_4_ * auVar15._16_4_;
            auVar72._20_4_ = auVar126._20_4_ * auVar15._20_4_;
            auVar72._24_4_ = auVar126._24_4_ * auVar15._24_4_;
            auVar72._28_4_ = auVar15._28_4_;
            auVar15 = vsubps_avx(auVar287,auVar126);
            auVar73._4_4_ = auVar24._4_4_ * auVar15._4_4_;
            auVar73._0_4_ = auVar24._0_4_ * auVar15._0_4_;
            auVar73._8_4_ = auVar24._8_4_ * auVar15._8_4_;
            auVar73._12_4_ = auVar24._12_4_ * auVar15._12_4_;
            auVar73._16_4_ = auVar24._16_4_ * auVar15._16_4_;
            auVar73._20_4_ = auVar24._20_4_ * auVar15._20_4_;
            auVar73._24_4_ = auVar24._24_4_ * auVar15._24_4_;
            auVar73._28_4_ = auVar16._28_4_;
            auVar239 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar279._4_4_ * auVar15._4_4_;
            auVar74._0_4_ = auVar279._0_4_ * auVar15._0_4_;
            auVar74._8_4_ = auVar279._8_4_ * auVar15._8_4_;
            auVar74._12_4_ = auVar279._12_4_ * auVar15._12_4_;
            auVar74._16_4_ = auVar279._16_4_ * auVar15._16_4_;
            auVar74._20_4_ = auVar279._20_4_ * auVar15._20_4_;
            auVar74._24_4_ = auVar279._24_4_ * auVar15._24_4_;
            auVar74._28_4_ = auVar16._28_4_;
            auVar75._4_4_ = auVar126._4_4_ * auVar27._4_4_;
            auVar75._0_4_ = auVar126._0_4_ * auVar27._0_4_;
            auVar75._8_4_ = auVar126._8_4_ * auVar27._8_4_;
            auVar75._12_4_ = auVar126._12_4_ * auVar27._12_4_;
            auVar75._16_4_ = auVar126._16_4_ * auVar27._16_4_;
            auVar75._20_4_ = auVar126._20_4_ * auVar27._20_4_;
            auVar75._24_4_ = auVar126._24_4_ * auVar27._24_4_;
            auVar75._28_4_ = auVar27._28_4_;
            auVar16 = vsubps_avx(auVar75,auVar74);
            auVar147._0_4_ = auVar171._0_4_ * 0.0 + auVar16._0_4_ + auVar239._0_4_ * 0.0;
            auVar147._4_4_ = auVar171._4_4_ * 0.0 + auVar16._4_4_ + auVar239._4_4_ * 0.0;
            auVar147._8_4_ = auVar171._8_4_ * 0.0 + auVar16._8_4_ + auVar239._8_4_ * 0.0;
            auVar147._12_4_ = auVar171._12_4_ * 0.0 + auVar16._12_4_ + auVar239._12_4_ * 0.0;
            auVar147._16_4_ = auVar171._16_4_ * 0.0 + auVar16._16_4_ + auVar239._16_4_ * 0.0;
            auVar147._20_4_ = auVar171._20_4_ * 0.0 + auVar16._20_4_ + auVar239._20_4_ * 0.0;
            auVar147._24_4_ = auVar171._24_4_ * 0.0 + auVar16._24_4_ + auVar239._24_4_ * 0.0;
            auVar147._28_4_ = auVar171._28_4_ + auVar16._28_4_ + auVar239._28_4_;
            auVar259 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
            auVar100._4_4_ = fStack_59c;
            auVar100._0_4_ = fVar277 + auVar245._0_4_;
            auVar100._8_4_ = fStack_598;
            auVar100._12_4_ = aStack_594;
            auVar100._16_4_ = fStack_590;
            auVar100._20_4_ = fStack_58c;
            auVar100._24_4_ = fStack_588;
            auVar100._28_4_ = fStack_584;
            auVar258 = vblendvps_avx(auVar258,auVar100,auVar259);
            auVar175 = ZEXT3264(auVar258);
            auVar16 = vblendvps_avx(auVar22,_local_560,auVar259);
            auVar22 = vblendvps_avx(auVar21,auVar299,auVar259);
            auVar21 = vblendvps_avx(auVar126,auVar287,auVar259);
            auVar27 = vblendvps_avx(auVar279,auVar193,auVar259);
            auVar15 = vblendvps_avx(auVar24,auVar263,auVar259);
            auVar126 = vblendvps_avx(auVar287,auVar126,auVar259);
            auVar171 = vblendvps_avx(auVar193,auVar279,auVar259);
            auVar239 = vblendvps_avx(auVar263,auVar24,auVar259);
            local_6c0 = vandps_avx(auVar243,auVar146);
            auVar126 = vsubps_avx(auVar126,auVar258);
            auVar25 = vsubps_avx(auVar171,auVar16);
            auVar239 = vsubps_avx(auVar239,auVar22);
            auVar243 = vsubps_avx(auVar16,auVar27);
            fVar212 = auVar25._0_4_;
            fVar221 = auVar22._0_4_;
            fVar210 = auVar25._4_4_;
            fVar223 = auVar22._4_4_;
            auVar76._4_4_ = fVar223 * fVar210;
            auVar76._0_4_ = fVar221 * fVar212;
            fVar241 = auVar25._8_4_;
            fVar225 = auVar22._8_4_;
            auVar76._8_4_ = fVar225 * fVar241;
            fVar250 = auVar25._12_4_;
            fVar227 = auVar22._12_4_;
            auVar76._12_4_ = fVar227 * fVar250;
            fVar161 = auVar25._16_4_;
            fVar229 = auVar22._16_4_;
            auVar76._16_4_ = fVar229 * fVar161;
            fVar277 = auVar25._20_4_;
            fVar231 = auVar22._20_4_;
            auVar76._20_4_ = fVar231 * fVar277;
            fVar136 = auVar25._24_4_;
            fVar234 = auVar22._24_4_;
            auVar76._24_4_ = fVar234 * fVar136;
            auVar76._28_4_ = auVar171._28_4_;
            fVar220 = auVar16._0_4_;
            fVar256 = auVar239._0_4_;
            fVar228 = auVar16._4_4_;
            fVar265 = auVar239._4_4_;
            auVar77._4_4_ = fVar265 * fVar228;
            auVar77._0_4_ = fVar256 * fVar220;
            fVar181 = auVar16._8_4_;
            fVar266 = auVar239._8_4_;
            auVar77._8_4_ = fVar266 * fVar181;
            fVar252 = auVar16._12_4_;
            fVar267 = auVar239._12_4_;
            auVar77._12_4_ = fVar267 * fVar252;
            fVar117 = auVar16._16_4_;
            fVar269 = auVar239._16_4_;
            auVar77._16_4_ = fVar269 * fVar117;
            fVar164 = auVar16._20_4_;
            fVar271 = auVar239._20_4_;
            auVar77._20_4_ = fVar271 * fVar164;
            fVar138 = auVar16._24_4_;
            fVar273 = auVar239._24_4_;
            uVar7 = auVar279._28_4_;
            auVar77._24_4_ = fVar273 * fVar138;
            auVar77._28_4_ = uVar7;
            auVar171 = vsubps_avx(auVar77,auVar76);
            fVar222 = auVar258._0_4_;
            fVar284 = auVar258._4_4_;
            auVar78._4_4_ = fVar265 * fVar284;
            auVar78._0_4_ = fVar256 * fVar222;
            fVar251 = auVar258._8_4_;
            auVar78._8_4_ = fVar266 * fVar251;
            fVar183 = auVar258._12_4_;
            auVar78._12_4_ = fVar267 * fVar183;
            fVar134 = auVar258._16_4_;
            auVar78._16_4_ = fVar269 * fVar134;
            fVar177 = auVar258._20_4_;
            auVar78._20_4_ = fVar271 * fVar177;
            fVar140 = auVar258._24_4_;
            auVar78._24_4_ = fVar273 * fVar140;
            auVar78._28_4_ = uVar7;
            fVar224 = auVar126._0_4_;
            fVar230 = auVar126._4_4_;
            auVar79._4_4_ = fVar223 * fVar230;
            auVar79._0_4_ = fVar221 * fVar224;
            fVar272 = auVar126._8_4_;
            auVar79._8_4_ = fVar225 * fVar272;
            fVar254 = auVar126._12_4_;
            auVar79._12_4_ = fVar227 * fVar254;
            fVar135 = auVar126._16_4_;
            auVar79._16_4_ = fVar229 * fVar135;
            fVar255 = auVar126._20_4_;
            auVar79._20_4_ = fVar231 * fVar255;
            fVar141 = auVar126._24_4_;
            auVar79._24_4_ = fVar234 * fVar141;
            auVar79._28_4_ = auVar287._28_4_;
            auVar279 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = fVar228 * fVar230;
            auVar80._0_4_ = fVar220 * fVar224;
            auVar80._8_4_ = fVar181 * fVar272;
            auVar80._12_4_ = fVar252 * fVar254;
            auVar80._16_4_ = fVar117 * fVar135;
            auVar80._20_4_ = fVar164 * fVar255;
            auVar80._24_4_ = fVar138 * fVar141;
            auVar80._28_4_ = uVar7;
            auVar81._4_4_ = fVar284 * fVar210;
            auVar81._0_4_ = fVar222 * fVar212;
            auVar81._8_4_ = fVar251 * fVar241;
            auVar81._12_4_ = fVar183 * fVar250;
            auVar81._16_4_ = fVar134 * fVar161;
            auVar81._20_4_ = fVar177 * fVar277;
            auVar81._24_4_ = fVar140 * fVar136;
            auVar81._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar81,auVar80);
            auVar26 = vsubps_avx(auVar22,auVar15);
            fVar270 = auVar24._28_4_ + auVar279._28_4_;
            auVar276._0_4_ = auVar24._0_4_ + auVar279._0_4_ * 0.0 + auVar171._0_4_ * 0.0;
            auVar276._4_4_ = auVar24._4_4_ + auVar279._4_4_ * 0.0 + auVar171._4_4_ * 0.0;
            auVar276._8_4_ = auVar24._8_4_ + auVar279._8_4_ * 0.0 + auVar171._8_4_ * 0.0;
            auVar276._12_4_ = auVar24._12_4_ + auVar279._12_4_ * 0.0 + auVar171._12_4_ * 0.0;
            auVar276._16_4_ = auVar24._16_4_ + auVar279._16_4_ * 0.0 + auVar171._16_4_ * 0.0;
            auVar276._20_4_ = auVar24._20_4_ + auVar279._20_4_ * 0.0 + auVar171._20_4_ * 0.0;
            auVar276._24_4_ = auVar24._24_4_ + auVar279._24_4_ * 0.0 + auVar171._24_4_ * 0.0;
            auVar276._28_4_ = fVar270 + auVar171._28_4_;
            fVar268 = auVar243._0_4_;
            fVar211 = auVar243._4_4_;
            auVar82._4_4_ = auVar15._4_4_ * fVar211;
            auVar82._0_4_ = auVar15._0_4_ * fVar268;
            fVar249 = auVar243._8_4_;
            auVar82._8_4_ = auVar15._8_4_ * fVar249;
            fVar162 = auVar243._12_4_;
            auVar82._12_4_ = auVar15._12_4_ * fVar162;
            fVar118 = auVar243._16_4_;
            auVar82._16_4_ = auVar15._16_4_ * fVar118;
            fVar180 = auVar243._20_4_;
            auVar82._20_4_ = auVar15._20_4_ * fVar180;
            fVar142 = auVar243._24_4_;
            auVar82._24_4_ = auVar15._24_4_ * fVar142;
            auVar82._28_4_ = fVar270;
            fVar270 = auVar26._0_4_;
            fVar232 = auVar26._4_4_;
            auVar83._4_4_ = auVar27._4_4_ * fVar232;
            auVar83._0_4_ = auVar27._0_4_ * fVar270;
            fVar182 = auVar26._8_4_;
            auVar83._8_4_ = auVar27._8_4_ * fVar182;
            fVar185 = auVar26._12_4_;
            auVar83._12_4_ = auVar27._12_4_ * fVar185;
            fVar137 = auVar26._16_4_;
            auVar83._16_4_ = auVar27._16_4_ * fVar137;
            fVar196 = auVar26._20_4_;
            auVar83._20_4_ = auVar27._20_4_ * fVar196;
            fVar151 = auVar26._24_4_;
            auVar83._24_4_ = auVar27._24_4_ * fVar151;
            auVar83._28_4_ = auVar24._28_4_;
            auVar243 = vsubps_avx(auVar83,auVar82);
            auVar279 = vsubps_avx(auVar258,auVar21);
            fVar226 = auVar279._0_4_;
            fVar150 = auVar279._4_4_;
            auVar84._4_4_ = auVar15._4_4_ * fVar150;
            auVar84._0_4_ = auVar15._0_4_ * fVar226;
            fVar253 = auVar279._8_4_;
            auVar84._8_4_ = auVar15._8_4_ * fVar253;
            fVar184 = auVar279._12_4_;
            auVar84._12_4_ = auVar15._12_4_ * fVar184;
            fVar139 = auVar279._16_4_;
            auVar84._16_4_ = auVar15._16_4_ * fVar139;
            fVar233 = auVar279._20_4_;
            auVar84._20_4_ = auVar15._20_4_ * fVar233;
            fVar213 = auVar279._24_4_;
            auVar84._24_4_ = auVar15._24_4_ * fVar213;
            auVar84._28_4_ = auVar15._28_4_;
            auVar85._4_4_ = fVar232 * auVar21._4_4_;
            auVar85._0_4_ = fVar270 * auVar21._0_4_;
            auVar85._8_4_ = fVar182 * auVar21._8_4_;
            auVar85._12_4_ = fVar185 * auVar21._12_4_;
            auVar85._16_4_ = fVar137 * auVar21._16_4_;
            auVar85._20_4_ = fVar196 * auVar21._20_4_;
            auVar85._24_4_ = fVar151 * auVar21._24_4_;
            auVar85._28_4_ = auVar171._28_4_;
            auVar15 = vsubps_avx(auVar84,auVar85);
            auVar86._4_4_ = auVar27._4_4_ * fVar150;
            auVar86._0_4_ = auVar27._0_4_ * fVar226;
            auVar86._8_4_ = auVar27._8_4_ * fVar253;
            auVar86._12_4_ = auVar27._12_4_ * fVar184;
            auVar86._16_4_ = auVar27._16_4_ * fVar139;
            auVar86._20_4_ = auVar27._20_4_ * fVar233;
            auVar86._24_4_ = auVar27._24_4_ * fVar213;
            auVar86._28_4_ = auVar27._28_4_;
            auVar87._4_4_ = fVar211 * auVar21._4_4_;
            auVar87._0_4_ = fVar268 * auVar21._0_4_;
            auVar87._8_4_ = fVar249 * auVar21._8_4_;
            auVar87._12_4_ = fVar162 * auVar21._12_4_;
            auVar87._16_4_ = fVar118 * auVar21._16_4_;
            auVar87._20_4_ = fVar180 * auVar21._20_4_;
            auVar87._24_4_ = fVar142 * auVar21._24_4_;
            auVar87._28_4_ = auVar21._28_4_;
            auVar21 = vsubps_avx(auVar87,auVar86);
            auVar132._0_4_ = auVar243._0_4_ * 0.0 + auVar21._0_4_ + auVar15._0_4_ * 0.0;
            auVar132._4_4_ = auVar243._4_4_ * 0.0 + auVar21._4_4_ + auVar15._4_4_ * 0.0;
            auVar132._8_4_ = auVar243._8_4_ * 0.0 + auVar21._8_4_ + auVar15._8_4_ * 0.0;
            auVar132._12_4_ = auVar243._12_4_ * 0.0 + auVar21._12_4_ + auVar15._12_4_ * 0.0;
            auVar132._16_4_ = auVar243._16_4_ * 0.0 + auVar21._16_4_ + auVar15._16_4_ * 0.0;
            auVar132._20_4_ = auVar243._20_4_ * 0.0 + auVar21._20_4_ + auVar15._20_4_ * 0.0;
            auVar132._24_4_ = auVar243._24_4_ * 0.0 + auVar21._24_4_ + auVar15._24_4_ * 0.0;
            auVar132._28_4_ = auVar15._28_4_ + auVar21._28_4_ + auVar15._28_4_;
            auVar133 = ZEXT3264(auVar132);
            auVar243 = vmaxps_avx(auVar276,auVar132);
            auVar243 = vcmpps_avx(auVar243,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar195 = ZEXT3264(local_6c0);
            auVar21 = local_6c0 & auVar243;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0x7f,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0xbf,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar21[0x1f]) {
LAB_00ed2fde:
              auVar149._8_8_ = uStack_518;
              auVar149._0_8_ = local_520;
              auVar149._16_8_ = uStack_510;
              auVar149._24_8_ = uStack_508;
            }
            else {
              auVar21 = vandps_avx(auVar243,local_6c0);
              auVar88._4_4_ = fVar232 * fVar210;
              auVar88._0_4_ = fVar270 * fVar212;
              auVar88._8_4_ = fVar182 * fVar241;
              auVar88._12_4_ = fVar185 * fVar250;
              auVar88._16_4_ = fVar137 * fVar161;
              auVar88._20_4_ = fVar196 * fVar277;
              auVar88._24_4_ = fVar151 * fVar136;
              auVar88._28_4_ = local_6c0._28_4_;
              auVar89._4_4_ = fVar211 * fVar265;
              auVar89._0_4_ = fVar268 * fVar256;
              auVar89._8_4_ = fVar249 * fVar266;
              auVar89._12_4_ = fVar162 * fVar267;
              auVar89._16_4_ = fVar118 * fVar269;
              auVar89._20_4_ = fVar180 * fVar271;
              auVar89._24_4_ = fVar142 * fVar273;
              auVar89._28_4_ = auVar243._28_4_;
              auVar27 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar150 * fVar265;
              auVar90._0_4_ = fVar226 * fVar256;
              auVar90._8_4_ = fVar253 * fVar266;
              auVar90._12_4_ = fVar184 * fVar267;
              auVar90._16_4_ = fVar139 * fVar269;
              auVar90._20_4_ = fVar233 * fVar271;
              auVar90._24_4_ = fVar213 * fVar273;
              auVar90._28_4_ = auVar239._28_4_;
              auVar91._4_4_ = fVar232 * fVar230;
              auVar91._0_4_ = fVar270 * fVar224;
              auVar91._8_4_ = fVar182 * fVar272;
              auVar91._12_4_ = fVar185 * fVar254;
              auVar91._16_4_ = fVar137 * fVar135;
              auVar91._20_4_ = fVar196 * fVar255;
              auVar91._24_4_ = fVar151 * fVar141;
              auVar91._28_4_ = auVar26._28_4_;
              auVar15 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar211 * fVar230;
              auVar92._0_4_ = fVar268 * fVar224;
              auVar92._8_4_ = fVar249 * fVar272;
              auVar92._12_4_ = fVar162 * fVar254;
              auVar92._16_4_ = fVar118 * fVar135;
              auVar92._20_4_ = fVar180 * fVar255;
              auVar92._24_4_ = fVar142 * fVar141;
              auVar92._28_4_ = auVar126._28_4_;
              auVar93._4_4_ = fVar150 * fVar210;
              auVar93._0_4_ = fVar226 * fVar212;
              auVar93._8_4_ = fVar253 * fVar241;
              auVar93._12_4_ = fVar184 * fVar250;
              auVar93._16_4_ = fVar139 * fVar161;
              auVar93._20_4_ = fVar233 * fVar277;
              auVar93._24_4_ = fVar213 * fVar136;
              auVar93._28_4_ = auVar25._28_4_;
              auVar171 = vsubps_avx(auVar93,auVar92);
              auVar148._0_4_ = auVar27._0_4_ * 0.0 + auVar171._0_4_ + auVar15._0_4_ * 0.0;
              auVar148._4_4_ = auVar27._4_4_ * 0.0 + auVar171._4_4_ + auVar15._4_4_ * 0.0;
              auVar148._8_4_ = auVar27._8_4_ * 0.0 + auVar171._8_4_ + auVar15._8_4_ * 0.0;
              auVar148._12_4_ = auVar27._12_4_ * 0.0 + auVar171._12_4_ + auVar15._12_4_ * 0.0;
              auVar148._16_4_ = auVar27._16_4_ * 0.0 + auVar171._16_4_ + auVar15._16_4_ * 0.0;
              auVar148._20_4_ = auVar27._20_4_ * 0.0 + auVar171._20_4_ + auVar15._20_4_ * 0.0;
              auVar148._24_4_ = auVar27._24_4_ * 0.0 + auVar171._24_4_ + auVar15._24_4_ * 0.0;
              auVar148._28_4_ = auVar25._28_4_ + auVar171._28_4_ + auVar126._28_4_;
              auVar243 = vrcpps_avx(auVar148);
              fVar224 = auVar243._0_4_;
              fVar268 = auVar243._4_4_;
              auVar94._4_4_ = auVar148._4_4_ * fVar268;
              auVar94._0_4_ = auVar148._0_4_ * fVar224;
              fVar270 = auVar243._8_4_;
              auVar94._8_4_ = auVar148._8_4_ * fVar270;
              fVar226 = auVar243._12_4_;
              auVar94._12_4_ = auVar148._12_4_ * fVar226;
              fVar210 = auVar243._16_4_;
              auVar94._16_4_ = auVar148._16_4_ * fVar210;
              fVar230 = auVar243._20_4_;
              auVar94._20_4_ = auVar148._20_4_ * fVar230;
              fVar211 = auVar243._24_4_;
              auVar94._24_4_ = auVar148._24_4_ * fVar211;
              auVar94._28_4_ = auVar26._28_4_;
              auVar283._8_4_ = 0x3f800000;
              auVar283._0_8_ = 0x3f8000003f800000;
              auVar283._12_4_ = 0x3f800000;
              auVar283._16_4_ = 0x3f800000;
              auVar283._20_4_ = 0x3f800000;
              auVar283._24_4_ = 0x3f800000;
              auVar283._28_4_ = 0x3f800000;
              auVar243 = vsubps_avx(auVar283,auVar94);
              fVar224 = auVar243._0_4_ * fVar224 + fVar224;
              fVar268 = auVar243._4_4_ * fVar268 + fVar268;
              fVar270 = auVar243._8_4_ * fVar270 + fVar270;
              fVar226 = auVar243._12_4_ * fVar226 + fVar226;
              fVar210 = auVar243._16_4_ * fVar210 + fVar210;
              fVar230 = auVar243._20_4_ * fVar230 + fVar230;
              fVar211 = auVar243._24_4_ * fVar211 + fVar211;
              auVar95._4_4_ =
                   (fVar284 * auVar27._4_4_ + auVar15._4_4_ * fVar228 + auVar171._4_4_ * fVar223) *
                   fVar268;
              auVar95._0_4_ =
                   (fVar222 * auVar27._0_4_ + auVar15._0_4_ * fVar220 + auVar171._0_4_ * fVar221) *
                   fVar224;
              auVar95._8_4_ =
                   (fVar251 * auVar27._8_4_ + auVar15._8_4_ * fVar181 + auVar171._8_4_ * fVar225) *
                   fVar270;
              auVar95._12_4_ =
                   (fVar183 * auVar27._12_4_ + auVar15._12_4_ * fVar252 + auVar171._12_4_ * fVar227)
                   * fVar226;
              auVar95._16_4_ =
                   (fVar134 * auVar27._16_4_ + auVar15._16_4_ * fVar117 + auVar171._16_4_ * fVar229)
                   * fVar210;
              auVar95._20_4_ =
                   (fVar177 * auVar27._20_4_ + auVar15._20_4_ * fVar164 + auVar171._20_4_ * fVar231)
                   * fVar230;
              auVar95._24_4_ =
                   (fVar140 * auVar27._24_4_ + auVar15._24_4_ * fVar138 + auVar171._24_4_ * fVar234)
                   * fVar211;
              auVar95._28_4_ = auVar258._28_4_ + auVar16._28_4_ + auVar22._28_4_;
              auVar175 = ZEXT3264(auVar95);
              fVar212 = ray->tfar;
              auVar194._4_4_ = fVar212;
              auVar194._0_4_ = fVar212;
              auVar194._8_4_ = fVar212;
              auVar194._12_4_ = fVar212;
              auVar194._16_4_ = fVar212;
              auVar194._20_4_ = fVar212;
              auVar194._24_4_ = fVar212;
              auVar194._28_4_ = fVar212;
              auVar243 = vcmpps_avx(local_c0,auVar95,2);
              auVar258 = vcmpps_avx(auVar95,auVar194,2);
              auVar195 = ZEXT3264(auVar258);
              auVar243 = vandps_avx(auVar243,auVar258);
              auVar16 = auVar21 & auVar243;
              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar16 >> 0x7f,0) == '\0') &&
                    (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar16 >> 0xbf,0) == '\0') &&
                  (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar16[0x1f]) goto LAB_00ed2fde;
              auVar243 = vandps_avx(auVar21,auVar243);
              auVar16 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar148,4);
              auVar22 = auVar243 & auVar16;
              auVar149._8_8_ = uStack_518;
              auVar149._0_8_ = local_520;
              auVar149._16_8_ = uStack_510;
              auVar149._24_8_ = uStack_508;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar149 = vandps_avx(auVar16,auVar243);
                auVar96._4_4_ = fVar268 * auVar276._4_4_;
                auVar96._0_4_ = fVar224 * auVar276._0_4_;
                auVar96._8_4_ = fVar270 * auVar276._8_4_;
                auVar96._12_4_ = fVar226 * auVar276._12_4_;
                auVar96._16_4_ = fVar210 * auVar276._16_4_;
                auVar96._20_4_ = fVar230 * auVar276._20_4_;
                auVar96._24_4_ = fVar211 * auVar276._24_4_;
                auVar96._28_4_ = auVar258._28_4_;
                auVar97._4_4_ = auVar132._4_4_ * fVar268;
                auVar97._0_4_ = auVar132._0_4_ * fVar224;
                auVar97._8_4_ = auVar132._8_4_ * fVar270;
                auVar97._12_4_ = auVar132._12_4_ * fVar226;
                auVar97._16_4_ = auVar132._16_4_ * fVar210;
                auVar97._20_4_ = auVar132._20_4_ * fVar230;
                auVar97._24_4_ = auVar132._24_4_ * fVar211;
                auVar97._28_4_ = auVar132._28_4_;
                auVar219._8_4_ = 0x3f800000;
                auVar219._0_8_ = 0x3f8000003f800000;
                auVar219._12_4_ = 0x3f800000;
                auVar219._16_4_ = 0x3f800000;
                auVar219._20_4_ = 0x3f800000;
                auVar219._24_4_ = 0x3f800000;
                auVar219._28_4_ = 0x3f800000;
                auVar243 = vsubps_avx(auVar219,auVar96);
                local_160 = vblendvps_avx(auVar243,auVar96,auVar259);
                auVar243 = vsubps_avx(auVar219,auVar97);
                auVar195 = ZEXT3264(auVar243);
                _local_380 = vblendvps_avx(auVar243,auVar97,auVar259);
                auVar133 = ZEXT3264(_local_380);
                local_180 = auVar95;
              }
            }
            auVar264 = ZEXT3264(local_740);
            auVar248 = ZEXT3264(local_720);
            if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar149 >> 0x7f,0) == '\0') &&
                  (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0xbf,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar149[0x1f]) goto LAB_00ed2b9a;
            auVar243 = vsubps_avx(_local_500,_local_780);
            auVar175 = ZEXT3264(local_160);
            fVar220 = (float)local_780._0_4_ + auVar243._0_4_ * local_160._0_4_;
            fVar222 = (float)local_780._4_4_ + auVar243._4_4_ * local_160._4_4_;
            fVar224 = fStack_778 + auVar243._8_4_ * local_160._8_4_;
            fVar268 = fStack_774 + auVar243._12_4_ * local_160._12_4_;
            fVar270 = fStack_770 + auVar243._16_4_ * local_160._16_4_;
            fVar226 = fStack_76c + auVar243._20_4_ * local_160._20_4_;
            fVar210 = fStack_768 + auVar243._24_4_ * local_160._24_4_;
            fVar228 = fStack_764 + auVar243._28_4_;
            fVar212 = local_6e8->depth_scale;
            auVar98._4_4_ = (fVar222 + fVar222) * fVar212;
            auVar98._0_4_ = (fVar220 + fVar220) * fVar212;
            auVar98._8_4_ = (fVar224 + fVar224) * fVar212;
            auVar98._12_4_ = (fVar268 + fVar268) * fVar212;
            auVar98._16_4_ = (fVar270 + fVar270) * fVar212;
            auVar98._20_4_ = (fVar226 + fVar226) * fVar212;
            auVar98._24_4_ = (fVar210 + fVar210) * fVar212;
            auVar98._28_4_ = fVar228 + fVar228;
            auVar195 = ZEXT3264(local_180);
            auVar243 = vcmpps_avx(local_180,auVar98,6);
            auVar133 = ZEXT3264(auVar243);
            auVar258 = auVar149 & auVar243;
            if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar258 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar258 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar258 >> 0x7f,0) == '\0') &&
                  (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar258 >> 0xbf,0) == '\0') &&
                (auVar258 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar258[0x1f]) goto LAB_00ed2b9a;
            local_200 = vandps_avx(auVar243,auVar149);
            auVar133 = ZEXT3264(local_200);
            local_2a0 = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            fStack_29c = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            fStack_298 = (float)uStack_378 + (float)uStack_378 + -1.0;
            fStack_294 = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
            fStack_290 = (float)uStack_370 + (float)uStack_370 + -1.0;
            fStack_28c = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            fStack_288 = (float)uStack_368 + (float)uStack_368 + -1.0;
            fStack_284 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_2c0 = local_160;
            local_280 = local_180;
            local_25c = uVar109;
            local_250 = local_790;
            uStack_248 = uStack_788;
            local_240 = local_700;
            uStack_238 = uStack_6f8;
            local_230 = local_5b0;
            uStack_228 = uStack_5a8;
            local_220 = local_6a0;
            uStack_218 = uStack_698;
            local_660 = (undefined1  [8])(context->scene->geometries).items[local_6f0].ptr;
            local_380._4_4_ = fStack_29c;
            local_380._0_4_ = local_2a0;
            uStack_378._0_4_ = fStack_298;
            uStack_378._4_4_ = fStack_294;
            uStack_370._0_4_ = fStack_290;
            uStack_370._4_4_ = fStack_28c;
            auVar108 = _local_380;
            uStack_368._0_4_ = fStack_288;
            uStack_368._4_4_ = fStack_284;
            auVar243 = _local_380;
            if ((((Geometry *)local_660)->mask & ray->mask) == 0) {
              pRVar111 = (RTCIntersectArguments *)0x0;
LAB_00ed2fd0:
              fVar197 = (float)local_760._0_4_;
              fVar207 = (float)local_760._4_4_;
              fVar208 = fStack_758;
              fVar209 = fStack_754;
              fVar163 = fStack_750;
              fVar176 = fStack_74c;
              fVar178 = fStack_748;
              fVar179 = fStack_744;
            }
            else {
              pRVar111 = context->args;
              if ((pRVar111->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar111 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar111 >> 8),1),
                 ((Geometry *)local_660)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auStack_658 = auVar205._8_24_;
                local_6c0._0_8_ = context;
                auVar201 = vshufps_avx(ZEXT416((uint)(float)(int)local_260),
                                       ZEXT416((uint)(float)(int)local_260),0);
                local_1e0[0] = (auVar201._0_4_ + local_160._0_4_ + 0.0) * (float)local_420._0_4_;
                local_1e0[1] = (auVar201._4_4_ + local_160._4_4_ + 1.0) * (float)local_420._4_4_;
                local_1e0[2] = (auVar201._8_4_ + local_160._8_4_ + 2.0) * fStack_418;
                local_1e0[3] = (auVar201._12_4_ + local_160._12_4_ + 3.0) * fStack_414;
                fStack_1d0 = (auVar201._0_4_ + local_160._16_4_ + 4.0) * fStack_410;
                fStack_1cc = (auVar201._4_4_ + local_160._20_4_ + 5.0) * fStack_40c;
                fStack_1c8 = (auVar201._8_4_ + local_160._24_4_ + 6.0) * fStack_408;
                fStack_1c4 = auVar201._12_4_ + (float)local_160._28_4_ + 7.0;
                uStack_370 = auVar108._16_8_;
                uStack_368 = auVar243._24_8_;
                local_1c0 = local_380;
                uStack_1b8 = uStack_378;
                uStack_1b0 = uStack_370;
                uStack_1a8 = uStack_368;
                local_1a0 = local_180;
                iVar110 = vmovmskps_avx(local_200);
                local_6e0._0_8_ = CONCAT44((int)((ulong)pRVar111 >> 0x20),iVar110);
                lVar14 = 0;
                if (local_6e0._0_8_ != 0) {
                  for (; ((ulong)local_6e0._0_8_ >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                local_780 = (undefined1  [8])lVar14;
                stack0xfffffffffffff928 = auVar276._8_24_;
                _local_380 = auVar243;
                if (iVar110 == 0) {
                  pRVar111 = (RTCIntersectArguments *)0x0;
LAB_00ed3010:
                  auVar248 = ZEXT3264(local_720);
                  auVar264 = ZEXT3264(local_740);
                  context = (RayQueryContext *)local_6c0._0_8_;
                  goto LAB_00ed2fd0;
                }
                local_5a0 = ray->tfar;
                auVar112 = local_660;
                _local_480 = auVar20;
                do {
                  local_634 = local_1e0[(long)local_780];
                  auVar133 = ZEXT464((uint)local_634);
                  local_630 = *(undefined4 *)((long)&local_1c0 + (long)local_780 * 4);
                  ray->tfar = *(float *)(local_1a0 + (long)local_780 * 4);
                  local_690.context = context->user;
                  fVar163 = 1.0 - local_634;
                  fVar197 = local_634 * fVar163 * 4.0;
                  auVar201 = ZEXT416((uint)(local_634 * local_634 * 0.5));
                  auVar201 = vshufps_avx(auVar201,auVar201,0);
                  auVar158 = ZEXT416((uint)((fVar163 * fVar163 + fVar197) * 0.5));
                  auVar158 = vshufps_avx(auVar158,auVar158,0);
                  auVar169 = ZEXT416((uint)((-local_634 * local_634 - fVar197) * 0.5));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar190._0_4_ = (float)local_700._0_4_ * auVar169._0_4_;
                  auVar190._4_4_ = (float)local_700._4_4_ * auVar169._4_4_;
                  auVar190._8_4_ = (float)uStack_6f8 * auVar169._8_4_;
                  auVar190._12_4_ = uStack_6f8._4_4_ * auVar169._12_4_;
                  auVar195 = ZEXT1664(auVar190);
                  auVar169 = ZEXT416((uint)(fVar163 * -fVar163 * 0.5));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar170._0_4_ = (float)local_790._0_4_ * auVar169._0_4_;
                  auVar170._4_4_ = (float)local_790._4_4_ * auVar169._4_4_;
                  auVar170._8_4_ = (float)uStack_788 * auVar169._8_4_;
                  auVar170._12_4_ = uStack_788._4_4_ * auVar169._12_4_;
                  auVar175 = ZEXT1664(auVar170);
                  auVar159._0_4_ =
                       auVar170._0_4_ +
                       auVar190._0_4_ +
                       (float)local_6a0._0_4_ * auVar201._0_4_ +
                       auVar158._0_4_ * (float)local_5b0._0_4_;
                  auVar159._4_4_ =
                       auVar170._4_4_ +
                       auVar190._4_4_ +
                       (float)local_6a0._4_4_ * auVar201._4_4_ +
                       auVar158._4_4_ * (float)local_5b0._4_4_;
                  auVar159._8_4_ =
                       auVar170._8_4_ +
                       auVar190._8_4_ +
                       (float)uStack_698 * auVar201._8_4_ + auVar158._8_4_ * (float)uStack_5a8;
                  auVar159._12_4_ =
                       auVar170._12_4_ +
                       auVar190._12_4_ +
                       uStack_698._4_4_ * auVar201._12_4_ + auVar158._12_4_ * uStack_5a8._4_4_;
                  local_640 = vmovlps_avx(auVar159);
                  local_638 = vextractps_avx(auVar159,2);
                  local_62c = (int)local_608;
                  local_628 = (int)local_6f0;
                  local_624 = (local_690.context)->instID[0];
                  local_620 = (local_690.context)->instPrimID[0];
                  local_79c = -1;
                  local_690.valid = &local_79c;
                  local_690.geometryUserPtr = ((Geometry *)auVar112)->userPtr;
                  local_690.ray = (RTCRayN *)ray;
                  local_690.hit = (RTCHitN *)&local_640;
                  local_690.N = 1;
                  if (((Geometry *)auVar112)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ed2eeb:
                    pcVar12 = *(code **)(*(byte **)(local_6c0._0_8_ + 0x10) + 0x10);
                    if ((pcVar12 != (code *)0x0) &&
                       (((**(byte **)(local_6c0._0_8_ + 0x10) & 2) != 0 ||
                        ((*(byte *)((long)local_660 + 0x3e) & 0x40) != 0)))) {
                      auVar175 = ZEXT1664(auVar175._0_16_);
                      auVar195 = ZEXT1664(auVar195._0_16_);
                      auVar133._0_8_ = (*pcVar12)(&local_690);
                      auVar133._8_56_ = extraout_var_00;
                      if (*local_690.valid == 0) goto LAB_00ed2f39;
                    }
                    pRVar111 = (RTCIntersectArguments *)0x1;
                    goto LAB_00ed3010;
                  }
                  auVar175 = ZEXT1664(auVar170);
                  auVar195 = ZEXT1664(auVar190);
                  auVar133._0_8_ = (*((Geometry *)auVar112)->occlusionFilterN)(&local_690);
                  auVar133._8_56_ = extraout_var;
                  if (*local_690.valid != 0) goto LAB_00ed2eeb;
LAB_00ed2f39:
                  auVar133 = ZEXT464((uint)local_5a0);
                  ray->tfar = local_5a0;
                  uVar114 = local_6e0._0_8_ ^ 1L << ((ulong)local_780 & 0x3f);
                  lVar14 = 0;
                  if (uVar114 != 0) {
                    for (; (uVar114 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                    }
                  }
                  local_780 = (undefined1  [8])lVar14;
                  pRVar111 = (RTCIntersectArguments *)0x0;
                  local_6e0._0_8_ = uVar114;
                  auVar248 = ZEXT3264(local_720);
                  auVar264 = ZEXT3264(local_740);
                  auVar112 = local_660;
                  context = (RayQueryContext *)local_6c0._0_8_;
                  fVar197 = (float)local_760._0_4_;
                  fVar207 = (float)local_760._4_4_;
                  fVar208 = fStack_758;
                  fVar209 = fStack_754;
                  fVar163 = fStack_750;
                  fVar176 = fStack_74c;
                  fVar178 = fStack_748;
                  fVar179 = fStack_744;
                } while (uVar114 != 0);
              }
            }
            bVar115 = (bool)(bVar115 | (byte)pRVar111);
          }
          lVar113 = lVar113 + 8;
        } while ((int)lVar113 < (int)uVar109);
      }
      if (bVar115 != false) {
        return bVar115;
      }
      fVar197 = ray->tfar;
      auVar123._4_4_ = fVar197;
      auVar123._0_4_ = fVar197;
      auVar123._8_4_ = fVar197;
      auVar123._12_4_ = fVar197;
      auVar201 = vcmpps_avx(local_2d0,auVar123,2);
      uVar109 = vmovmskps_avx(auVar201);
      uVar109 = (uint)uVar116 & uVar109;
    } while (uVar109 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }